

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_vertical_14_dual_sse2
               (uchar *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  __m128i *palVar13;
  __m128i *palVar14;
  __m128i *palVar15;
  undefined4 uVar16;
  undefined6 uVar17;
  undefined4 uVar18;
  undefined6 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined4 uVar25;
  undefined6 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined4 uVar32;
  undefined6 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined4 uVar39;
  undefined6 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined4 uVar45;
  undefined6 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  longlong lVar128;
  ulong *puVar129;
  undefined1 uVar130;
  undefined1 uVar131;
  undefined1 uVar132;
  undefined1 uVar133;
  undefined1 uVar134;
  undefined1 uVar135;
  undefined1 uVar136;
  undefined1 uVar137;
  undefined1 uVar138;
  undefined1 uVar139;
  undefined1 uVar140;
  undefined1 uVar141;
  undefined1 uVar142;
  undefined1 uVar143;
  undefined1 uVar144;
  undefined1 uVar145;
  undefined1 uVar146;
  undefined1 uVar147;
  undefined1 uVar148;
  undefined1 uVar149;
  undefined1 uVar150;
  undefined1 uVar151;
  undefined1 uVar152;
  undefined1 uVar153;
  undefined1 uVar154;
  undefined1 uVar155;
  undefined1 uVar156;
  undefined1 uVar157;
  undefined1 uVar158;
  undefined1 uVar159;
  undefined1 uVar160;
  undefined1 uVar161;
  undefined1 uVar162;
  undefined1 uVar163;
  undefined1 uVar164;
  undefined1 uVar165;
  undefined1 uVar166;
  undefined1 uVar167;
  undefined1 uVar168;
  undefined1 uVar169;
  undefined1 uVar170;
  undefined1 uVar171;
  undefined1 uVar172;
  undefined1 uVar173;
  undefined1 uVar174;
  undefined1 uVar175;
  undefined1 uVar176;
  undefined1 uVar177;
  char cVar178;
  char cVar179;
  char cVar180;
  char cVar181;
  char cVar182;
  char cVar183;
  char cVar184;
  char cVar185;
  char cVar186;
  char cVar187;
  char cVar188;
  char cVar189;
  char cVar190;
  char cVar191;
  char cVar192;
  char cVar193;
  undefined1 uVar194;
  undefined1 uVar195;
  undefined1 uVar196;
  undefined1 uVar197;
  undefined1 uVar198;
  undefined1 uVar199;
  undefined1 uVar200;
  undefined1 uVar201;
  undefined1 uVar202;
  undefined1 uVar203;
  undefined1 uVar204;
  undefined1 uVar205;
  undefined1 uVar206;
  undefined1 uVar207;
  undefined1 uVar208;
  undefined1 uVar209;
  undefined1 uVar210;
  undefined1 uVar211;
  undefined1 uVar212;
  undefined1 uVar213;
  undefined1 uVar214;
  undefined1 uVar215;
  undefined1 uVar216;
  undefined1 uVar217;
  undefined1 uVar218;
  undefined1 uVar219;
  undefined1 uVar220;
  undefined1 uVar221;
  undefined1 uVar222;
  undefined1 uVar223;
  undefined1 uVar224;
  undefined1 uVar225;
  undefined1 uVar226;
  undefined1 uVar227;
  undefined1 uVar228;
  undefined1 uVar229;
  undefined1 uVar230;
  undefined1 uVar231;
  undefined1 uVar232;
  undefined1 uVar233;
  undefined1 uVar234;
  undefined1 uVar235;
  undefined1 uVar236;
  undefined1 uVar237;
  undefined1 uVar238;
  undefined1 uVar239;
  undefined1 uVar240;
  undefined1 uVar241;
  undefined8 *puVar242;
  longlong *plVar243;
  undefined8 *in_RCX;
  undefined8 *puVar244;
  undefined8 *in_RDX;
  longlong extraout_RDX;
  int in_ESI;
  __m128i **ppalVar246;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  byte bVar247;
  short sVar248;
  short sVar249;
  short sVar250;
  short sVar251;
  ushort uVar252;
  ushort uVar253;
  short sVar254;
  short sVar255;
  ushort uVar256;
  uint uVar257;
  byte bVar263;
  byte bVar271;
  short sVar272;
  short sVar278;
  byte bVar281;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  ulong uVar258;
  ulong uVar259;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  byte bVar262;
  byte bVar270;
  byte bVar280;
  byte bVar289;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  short sVar264;
  short sVar265;
  short sVar266;
  ushort uVar267;
  ushort uVar268;
  short sVar269;
  short sVar273;
  short sVar274;
  ushort uVar275;
  ushort uVar276;
  short sVar277;
  short sVar282;
  short sVar283;
  short sVar284;
  ushort uVar285;
  ushort uVar286;
  short sVar287;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  short sVar288;
  uint uVar279;
  byte bVar290;
  short sVar291;
  short sVar292;
  short sVar293;
  short sVar294;
  ushort uVar295;
  ushort uVar296;
  short sVar297;
  short sVar298;
  short sVar299;
  uint uVar300;
  byte bVar305;
  byte bVar314;
  short sVar315;
  byte bVar324;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  ulong uVar301;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  byte bVar304;
  byte bVar313;
  byte bVar323;
  byte bVar332;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  short sVar306;
  short sVar307;
  short sVar308;
  ushort uVar309;
  ushort uVar310;
  short sVar311;
  short sVar316;
  short sVar317;
  ushort uVar318;
  ushort uVar319;
  short sVar320;
  short sVar325;
  short sVar326;
  short sVar327;
  ushort uVar328;
  ushort uVar329;
  short sVar330;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  ulong uVar302;
  short sVar312;
  short sVar321;
  short sVar331;
  __m128i *palVar303;
  uint uVar322;
  __m128i alVar333;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i p6p7;
  __m128i p4p5;
  __m128i p2p3;
  __m128i p0p1;
  __m128i q7;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i d14d15;
  __m128i d12d13;
  __m128i d10d11;
  __m128i d8d9;
  __m128i d6d7;
  __m128i d4d5;
  __m128i d2d3;
  __m128i d0d1;
  __m128i x0;
  __m128i x1;
  __m128i x2;
  __m128i x3;
  __m128i x4;
  __m128i x5;
  __m128i x6;
  __m128i x7;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i q3p3;
  __m128i q4p4;
  __m128i q5p5;
  __m128i q6p6;
  __m128i res_q;
  __m128i res_p;
  __m128i sum_q3;
  __m128i sum_p3;
  __m128i sum_q6;
  __m128i sum_p6;
  __m128i pixetFilter_q2q1q0;
  __m128i pixetFilter_p2p1p0;
  __m128i pixelFilter_q;
  __m128i pixelFilter_p;
  __m128i q0_16;
  __m128i q1_16;
  __m128i q2_16;
  __m128i q3_16;
  __m128i q4_16;
  __m128i q5_16;
  __m128i q6_16;
  __m128i p0_16;
  __m128i p1_16;
  __m128i p2_16;
  __m128i p3_16;
  __m128i p4_16;
  __m128i p5_16;
  __m128i p6_16;
  __m128i four;
  __m128i eight;
  __m128i work;
  __m128i flat_q0p0;
  __m128i flat_q1p1;
  __m128i flat_q2p2;
  __m128i flat2_q0p0;
  __m128i flat2_q1p1;
  __m128i flat2_q2p2;
  __m128i flat2_q3p3;
  __m128i flat2_q4p4;
  __m128i flat2_q5p5;
  __m128i work_1;
  __m128i ff;
  __m128i fe;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i abs_p1p0;
  __m128i ps1ps0;
  __m128i qs1qs0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i qs1ps1;
  __m128i qs0ps0;
  __m128i flat2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i one;
  __m128i zero;
  __m128i ff_1;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_2;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  __m128i *in_stack_ffffffffffffd6c0;
  __m128i *in_stack_ffffffffffffd6c8;
  __m128i *in_stack_ffffffffffffd6d0;
  __m128i *in_stack_ffffffffffffd6d8;
  __m128i *in_stack_ffffffffffffd6e0;
  __m128i *in_stack_ffffffffffffd6e8;
  undefined1 local_2878 [16];
  undefined1 local_2868 [16];
  undefined1 local_2858 [16];
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  undefined8 local_2828;
  undefined8 uStack_2820;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined8 local_2808;
  undefined8 uStack_2800;
  longlong local_27f8;
  longlong lStack_27f0;
  longlong local_27e8;
  longlong lStack_27e0;
  longlong local_27d8;
  longlong lStack_27d0;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  ulong local_27b8;
  undefined8 uStack_27b0;
  ulong local_27a8;
  __m128i *palStack_27a0;
  ulong local_2798;
  __m128i *palStack_2790;
  ulong local_2788;
  undefined8 uStack_2780;
  __m128i *local_2778;
  __m128i *palStack_2770;
  __m128i *local_2768;
  __m128i *palStack_2760;
  __m128i *local_2758;
  __m128i *palStack_2750;
  longlong lStack_2740;
  longlong local_2738;
  undefined8 uStack_2730;
  __m128i *local_2728;
  undefined8 uStack_2720;
  __m128i *local_2718;
  undefined8 uStack_2710;
  __m128i *local_2708;
  undefined8 uStack_2700;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  __m128i *local_26e8;
  undefined8 uStack_26e0;
  __m128i *local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  ulong local_26b8;
  undefined8 uStack_26b0;
  ulong local_26a8;
  undefined8 uStack_26a0;
  ulong local_2698;
  __m128i *palStack_2690;
  ulong local_2688;
  __m128i *palStack_2680;
  __m128i *local_2678;
  undefined8 uStack_2670;
  __m128i *local_2668;
  __m128i *palStack_2660;
  __m128i *local_2658;
  __m128i *palStack_2650;
  int local_2624;
  undefined8 *local_2620;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined8 local_2608;
  undefined8 uStack_2600;
  undefined8 local_25f8;
  undefined8 uStack_25f0;
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined8 local_25c8;
  undefined8 uStack_25c0;
  longlong local_2588;
  undefined8 uStack_2580;
  ulong local_2578;
  undefined8 uStack_2570;
  __m128i *local_2568;
  undefined8 uStack_2560;
  ulong local_2558;
  __m128i *palStack_2550;
  __m128i *local_2548;
  undefined8 uStack_2540;
  ulong local_2538;
  __m128i *palStack_2530;
  __m128i *local_2528;
  undefined8 uStack_2520;
  ulong local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  __m128i *in_stack_ffffffffffffdb00;
  __m128i *x6_00;
  __m128i *in_stack_ffffffffffffdb08;
  __m128i *in_stack_ffffffffffffdb10;
  __m128i *in_stack_ffffffffffffdb18;
  __m128i *in_stack_ffffffffffffdb20;
  __m128i *x10;
  __m128i *in_stack_ffffffffffffdb28;
  __m128i *in_stack_ffffffffffffdb30;
  __m128i *in_stack_ffffffffffffdb38;
  __m128i *in_stack_ffffffffffffdb40;
  __m128i *x14;
  __m128i *in_stack_ffffffffffffdb48;
  ushort in_stack_ffffffffffffdb58;
  ushort in_stack_ffffffffffffdb5a;
  ushort in_stack_ffffffffffffdb5c;
  ushort in_stack_ffffffffffffdb5e;
  ushort in_stack_ffffffffffffdb60;
  ushort in_stack_ffffffffffffdb62;
  ushort in_stack_ffffffffffffdb64;
  ushort in_stack_ffffffffffffdb66;
  ushort in_stack_ffffffffffffdb68;
  ushort in_stack_ffffffffffffdb6a;
  ushort in_stack_ffffffffffffdb6c;
  ushort in_stack_ffffffffffffdb6e;
  ushort in_stack_ffffffffffffdb70;
  ushort in_stack_ffffffffffffdb72;
  ushort in_stack_ffffffffffffdb74;
  ushort in_stack_ffffffffffffdb76;
  short in_stack_ffffffffffffdb78;
  short in_stack_ffffffffffffdb7a;
  short in_stack_ffffffffffffdb7c;
  short in_stack_ffffffffffffdb7e;
  short in_stack_ffffffffffffdb80;
  short in_stack_ffffffffffffdb82;
  short in_stack_ffffffffffffdb84;
  short in_stack_ffffffffffffdb86;
  short in_stack_ffffffffffffdb88;
  short in_stack_ffffffffffffdb8a;
  short in_stack_ffffffffffffdb8c;
  short in_stack_ffffffffffffdb8e;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined1 local_21f8 [12];
  uint uStack_21ec;
  undefined4 local_21e8 [3];
  uint uStack_21dc;
  undefined4 local_21d8;
  undefined4 uStack_21d4;
  undefined4 uStack_21d0;
  undefined4 uStack_21cc;
  undefined8 local_21c8;
  ulong uStack_21c0;
  ulong local_21b8;
  ulong uStack_21b0;
  ulong local_21a8;
  ulong uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  ulong local_2178;
  ulong uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined1 (*local_2138) [16];
  undefined1 (*local_2130) [16];
  undefined1 (*local_2128) [16];
  ulong *local_2120;
  ulong *local_2118;
  ulong *local_2110;
  ulong *local_2108;
  __m128i **local_2100;
  __m128i **local_20f8;
  __m128i **local_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  ulong uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  ulong uStack_20a0;
  undefined8 local_2098;
  undefined8 uStack_2090;
  undefined8 local_2088;
  ulong uStack_2080;
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined8 local_2068;
  ulong uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  __m128i *palStack_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  __m128i *palStack_2020;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  __m128i *palStack_2000;
  ulong local_1ff8;
  undefined8 uStack_1ff0;
  ulong local_1fe8;
  undefined8 uStack_1fe0;
  ulong local_1fd8;
  ulong uStack_1fd0;
  ulong local_1fc8;
  ulong uStack_1fc0;
  ulong local_1fa8;
  ulong local_1f98;
  ulong uStack_1f90;
  ulong local_1f88;
  ulong uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 *local_1f38;
  undefined8 *local_1f30;
  undefined8 *local_1f28;
  undefined8 *local_1f20;
  undefined8 *local_1f18;
  undefined8 *local_1f10;
  undefined8 *local_1f08;
  undefined8 *local_1f00;
  undefined1 local_1dfa;
  undefined1 local_1df9;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  byte local_1d08;
  byte bStack_1d07;
  byte bStack_1d06;
  byte bStack_1d05;
  byte bStack_1d04;
  byte bStack_1d03;
  byte bStack_1d02;
  byte bStack_1d01;
  byte bStack_1d00;
  byte bStack_1cff;
  byte bStack_1cfe;
  byte bStack_1cfd;
  byte bStack_1cfc;
  byte bStack_1cfb;
  byte bStack_1cfa;
  byte bStack_1cf9;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  byte local_1cc8;
  byte bStack_1cc7;
  byte bStack_1cc6;
  byte bStack_1cc5;
  byte bStack_1cc4;
  byte bStack_1cc3;
  byte bStack_1cc2;
  byte bStack_1cc1;
  byte bStack_1cc0;
  byte bStack_1cbf;
  byte bStack_1cbe;
  byte bStack_1cbd;
  byte bStack_1cbc;
  byte bStack_1cbb;
  byte bStack_1cba;
  byte bStack_1cb9;
  byte local_1cb8;
  byte bStack_1cb7;
  byte bStack_1cb6;
  byte bStack_1cb5;
  byte bStack_1cb4;
  byte bStack_1cb3;
  byte bStack_1cb2;
  byte bStack_1cb1;
  byte bStack_1cb0;
  byte bStack_1caf;
  byte bStack_1cae;
  byte bStack_1cad;
  byte bStack_1cac;
  byte bStack_1cab;
  byte bStack_1caa;
  byte bStack_1ca9;
  byte local_1ca8;
  byte bStack_1ca7;
  byte bStack_1ca6;
  byte bStack_1ca5;
  byte bStack_1ca4;
  byte bStack_1ca3;
  byte bStack_1ca2;
  byte bStack_1ca1;
  byte bStack_1ca0;
  byte bStack_1c9f;
  byte bStack_1c9e;
  byte bStack_1c9d;
  byte bStack_1c9c;
  byte bStack_1c9b;
  byte bStack_1c9a;
  byte bStack_1c99;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  byte local_1c58;
  byte bStack_1c57;
  byte bStack_1c56;
  byte bStack_1c55;
  byte bStack_1c54;
  byte bStack_1c53;
  byte bStack_1c52;
  byte bStack_1c51;
  byte bStack_1c50;
  byte bStack_1c4f;
  byte bStack_1c4e;
  byte bStack_1c4d;
  byte bStack_1c4c;
  byte bStack_1c4b;
  byte bStack_1c4a;
  byte bStack_1c49;
  byte local_1c48;
  byte bStack_1c47;
  byte bStack_1c46;
  byte bStack_1c45;
  byte bStack_1c44;
  byte bStack_1c43;
  byte bStack_1c42;
  byte bStack_1c41;
  byte bStack_1c40;
  byte bStack_1c3f;
  byte bStack_1c3e;
  byte bStack_1c3d;
  byte bStack_1c3c;
  byte bStack_1c3b;
  byte bStack_1c3a;
  byte bStack_1c39;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  byte local_1bf8;
  byte bStack_1bf7;
  byte bStack_1bf6;
  byte bStack_1bf5;
  byte bStack_1bf4;
  byte bStack_1bf3;
  byte bStack_1bf2;
  byte bStack_1bf1;
  byte bStack_1bf0;
  byte bStack_1bef;
  byte bStack_1bee;
  byte bStack_1bed;
  byte bStack_1bec;
  byte bStack_1beb;
  byte bStack_1bea;
  byte bStack_1be9;
  byte local_1be8;
  byte bStack_1be7;
  byte bStack_1be6;
  byte bStack_1be5;
  byte bStack_1be4;
  byte bStack_1be3;
  byte bStack_1be2;
  byte bStack_1be1;
  byte bStack_1be0;
  byte bStack_1bdf;
  byte bStack_1bde;
  byte bStack_1bdd;
  byte bStack_1bdc;
  byte bStack_1bdb;
  byte bStack_1bda;
  byte bStack_1bd9;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bb0;
  ulong local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 uStack_1b70;
  undefined8 uStack_1b60;
  undefined4 local_1b4c;
  ushort local_1b48;
  ushort uStack_1b46;
  ushort uStack_1b44;
  ushort uStack_1b42;
  ushort uStack_1b40;
  ushort uStack_1b3e;
  ushort uStack_1b3c;
  ushort uStack_1b3a;
  undefined4 local_1b2c;
  ushort local_1b28;
  ushort uStack_1b26;
  ushort uStack_1b24;
  ushort uStack_1b22;
  ushort uStack_1b20;
  ushort uStack_1b1e;
  ushort uStack_1b1c;
  ushort uStack_1b1a;
  undefined4 local_1b0c;
  ushort local_1b08;
  ushort uStack_1b06;
  ushort uStack_1b04;
  ushort uStack_1b02;
  ushort uStack_1b00;
  ushort uStack_1afe;
  ushort uStack_1afc;
  ushort uStack_1afa;
  undefined4 local_1aec;
  ushort local_1ae8;
  ushort uStack_1ae6;
  ushort uStack_1ae4;
  ushort uStack_1ae2;
  ushort uStack_1ae0;
  ushort uStack_1ade;
  ushort uStack_1adc;
  ushort uStack_1ada;
  undefined4 local_1acc;
  ushort local_1ac8;
  ushort uStack_1ac6;
  ushort uStack_1ac4;
  ushort uStack_1ac2;
  ushort uStack_1ac0;
  ushort uStack_1abe;
  ushort uStack_1abc;
  ushort uStack_1aba;
  undefined4 local_1aac;
  ushort local_1aa8;
  ushort uStack_1aa6;
  ushort uStack_1aa4;
  ushort uStack_1aa2;
  ushort uStack_1aa0;
  ushort uStack_1a9e;
  ushort uStack_1a9c;
  ushort uStack_1a9a;
  undefined4 local_1a8c;
  ushort local_1a88;
  ushort uStack_1a86;
  ushort uStack_1a84;
  ushort uStack_1a82;
  ushort uStack_1a80;
  ushort uStack_1a7e;
  ushort uStack_1a7c;
  ushort uStack_1a7a;
  undefined4 local_1a6c;
  ushort local_1a68;
  ushort uStack_1a66;
  ushort uStack_1a64;
  ushort uStack_1a62;
  ushort uStack_1a60;
  ushort uStack_1a5e;
  ushort uStack_1a5c;
  ushort uStack_1a5a;
  undefined4 local_1a4c;
  ushort local_1a48;
  ushort uStack_1a46;
  ushort uStack_1a44;
  ushort uStack_1a42;
  ushort uStack_1a40;
  ushort uStack_1a3e;
  ushort uStack_1a3c;
  ushort uStack_1a3a;
  undefined4 local_1a2c;
  ushort local_1a28;
  ushort uStack_1a26;
  ushort uStack_1a24;
  ushort uStack_1a22;
  ushort uStack_1a20;
  ushort uStack_1a1e;
  ushort uStack_1a1c;
  ushort uStack_1a1a;
  undefined4 local_1a0c;
  ushort local_1a08;
  ushort uStack_1a06;
  ushort uStack_1a04;
  ushort uStack_1a02;
  ushort uStack_1a00;
  ushort uStack_19fe;
  ushort uStack_19fc;
  ushort uStack_19fa;
  undefined4 local_19ec;
  ushort local_19e8;
  ushort uStack_19e6;
  ushort uStack_19e4;
  ushort uStack_19e2;
  ushort uStack_19e0;
  ushort uStack_19de;
  ushort uStack_19dc;
  ushort uStack_19da;
  undefined4 local_19cc;
  ushort local_19c8;
  ushort uStack_19c6;
  ushort uStack_19c4;
  ushort uStack_19c2;
  ushort uStack_19c0;
  ushort uStack_19be;
  ushort uStack_19bc;
  ushort uStack_19ba;
  undefined4 local_19ac;
  ushort local_19a8;
  ushort uStack_19a6;
  ushort uStack_19a4;
  ushort uStack_19a2;
  ushort uStack_19a0;
  ushort uStack_199e;
  ushort uStack_199c;
  ushort uStack_199a;
  undefined4 local_198c;
  ushort local_1988;
  ushort uStack_1986;
  ushort uStack_1984;
  ushort uStack_1982;
  ushort uStack_1980;
  ushort uStack_197e;
  ushort uStack_197c;
  ushort uStack_197a;
  undefined4 local_196c;
  ushort local_1968;
  ushort uStack_1966;
  ushort uStack_1964;
  ushort uStack_1962;
  ushort uStack_1960;
  ushort uStack_195e;
  ushort uStack_195c;
  ushort uStack_195a;
  undefined4 local_194c;
  ushort local_1948;
  ushort uStack_1946;
  ushort uStack_1944;
  ushort uStack_1942;
  ushort uStack_1940;
  ushort uStack_193e;
  ushort uStack_193c;
  ushort uStack_193a;
  undefined4 local_192c;
  ushort local_1928;
  ushort uStack_1926;
  ushort uStack_1924;
  ushort uStack_1922;
  ushort uStack_1920;
  ushort uStack_191e;
  ushort uStack_191c;
  ushort uStack_191a;
  undefined4 local_190c;
  undefined8 local_1908;
  undefined8 uStack_1900;
  ulong local_18f8;
  ulong uStack_18f0;
  ulong local_18e8;
  ulong uStack_18e0;
  ulong local_18d8;
  ulong uStack_18d0;
  ulong local_18c8;
  ulong uStack_18c0;
  ulong local_18b8;
  ulong uStack_18b0;
  ulong local_18a8;
  ulong uStack_18a0;
  ulong local_1898;
  ulong uStack_1890;
  ulong local_1888;
  ulong uStack_1880;
  ulong local_1878;
  ulong uStack_1870;
  ulong local_1868;
  ulong uStack_1860;
  ulong local_1858;
  ulong uStack_1850;
  ulong local_1848;
  ulong uStack_1840;
  ulong local_1838;
  ulong uStack_1830;
  ulong local_1828;
  ulong uStack_1820;
  ulong local_1818;
  ulong uStack_1810;
  ulong local_1808;
  ulong uStack_1800;
  ulong local_17f8;
  ulong uStack_17f0;
  ulong local_17e8;
  ulong uStack_17e0;
  ulong local_17d8;
  ulong uStack_17d0;
  ulong local_17c8;
  ulong uStack_17c0;
  ulong local_17b8;
  ulong uStack_17b0;
  ulong local_17a8;
  ulong uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined1 local_1708 [16];
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  char local_16c8;
  char cStack_16c7;
  char cStack_16c6;
  char cStack_16c5;
  char cStack_16c4;
  char cStack_16c3;
  char cStack_16c2;
  char cStack_16c1;
  char cStack_16c0;
  char cStack_16bf;
  char cStack_16be;
  char cStack_16bd;
  char cStack_16bc;
  char cStack_16bb;
  char cStack_16ba;
  char cStack_16b9;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  char local_16a8;
  char cStack_16a7;
  char cStack_16a6;
  char cStack_16a5;
  char cStack_16a4;
  char cStack_16a3;
  char cStack_16a2;
  char cStack_16a1;
  char cStack_16a0;
  char cStack_169f;
  char cStack_169e;
  char cStack_169d;
  char cStack_169c;
  char cStack_169b;
  char cStack_169a;
  char cStack_1699;
  char local_1698;
  char cStack_1697;
  char cStack_1696;
  char cStack_1695;
  char cStack_1694;
  char cStack_1693;
  char cStack_1692;
  char cStack_1691;
  char cStack_1690;
  char cStack_168f;
  char cStack_168e;
  char cStack_168d;
  char cStack_168c;
  char cStack_168b;
  char cStack_168a;
  byte bStack_1689;
  char local_1688;
  char cStack_1687;
  char cStack_1686;
  char cStack_1685;
  char cStack_1684;
  char cStack_1683;
  char cStack_1682;
  char cStack_1681;
  char cStack_1680;
  char cStack_167f;
  char cStack_167e;
  char cStack_167d;
  char cStack_167c;
  char cStack_167b;
  char cStack_167a;
  byte bStack_1679;
  ulong local_1678;
  ulong uStack_1670;
  ulong local_1668;
  ulong uStack_1660;
  ulong local_1658;
  ulong uStack_1650;
  ulong local_1648;
  ulong uStack_1640;
  ulong local_1638;
  ulong uStack_1630;
  ulong local_1628;
  ulong uStack_1620;
  ulong local_1618;
  ulong uStack_1610;
  ulong local_1608;
  ulong uStack_1600;
  ulong local_15f8;
  ulong uStack_15f0;
  __m128i *local_15e8;
  __m128i *palStack_15e0;
  ulong local_15d8;
  ulong uStack_15d0;
  __m128i *local_15c8;
  __m128i *palStack_15c0;
  ulong local_15b8;
  ulong uStack_15b0;
  ulong local_15a8;
  ulong uStack_15a0;
  ulong local_1598;
  ulong uStack_1590;
  ulong local_1588;
  ulong uStack_1580;
  ulong local_1578;
  ulong uStack_1570;
  ulong local_1568;
  ulong uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  ulong local_1538;
  ulong uStack_1530;
  ulong local_1528;
  ulong uStack_1520;
  ulong local_1518;
  ulong uStack_1510;
  ulong local_1508;
  ulong uStack_1500;
  ulong local_14f8;
  ulong uStack_14f0;
  ulong local_14e8;
  ulong uStack_14e0;
  __m128i *local_14d8;
  __m128i *palStack_14d0;
  ulong local_14c8;
  ulong uStack_14c0;
  __m128i *local_14b8;
  __m128i *palStack_14b0;
  ulong local_14a8;
  ulong uStack_14a0;
  ulong local_1498;
  ulong uStack_1490;
  ulong local_1488;
  ulong uStack_1480;
  ulong local_1478;
  ulong uStack_1470;
  ulong local_1468;
  ulong uStack_1460;
  ulong local_1458;
  ulong uStack_1450;
  ulong local_1448;
  ulong uStack_1440;
  undefined2 local_142c;
  undefined2 local_142a;
  undefined8 local_1428;
  undefined8 uStack_1420;
  __m128i *local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  __m128i *local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  __m128i *local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  ulong local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  ulong local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  ulong local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  ulong local_1358;
  undefined8 uStack_1350;
  short local_1348;
  short sStack_1346;
  short sStack_1344;
  short sStack_1342;
  short sStack_1340;
  short sStack_133e;
  short sStack_133c;
  short sStack_133a;
  undefined8 local_1338;
  undefined8 uStack_1330;
  short local_1328;
  short sStack_1326;
  short sStack_1324;
  short sStack_1322;
  short sStack_1320;
  short sStack_131e;
  short sStack_131c;
  short sStack_131a;
  undefined8 local_1318;
  undefined8 uStack_1310;
  short local_1308;
  short sStack_1306;
  short sStack_1304;
  short sStack_1302;
  short sStack_1300;
  short sStack_12fe;
  short sStack_12fc;
  short sStack_12fa;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  short local_12c8;
  short sStack_12c6;
  short sStack_12c4;
  short sStack_12c2;
  short sStack_12c0;
  short sStack_12be;
  short sStack_12bc;
  short sStack_12ba;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  short local_12a8;
  short sStack_12a6;
  short sStack_12a4;
  short sStack_12a2;
  short sStack_12a0;
  short sStack_129e;
  short sStack_129c;
  short sStack_129a;
  undefined8 local_1298;
  undefined8 uStack_1290;
  short local_1288;
  short sStack_1286;
  short sStack_1284;
  short sStack_1282;
  short sStack_1280;
  short sStack_127e;
  short sStack_127c;
  short sStack_127a;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  short local_1208;
  short sStack_1206;
  short sStack_1204;
  short sStack_1202;
  short sStack_1200;
  short sStack_11fe;
  short sStack_11fc;
  short sStack_11fa;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  short local_11e8;
  short sStack_11e6;
  short sStack_11e4;
  short sStack_11e2;
  short sStack_11e0;
  short sStack_11de;
  short sStack_11dc;
  short sStack_11da;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  short local_11c8;
  short sStack_11c6;
  short sStack_11c4;
  short sStack_11c2;
  short sStack_11c0;
  short sStack_11be;
  short sStack_11bc;
  short sStack_11ba;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  short local_1188;
  short sStack_1186;
  short sStack_1184;
  short sStack_1182;
  short sStack_1180;
  short sStack_117e;
  short sStack_117c;
  short sStack_117a;
  undefined8 local_1178;
  undefined8 uStack_1170;
  short local_1168;
  short sStack_1166;
  short sStack_1164;
  short sStack_1162;
  short sStack_1160;
  short sStack_115e;
  short sStack_115c;
  short sStack_115a;
  undefined8 local_1158;
  undefined8 uStack_1150;
  short local_1148;
  short sStack_1146;
  short sStack_1144;
  short sStack_1142;
  short sStack_1140;
  short sStack_113e;
  short sStack_113c;
  short sStack_113a;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  short local_10c8;
  short sStack_10c6;
  short sStack_10c4;
  short sStack_10c2;
  short sStack_10c0;
  short sStack_10be;
  short sStack_10bc;
  short sStack_10ba;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  short local_10a8;
  short sStack_10a6;
  short sStack_10a4;
  short sStack_10a2;
  short sStack_10a0;
  short sStack_109e;
  short sStack_109c;
  short sStack_109a;
  undefined8 local_1098;
  undefined8 uStack_1090;
  short local_1088;
  short sStack_1086;
  short sStack_1084;
  short sStack_1082;
  short sStack_1080;
  short sStack_107e;
  short sStack_107c;
  short sStack_107a;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  short local_1048;
  short sStack_1046;
  short sStack_1044;
  short sStack_1042;
  short sStack_1040;
  short sStack_103e;
  short sStack_103c;
  short sStack_103a;
  undefined8 local_1038;
  undefined8 uStack_1030;
  short local_1028;
  short sStack_1026;
  short sStack_1024;
  short sStack_1022;
  short sStack_1020;
  short sStack_101e;
  short sStack_101c;
  short sStack_101a;
  undefined8 local_1018;
  undefined8 uStack_1010;
  short local_1008;
  short sStack_1006;
  short sStack_1004;
  short sStack_1002;
  short sStack_1000;
  short sStack_ffe;
  short sStack_ffc;
  short sStack_ffa;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  short local_f88;
  short sStack_f86;
  short sStack_f84;
  short sStack_f82;
  short sStack_f80;
  short sStack_f7e;
  short sStack_f7c;
  short sStack_f7a;
  undefined8 local_f78;
  undefined8 uStack_f70;
  short local_f68;
  short sStack_f66;
  short sStack_f64;
  short sStack_f62;
  short sStack_f60;
  short sStack_f5e;
  short sStack_f5c;
  short sStack_f5a;
  undefined8 local_f58;
  undefined8 uStack_f50;
  short local_f48;
  short sStack_f46;
  short sStack_f44;
  short sStack_f42;
  short sStack_f40;
  short sStack_f3e;
  short sStack_f3c;
  short sStack_f3a;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  short local_f08;
  short sStack_f06;
  short sStack_f04;
  short sStack_f02;
  short sStack_f00;
  short sStack_efe;
  short sStack_efc;
  short sStack_efa;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  short local_ee8;
  short sStack_ee6;
  short sStack_ee4;
  short sStack_ee2;
  short sStack_ee0;
  short sStack_ede;
  short sStack_edc;
  short sStack_eda;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  short local_ec8;
  short sStack_ec6;
  short sStack_ec4;
  short sStack_ec2;
  short sStack_ec0;
  short sStack_ebe;
  short sStack_ebc;
  short sStack_eba;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  short local_e48;
  short sStack_e46;
  short sStack_e44;
  short sStack_e42;
  short sStack_e40;
  short sStack_e3e;
  short sStack_e3c;
  short sStack_e3a;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  short local_e08;
  short sStack_e06;
  short sStack_e04;
  short sStack_e02;
  short sStack_e00;
  short sStack_dfe;
  short sStack_dfc;
  short sStack_dfa;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  short local_d88;
  short sStack_d86;
  short sStack_d84;
  short sStack_d82;
  short sStack_d80;
  short sStack_d7e;
  short sStack_d7c;
  short sStack_d7a;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  short local_d48;
  short sStack_d46;
  short sStack_d44;
  short sStack_d42;
  short sStack_d40;
  short sStack_d3e;
  short sStack_d3c;
  short sStack_d3a;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  short local_d08;
  short sStack_d06;
  short sStack_d04;
  short sStack_d02;
  short sStack_d00;
  short sStack_cfe;
  short sStack_cfc;
  short sStack_cfa;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  short local_ce8;
  short sStack_ce6;
  short sStack_ce4;
  short sStack_ce2;
  short sStack_ce0;
  short sStack_cde;
  short sStack_cdc;
  short sStack_cda;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  short local_cc8;
  short sStack_cc6;
  short sStack_cc4;
  short sStack_cc2;
  short sStack_cc0;
  short sStack_cbe;
  short sStack_cbc;
  short sStack_cba;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  short local_c88;
  short sStack_c86;
  short sStack_c84;
  short sStack_c82;
  short sStack_c80;
  short sStack_c7e;
  short sStack_c7c;
  short sStack_c7a;
  undefined8 local_c78;
  undefined8 uStack_c70;
  short local_c68;
  short sStack_c66;
  short sStack_c64;
  short sStack_c62;
  short sStack_c60;
  short sStack_c5e;
  short sStack_c5c;
  short sStack_c5a;
  undefined8 local_c58;
  undefined8 uStack_c50;
  short local_c48;
  short sStack_c46;
  short sStack_c44;
  short sStack_c42;
  short sStack_c40;
  short sStack_c3e;
  short sStack_c3c;
  short sStack_c3a;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  short local_b88;
  short sStack_b86;
  short sStack_b84;
  short sStack_b82;
  short sStack_b80;
  short sStack_b7e;
  short sStack_b7c;
  short sStack_b7a;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  short local_b48;
  short sStack_b46;
  short sStack_b44;
  short sStack_b42;
  short sStack_b40;
  short sStack_b3e;
  short sStack_b3c;
  short sStack_b3a;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  short local_b08;
  short sStack_b06;
  short sStack_b04;
  short sStack_b02;
  short sStack_b00;
  short sStack_afe;
  short sStack_afc;
  short sStack_afa;
  undefined8 local_af8;
  undefined8 uStack_af0;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  short local_ad8;
  short sStack_ad6;
  short sStack_ad4;
  short sStack_ad2;
  short sStack_ad0;
  short sStack_ace;
  short sStack_acc;
  short sStack_aca;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short sStack_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  undefined8 local_a78;
  undefined8 uStack_a70;
  short local_a68;
  short sStack_a66;
  short sStack_a64;
  short sStack_a62;
  short sStack_a60;
  short sStack_a5e;
  short sStack_a5c;
  short sStack_a5a;
  short local_a58;
  short sStack_a56;
  short sStack_a54;
  short sStack_a52;
  short sStack_a50;
  short sStack_a4e;
  short sStack_a4c;
  short sStack_a4a;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  short local_a08;
  short sStack_a06;
  short sStack_a04;
  short sStack_a02;
  short sStack_a00;
  short sStack_9fe;
  short sStack_9fc;
  short sStack_9fa;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  short local_968;
  short sStack_966;
  short sStack_964;
  short sStack_962;
  short sStack_960;
  short sStack_95e;
  short sStack_95c;
  short sStack_95a;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short sStack_8c0;
  short sStack_8be;
  short sStack_8bc;
  short sStack_8ba;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined1 local_678;
  undefined1 local_677;
  undefined1 local_676;
  undefined1 local_675;
  undefined1 local_674;
  undefined1 local_673;
  undefined1 local_672;
  undefined1 local_671;
  undefined1 local_670;
  undefined1 local_66f;
  undefined1 local_66e;
  undefined1 local_66d;
  undefined1 local_66c;
  undefined1 local_66b;
  undefined1 local_66a;
  undefined1 local_669;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined1 local_658;
  undefined1 local_657;
  undefined1 local_656;
  undefined1 local_655;
  undefined1 local_654;
  undefined1 local_653;
  undefined1 local_652;
  undefined1 local_651;
  undefined1 local_650;
  undefined1 local_64f;
  undefined1 local_64e;
  undefined1 local_64d;
  undefined1 local_64c;
  undefined1 local_64b;
  undefined1 local_64a;
  undefined1 local_649;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined4 uStack_520;
  uint uStack_51c;
  undefined4 local_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  uint uStack_50c;
  undefined4 local_508;
  undefined4 uStack_504;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined1 local_4e8;
  undefined1 uStack_4e7;
  undefined1 uStack_4e6;
  undefined1 uStack_4e5;
  undefined1 uStack_4e4;
  undefined1 uStack_4e3;
  undefined1 uStack_4e2;
  undefined1 uStack_4e1;
  undefined1 uStack_4e0;
  undefined1 uStack_4df;
  undefined1 uStack_4de;
  undefined1 uStack_4dd;
  undefined1 uStack_4dc;
  undefined1 uStack_4db;
  undefined1 uStack_4da;
  undefined1 uStack_4d9;
  undefined8 local_4d8;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined1 *local_458;
  undefined4 *local_450;
  undefined8 *local_448;
  ulong *local_440;
  undefined4 *local_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  ulong uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  undefined1 local_399;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  ulong local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  ulong local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ulong uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  ulong local_2c8;
  undefined8 local_2b8;
  ulong uStack_2b0;
  undefined8 local_2a8;
  ulong uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  ulong uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  ulong uStack_230;
  ulong local_228;
  undefined8 uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  undefined1 local_120;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  ulong uVar245;
  
  uVar1 = *in_RDX;
  uStack_25c0 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_25d0 = in_R9[1];
  local_25c8._0_4_ = (undefined4)uVar1;
  local_25c8._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_25d8._0_4_ = (undefined4)uVar2;
  local_25d8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_2858._0_4_ = (undefined4)local_25c8;
  local_2858._4_4_ = (undefined4)local_25d8;
  local_2858._8_4_ = local_25c8._4_4_;
  local_2858._12_4_ = local_25d8._4_4_;
  uVar3 = *in_RCX;
  uStack_25e0 = in_RCX[1];
  uVar4 = *in_stack_00000008;
  uStack_25f0 = in_stack_00000008[1];
  local_25e8._0_4_ = (undefined4)uVar3;
  local_25e8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_25f8._0_4_ = (undefined4)uVar4;
  local_25f8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_2868._0_4_ = (undefined4)local_25e8;
  local_2868._4_4_ = (undefined4)local_25f8;
  local_2868._8_4_ = local_25e8._4_4_;
  local_2868._12_4_ = local_25f8._4_4_;
  uVar5 = *in_R8;
  uStack_2600 = in_R8[1];
  uVar6 = *in_stack_00000010;
  uStack_2610 = in_stack_00000010[1];
  local_2608._0_4_ = (undefined4)uVar5;
  local_2608._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  local_2618._0_4_ = (undefined4)uVar6;
  local_2618._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  local_2878._0_4_ = (undefined4)local_2608;
  local_2878._4_4_ = (undefined4)local_2618;
  local_2878._8_4_ = local_2608._4_4_;
  local_2878._12_4_ = local_2618._4_4_;
  local_1f00 = in_RDI + -1;
  local_26c8 = *local_1f00;
  uStack_26c0 = *in_RDI;
  local_1f08 = (undefined8 *)((long)in_RDI + (long)in_ESI + -8);
  local_26d8 = (__m128i *)*local_1f08;
  uStack_26d0 = local_1f08[1];
  local_1f10 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) + -8);
  local_26e8 = (__m128i *)*local_1f10;
  uStack_26e0 = local_1f10[1];
  local_1f18 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) + -8);
  local_26f8 = *local_1f18;
  uStack_26f0 = local_1f18[1];
  local_1f20 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 2) + -8);
  local_2708 = (__m128i *)*local_1f20;
  uStack_2700 = local_1f20[1];
  local_1f28 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 5) + -8);
  local_2718 = (__m128i *)*local_1f28;
  uStack_2710 = local_1f28[1];
  local_1f30 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 6) + -8);
  local_2728 = (__m128i *)*local_1f30;
  uStack_2720 = local_1f30[1];
  local_1f38 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 7) + -8);
  local_2738 = *local_1f38;
  uStack_2730 = local_1f38[1];
  puVar242 = &local_26c8;
  ppalVar246 = &local_26d8;
  puVar244 = &local_26f8;
  local_2624 = in_ESI;
  local_2620 = in_RDI;
  local_2618 = uVar6;
  local_2608 = uVar5;
  local_25f8 = uVar4;
  local_25e8 = uVar3;
  local_25d8 = uVar2;
  local_25c8 = uVar1;
  transpose8x16_16x8_sse2
            (in_stack_ffffffffffffd6e8,in_stack_ffffffffffffd6e0,in_stack_ffffffffffffd6d8,
             in_stack_ffffffffffffd6d0,in_stack_ffffffffffffd6c8,in_stack_ffffffffffffd6c0,
             in_stack_ffffffffffffdb00,in_stack_ffffffffffffdb08,in_stack_ffffffffffffdb10,
             in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20,in_stack_ffffffffffffdb28,
             in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb38,in_stack_ffffffffffffdb40,
             in_stack_ffffffffffffdb48);
  x14 = (__m128i *)0x0;
  local_2658 = local_2758;
  palStack_2650 = palStack_27a0;
  x10 = (__m128i *)0x0;
  local_2668 = local_2768;
  palStack_2660 = palStack_2790;
  local_2508 = uStack_2780;
  x6_00 = (__m128i *)0x0;
  local_2678 = local_2778;
  uStack_2670 = uStack_2780;
  local_2518 = local_2788;
  uStack_2510 = uStack_2780;
  local_2528 = palStack_2770;
  uStack_2520 = 0;
  local_2688 = local_2788;
  palStack_2680 = palStack_2770;
  local_2538 = local_2798;
  palStack_2530 = palStack_2790;
  local_2548 = palStack_2760;
  uStack_2540 = 0;
  local_2698 = local_2798;
  uVar302 = local_2698;
  palStack_2690 = palStack_2760;
  local_2558 = local_27a8;
  palStack_2550 = palStack_27a0;
  local_2568 = palStack_2750;
  uStack_2560 = 0;
  local_26a8 = local_27a8;
  uStack_26a0 = palStack_2750;
  palVar303 = uStack_26a0;
  local_2578 = local_27b8;
  uStack_2570 = uStack_27b0;
  local_2588 = lStack_2740;
  uStack_2580 = 0;
  local_26b8 = local_27b8;
  uStack_26b0 = lStack_2740;
  lVar128 = uStack_26b0;
  local_2808 = uStack_27b0;
  uStack_2800 = 0;
  local_20f0 = &local_2658;
  local_20f8 = &local_2668;
  local_2100 = &local_2678;
  local_2108 = &local_2688;
  local_2110 = &local_2698;
  local_2118 = &local_26a8;
  local_2120 = &local_26b8;
  local_2128 = &local_2858;
  local_2130 = &local_2868;
  local_2138 = &local_2878;
  local_20e8 = 0;
  uStack_20e0 = 0;
  local_2148 = 0;
  uStack_2140 = 0;
  local_1df9 = 1;
  local_669 = 1;
  local_66a = 1;
  local_66b = 1;
  local_66c = 1;
  local_66d = 1;
  local_66e = 1;
  local_66f = 1;
  local_670 = 1;
  local_671 = 1;
  local_672 = 1;
  local_673 = 1;
  local_674 = 1;
  local_675 = 1;
  local_676 = 1;
  local_677 = 1;
  local_678 = 1;
  local_2158 = 0x101010101010101;
  uStack_2150 = 0x101010101010101;
  uStack_21c0 = local_27a8;
  uStack_26b0._4_4_ = (undefined4)((ulong)lStack_2740 >> 0x20);
  uStack_21cc = uStack_26b0._4_4_;
  uStack_504 = (undefined4)(local_27a8 >> 0x20);
  uStack_26a0._4_4_ = (undefined4)((ulong)palStack_2750 >> 0x20);
  uStack_4fc = uStack_26a0._4_4_;
  local_2698._0_4_ = (undefined4)local_2798;
  local_4e8 = (undefined1)local_27a8;
  uStack_4e7 = (undefined1)(local_27a8 >> 8);
  uStack_4e6 = (undefined1)(local_27a8 >> 0x10);
  uStack_4e5 = (undefined1)(local_27a8 >> 0x18);
  _local_4f8 = CONCAT44((int)(local_27b8 >> 0x20),(undefined4)local_2698);
  uStack_21d0 = uStack_4f0;
  local_21c8 = CONCAT44(uStack_26a0._4_4_,uStack_500);
  alVar333[1] = (longlong)puVar244;
  alVar333[0] = extraout_RDX;
  a[1] = (longlong)ppalVar246;
  a[0] = (longlong)puVar242;
  uStack_26b0 = lVar128;
  uStack_26a0 = palVar303;
  local_2698 = uVar302;
  local_688 = local_2158;
  uStack_680 = uStack_2150;
  uStack_4ec = uStack_21cc;
  alVar333 = abs_diff(a,alVar333);
  b[0] = alVar333[1];
  local_1dfa = 0xfe;
  local_649 = 0xfe;
  local_64a = 0xfe;
  local_64b = 0xfe;
  local_64c = 0xfe;
  local_64d = 0xfe;
  local_64e = 0xfe;
  local_64f = 0xfe;
  local_650 = 0xfe;
  local_651 = 0xfe;
  local_652 = 0xfe;
  local_653 = 0xfe;
  local_654 = 0xfe;
  local_655 = 0xfe;
  local_656 = 0xfe;
  local_657 = 0xfe;
  local_658 = 0xfe;
  local_1d08 = (byte)extraout_XMM0_Qa;
  bStack_1d07 = (byte)((ulong)extraout_XMM0_Qa >> 8);
  bStack_1d06 = (byte)((ulong)extraout_XMM0_Qa >> 0x10);
  bStack_1d05 = (byte)((ulong)extraout_XMM0_Qa >> 0x18);
  bStack_1d04 = (byte)((ulong)extraout_XMM0_Qa >> 0x20);
  bStack_1d03 = (byte)((ulong)extraout_XMM0_Qa >> 0x28);
  bStack_1d02 = (byte)((ulong)extraout_XMM0_Qa >> 0x30);
  bStack_1d01 = (byte)((ulong)extraout_XMM0_Qa >> 0x38);
  bStack_1d00 = (byte)extraout_XMM0_Qb;
  bStack_1cff = (byte)((ulong)extraout_XMM0_Qb >> 8);
  bStack_1cfe = (byte)((ulong)extraout_XMM0_Qb >> 0x10);
  bStack_1cfd = (byte)((ulong)extraout_XMM0_Qb >> 0x18);
  bStack_1cfc = (byte)((ulong)extraout_XMM0_Qb >> 0x20);
  bStack_1cfb = (byte)((ulong)extraout_XMM0_Qb >> 0x28);
  bStack_1cfa = (byte)((ulong)extraout_XMM0_Qb >> 0x30);
  bStack_1cf9 = (byte)((ulong)extraout_XMM0_Qb >> 0x38);
  b[1] = (longlong)puVar244;
  a_00[1] = (longlong)ppalVar246;
  a_00[0] = (longlong)puVar242;
  local_668 = 0xfefefefefefefefe;
  uStack_660 = 0xfefefefefefefefe;
  alVar333 = abs_diff(a_00,b);
  b_00[0] = alVar333[1];
  local_1f78 = local_2148;
  uStack_1f70 = uStack_2140;
  uStack_1bb0 = 0;
  local_2188._0_2_ =
       CONCAT11((bStack_1d07 < bStack_1cff) * bStack_1cff |
                (bStack_1d07 >= bStack_1cff) * bStack_1d07,
                (local_1d08 < bStack_1d00) * bStack_1d00 | (local_1d08 >= bStack_1d00) * local_1d08)
  ;
  local_2188._0_3_ =
       CONCAT12((bStack_1d06 < bStack_1cfe) * bStack_1cfe |
                (bStack_1d06 >= bStack_1cfe) * bStack_1d06,(undefined2)local_2188);
  local_2188._0_4_ =
       CONCAT13((bStack_1d05 < bStack_1cfd) * bStack_1cfd |
                (bStack_1d05 >= bStack_1cfd) * bStack_1d05,(undefined3)local_2188);
  local_2188._0_5_ =
       CONCAT14((bStack_1d04 < bStack_1cfc) * bStack_1cfc |
                (bStack_1d04 >= bStack_1cfc) * bStack_1d04,(undefined4)local_2188);
  local_2188._0_6_ =
       CONCAT15((bStack_1d03 < bStack_1cfb) * bStack_1cfb |
                (bStack_1d03 >= bStack_1cfb) * bStack_1d03,(undefined5)local_2188);
  local_2188._0_7_ =
       CONCAT16((bStack_1d02 < bStack_1cfa) * bStack_1cfa |
                (bStack_1d02 >= bStack_1cfa) * bStack_1d02,(undefined6)local_2188);
  local_2188 = CONCAT17((bStack_1d01 < bStack_1cf9) * bStack_1cf9 |
                        (bStack_1d01 >= bStack_1cf9) * bStack_1d01,(undefined7)local_2188);
  uStack_2180._0_1_ = bStack_1d00;
  uStack_2180._1_1_ = bStack_1cff;
  uStack_2180._2_1_ = bStack_1cfe;
  uStack_2180._3_1_ = bStack_1cfd;
  uStack_2180._4_1_ = bStack_1cfc;
  uStack_2180._5_1_ = bStack_1cfb;
  uStack_2180._6_1_ = bStack_1cfa;
  uStack_2180._7_1_ = bStack_1cf9;
  local_16f8 = *(undefined8 *)*local_2138;
  uStack_16f0 = *(undefined8 *)(*local_2138 + 8);
  local_16e8 = local_2188;
  uStack_16e0 = uStack_2180;
  auVar112._8_8_ = uStack_2180;
  auVar112._0_8_ = local_2188;
  auVar260 = psubusb(auVar112,*local_2138);
  local_2178 = auVar260._0_8_;
  uStack_2170 = auVar260._8_8_;
  local_1d28 = local_2178;
  uVar302 = local_1d28;
  uStack_1d20 = uStack_2170;
  uVar5 = uStack_1d20;
  local_1d38 = local_2148;
  uVar3 = local_1d38;
  uStack_1d30 = uStack_2140;
  uVar4 = uStack_1d30;
  local_1d28._0_1_ = auVar260[0];
  local_1d28._1_1_ = auVar260[1];
  local_1d28._2_1_ = auVar260[2];
  local_1d28._3_1_ = auVar260[3];
  local_1d28._4_1_ = auVar260[4];
  local_1d28._5_1_ = auVar260[5];
  local_1d28._6_1_ = auVar260[6];
  local_1d28._7_1_ = auVar260[7];
  uStack_1d20._0_1_ = auVar260[8];
  uStack_1d20._1_1_ = auVar260[9];
  uStack_1d20._2_1_ = auVar260[10];
  uStack_1d20._3_1_ = auVar260[0xb];
  uStack_1d20._4_1_ = auVar260[0xc];
  uStack_1d20._5_1_ = auVar260[0xd];
  uStack_1d20._6_1_ = auVar260[0xe];
  uStack_1d20._7_1_ = auVar260[0xf];
  local_1d38._0_1_ = (char)local_2148;
  local_1d38._1_1_ = (char)((ulong)local_2148 >> 8);
  local_1d38._2_1_ = (char)((ulong)local_2148 >> 0x10);
  local_1d38._3_1_ = (char)((ulong)local_2148 >> 0x18);
  local_1d38._4_1_ = (char)((ulong)local_2148 >> 0x20);
  local_1d38._5_1_ = (char)((ulong)local_2148 >> 0x28);
  local_1d38._6_1_ = (char)((ulong)local_2148 >> 0x30);
  local_1d38._7_1_ = (char)((ulong)local_2148 >> 0x38);
  uStack_1d30._0_1_ = (char)uStack_2140;
  uStack_1d30._1_1_ = (char)((ulong)uStack_2140 >> 8);
  uStack_1d30._2_1_ = (char)((ulong)uStack_2140 >> 0x10);
  uStack_1d30._3_1_ = (char)((ulong)uStack_2140 >> 0x18);
  uStack_1d30._4_1_ = (char)((ulong)uStack_2140 >> 0x20);
  uStack_1d30._5_1_ = (char)((ulong)uStack_2140 >> 0x28);
  uStack_1d30._6_1_ = (char)((ulong)uStack_2140 >> 0x30);
  uStack_1d30._7_1_ = (char)((ulong)uStack_2140 >> 0x38);
  local_16a8 = -((char)local_1d28 == (char)local_1d38);
  cStack_16a7 = -(local_1d28._1_1_ == local_1d38._1_1_);
  cStack_16a6 = -(local_1d28._2_1_ == local_1d38._2_1_);
  cStack_16a5 = -(local_1d28._3_1_ == local_1d38._3_1_);
  cStack_16a4 = -(local_1d28._4_1_ == local_1d38._4_1_);
  cStack_16a3 = -(local_1d28._5_1_ == local_1d38._5_1_);
  cStack_16a2 = -(local_1d28._6_1_ == local_1d38._6_1_);
  cStack_16a1 = -(local_1d28._7_1_ == local_1d38._7_1_);
  cStack_16a0 = -((char)uStack_1d20 == (char)uStack_1d30);
  cStack_169f = -(uStack_1d20._1_1_ == uStack_1d30._1_1_);
  cStack_169e = -(uStack_1d20._2_1_ == uStack_1d30._2_1_);
  cStack_169d = -(uStack_1d20._3_1_ == uStack_1d30._3_1_);
  cStack_169c = -(uStack_1d20._4_1_ == uStack_1d30._4_1_);
  cStack_169b = -(uStack_1d20._5_1_ == uStack_1d30._5_1_);
  cStack_169a = -(uStack_1d20._6_1_ == uStack_1d30._6_1_);
  cStack_1699 = -(uStack_1d20._7_1_ == uStack_1d30._7_1_);
  local_16b8 = 0xffffffffffffffff;
  uStack_16b0 = 0xffffffffffffffff;
  local_1f98 = CONCAT17(cStack_16a1,
                        CONCAT16(cStack_16a2,
                                 CONCAT15(cStack_16a3,
                                          CONCAT14(cStack_16a4,
                                                   CONCAT13(cStack_16a5,
                                                            CONCAT12(cStack_16a6,
                                                                     CONCAT11(cStack_16a7,local_16a8
                                                                             ))))))) ^
               0xffffffffffffffff;
  uStack_1f90 = CONCAT17(cStack_1699,
                         CONCAT16(cStack_169a,
                                  CONCAT15(cStack_169b,
                                           CONCAT14(cStack_169c,
                                                    CONCAT13(cStack_169d,
                                                             CONCAT12(cStack_169e,
                                                                      CONCAT11(cStack_169f,
                                                                               cStack_16a0))))))) ^
                0xffffffffffffffff;
  uStack_1b60 = local_2148;
  uStack_1b70 = local_2148;
  auVar106._8_8_ = local_2148;
  auVar106._0_8_ = extraout_XMM0_Qa_00;
  auVar261._8_8_ = local_2148;
  auVar261._0_8_ = extraout_XMM0_Qa_00;
  auVar261 = paddusb(auVar106,auVar261);
  uStack_1780 = 0;
  uVar258 = extraout_XMM0_Qb_00 & 0xfefefefefefefefe;
  uStack_1900 = 0;
  local_190c = 1;
  local_1908._0_2_ = (ushort)uVar258;
  local_1908._2_2_ = (ushort)(uVar258 >> 0x10);
  local_1908._4_2_ = (ushort)(uVar258 >> 0x20);
  local_2218 = CONCAT26((ushort)(uVar258 >> 0x31),
                        CONCAT24(local_1908._4_2_ >> 1,
                                 CONCAT22(local_1908._2_2_ >> 1,(ushort)local_1908 >> 1)));
  local_2228 = auVar261._0_8_;
  uStack_2220 = auVar261._8_8_;
  local_1b88 = local_2228;
  uStack_1b80 = uStack_2220;
  local_1b98 = local_2218;
  uStack_1b90 = 0;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = local_2218;
  local_1708 = paddusb(auVar261,auVar260);
  local_1718 = *(undefined8 *)*local_2128;
  uStack_1710 = *(undefined8 *)(*local_2128 + 8);
  auVar260 = psubusb(local_1708,*local_2128);
  local_2168 = auVar260._0_8_;
  uStack_2160 = auVar260._8_8_;
  local_1d48 = local_2168;
  uVar1 = local_1d48;
  uStack_1d40 = uStack_2160;
  uVar2 = uStack_1d40;
  local_1d58 = local_2148;
  uStack_1d50 = uStack_2140;
  local_1d48._0_1_ = auVar260[0];
  local_1d48._1_1_ = auVar260[1];
  local_1d48._2_1_ = auVar260[2];
  local_1d48._3_1_ = auVar260[3];
  local_1d48._4_1_ = auVar260[4];
  local_1d48._5_1_ = auVar260[5];
  local_1d48._6_1_ = auVar260[6];
  local_1d48._7_1_ = auVar260[7];
  uStack_1d40._0_1_ = auVar260[8];
  uStack_1d40._1_1_ = auVar260[9];
  uStack_1d40._2_1_ = auVar260[10];
  uStack_1d40._3_1_ = auVar260[0xb];
  uStack_1d40._4_1_ = auVar260[0xc];
  uStack_1d40._5_1_ = auVar260[0xd];
  uStack_1d40._6_1_ = auVar260[0xe];
  uStack_1d40._7_1_ = auVar260[0xf];
  local_16c8 = -((char)local_1d48 == (char)local_1d38);
  cStack_16c7 = -(local_1d48._1_1_ == local_1d38._1_1_);
  cStack_16c6 = -(local_1d48._2_1_ == local_1d38._2_1_);
  cStack_16c5 = -(local_1d48._3_1_ == local_1d38._3_1_);
  cStack_16c4 = -(local_1d48._4_1_ == local_1d38._4_1_);
  cStack_16c3 = -(local_1d48._5_1_ == local_1d38._5_1_);
  cStack_16c2 = -(local_1d48._6_1_ == local_1d38._6_1_);
  cStack_16c1 = -(local_1d48._7_1_ == local_1d38._7_1_);
  cStack_16c0 = -((char)uStack_1d40 == (char)uStack_1d30);
  cStack_16bf = -(uStack_1d40._1_1_ == uStack_1d30._1_1_);
  cStack_16be = -(uStack_1d40._2_1_ == uStack_1d30._2_1_);
  cStack_16bd = -(uStack_1d40._3_1_ == uStack_1d30._3_1_);
  cStack_16bc = -(uStack_1d40._4_1_ == uStack_1d30._4_1_);
  cStack_16bb = -(uStack_1d40._5_1_ == uStack_1d30._5_1_);
  cStack_16ba = -(uStack_1d40._6_1_ == uStack_1d30._6_1_);
  cStack_16b9 = -(uStack_1d40._7_1_ == uStack_1d30._7_1_);
  local_16d8 = 0xffffffffffffffff;
  uStack_16d0 = 0xffffffffffffffff;
  uVar259 = CONCAT17(cStack_16c1,
                     CONCAT16(cStack_16c2,
                              CONCAT15(cStack_16c3,
                                       CONCAT14(cStack_16c4,
                                                CONCAT13(cStack_16c5,
                                                         CONCAT12(cStack_16c6,
                                                                  CONCAT11(cStack_16c7,local_16c8)))
                                               )))) ^ 0xffffffffffffffff;
  uVar301 = CONCAT17(cStack_16b9,
                     CONCAT16(cStack_16ba,
                              CONCAT15(cStack_16bb,
                                       CONCAT14(cStack_16bc,
                                                CONCAT13(cStack_16bd,
                                                         CONCAT12(cStack_16be,
                                                                  CONCAT11(cStack_16bf,cStack_16c0))
                                                        ))))) ^ 0xffffffffffffffff;
  local_1bd8._0_1_ = (byte)uVar259;
  local_1bd8._1_1_ = (byte)(uVar259 >> 8);
  local_1bd8._2_1_ = (byte)(uVar259 >> 0x10);
  local_1bd8._3_1_ = (byte)(uVar259 >> 0x18);
  local_1bd8._4_1_ = (byte)(uVar259 >> 0x20);
  local_1bd8._5_1_ = (byte)(uVar259 >> 0x28);
  local_1bd8._6_1_ = (byte)(uVar259 >> 0x30);
  local_1bd8._7_1_ = (byte)(uVar259 >> 0x38);
  uStack_1bd0._0_1_ = (byte)uVar301;
  uStack_1bd0._1_1_ = (byte)(uVar301 >> 8);
  uStack_1bd0._2_1_ = (byte)(uVar301 >> 0x10);
  uStack_1bd0._3_1_ = (byte)(uVar301 >> 0x18);
  uStack_1bd0._4_1_ = (byte)(uVar301 >> 0x20);
  uStack_1bd0._5_1_ = (byte)(uVar301 >> 0x28);
  uStack_1bd0._6_1_ = (byte)(uVar301 >> 0x30);
  uStack_1bd0._7_1_ = (byte)(uVar301 >> 0x38);
  local_2168._1_1_ =
       (bStack_1d07 < local_1bd8._1_1_) * local_1bd8._1_1_ |
       (bStack_1d07 >= local_1bd8._1_1_) * bStack_1d07;
  local_2168._0_1_ =
       (local_1d08 < (byte)local_1bd8) * (byte)local_1bd8 |
       (local_1d08 >= (byte)local_1bd8) * local_1d08;
  local_2168._2_1_ =
       (bStack_1d06 < local_1bd8._2_1_) * local_1bd8._2_1_ |
       (bStack_1d06 >= local_1bd8._2_1_) * bStack_1d06;
  local_2168._3_1_ =
       (bStack_1d05 < local_1bd8._3_1_) * local_1bd8._3_1_ |
       (bStack_1d05 >= local_1bd8._3_1_) * bStack_1d05;
  local_2168._4_1_ =
       (bStack_1d04 < local_1bd8._4_1_) * local_1bd8._4_1_ |
       (bStack_1d04 >= local_1bd8._4_1_) * bStack_1d04;
  local_2168._5_1_ =
       (bStack_1d03 < local_1bd8._5_1_) * local_1bd8._5_1_ |
       (bStack_1d03 >= local_1bd8._5_1_) * bStack_1d03;
  local_2168._6_1_ =
       (bStack_1d02 < local_1bd8._6_1_) * local_1bd8._6_1_ |
       (bStack_1d02 >= local_1bd8._6_1_) * bStack_1d02;
  local_2168._7_1_ =
       (bStack_1d01 < local_1bd8._7_1_) * local_1bd8._7_1_ |
       (bStack_1d01 >= local_1bd8._7_1_) * bStack_1d01;
  uStack_2160._0_1_ =
       (bStack_1d00 < (byte)uStack_1bd0) * (byte)uStack_1bd0 |
       (bStack_1d00 >= (byte)uStack_1bd0) * bStack_1d00;
  uStack_2160._1_1_ =
       (bStack_1cff < uStack_1bd0._1_1_) * uStack_1bd0._1_1_ |
       (bStack_1cff >= uStack_1bd0._1_1_) * bStack_1cff;
  uStack_2160._2_1_ =
       (bStack_1cfe < uStack_1bd0._2_1_) * uStack_1bd0._2_1_ |
       (bStack_1cfe >= uStack_1bd0._2_1_) * bStack_1cfe;
  uStack_2160._3_1_ =
       (bStack_1cfd < uStack_1bd0._3_1_) * uStack_1bd0._3_1_ |
       (bStack_1cfd >= uStack_1bd0._3_1_) * bStack_1cfd;
  uStack_2160._4_1_ =
       (bStack_1cfc < uStack_1bd0._4_1_) * uStack_1bd0._4_1_ |
       (bStack_1cfc >= uStack_1bd0._4_1_) * bStack_1cfc;
  uStack_2160._5_1_ =
       (bStack_1cfb < uStack_1bd0._5_1_) * uStack_1bd0._5_1_ |
       (bStack_1cfb >= uStack_1bd0._5_1_) * bStack_1cfb;
  uStack_2160._6_1_ =
       (bStack_1cfa < uStack_1bd0._6_1_) * uStack_1bd0._6_1_ |
       (bStack_1cfa >= uStack_1bd0._6_1_) * bStack_1cfa;
  uStack_2160._7_1_ =
       (bStack_1cf9 < uStack_1bd0._7_1_) * uStack_1bd0._7_1_ |
       (bStack_1cf9 >= uStack_1bd0._7_1_) * bStack_1cf9;
  b_00[1] = (longlong)puVar244;
  a_01[1] = (longlong)ppalVar246;
  a_01[0] = (longlong)puVar242;
  local_1f88 = local_1f98;
  uStack_1f80 = uStack_1f90;
  local_1d48 = uVar1;
  uStack_1d40 = uVar2;
  local_1d38 = uVar3;
  uStack_1d30 = uVar4;
  local_1d28 = uVar302;
  uStack_1d20 = uVar5;
  local_1bd8 = uVar259;
  uStack_1bd0 = uVar301;
  local_1908 = uVar258;
  local_1798 = 0xfefefefefefefefe;
  uStack_1790 = 0xfefefefefefefefe;
  local_2178 = local_1f98;
  uStack_2170 = local_1f98;
  alVar333 = abs_diff(a_01,b_00);
  b_01[0] = alVar333[1];
  b_01[1] = (longlong)puVar244;
  a_02[1] = (longlong)ppalVar246;
  a_02[0] = (longlong)puVar242;
  alVar333 = abs_diff(a_02,b_01);
  b_02[0] = alVar333[1];
  local_1be8 = (byte)extraout_XMM0_Qa_01;
  bStack_1be7 = (byte)((ulong)extraout_XMM0_Qa_01 >> 8);
  bStack_1be6 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  bStack_1be5 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x18);
  bStack_1be4 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  bStack_1be3 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x28);
  bStack_1be2 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  bStack_1be1 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x38);
  bStack_1be0 = (byte)extraout_XMM0_Qb_01;
  bStack_1bdf = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_1bde = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_1bdd = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_1bdc = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_1bdb = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_1bda = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_1bd9 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_1bf8 = (byte)extraout_XMM0_Qa_02;
  bStack_1bf7 = (byte)((ulong)extraout_XMM0_Qa_02 >> 8);
  bStack_1bf6 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  bStack_1bf5 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x18);
  bStack_1bf4 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  bStack_1bf3 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x28);
  bStack_1bf2 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  bStack_1bf1 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x38);
  bStack_1bf0 = (byte)extraout_XMM0_Qb_02;
  bStack_1bef = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_1bee = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_1bed = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_1bec = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_1beb = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_1bea = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_1be9 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  bVar247 = (local_1be8 < local_1bf8) * local_1bf8 | (local_1be8 >= local_1bf8) * local_1be8;
  bVar262 = (bStack_1be7 < bStack_1bf7) * bStack_1bf7 | (bStack_1be7 >= bStack_1bf7) * bStack_1be7;
  bVar263 = (bStack_1be6 < bStack_1bf6) * bStack_1bf6 | (bStack_1be6 >= bStack_1bf6) * bStack_1be6;
  bVar270 = (bStack_1be5 < bStack_1bf5) * bStack_1bf5 | (bStack_1be5 >= bStack_1bf5) * bStack_1be5;
  bVar271 = (bStack_1be4 < bStack_1bf4) * bStack_1bf4 | (bStack_1be4 >= bStack_1bf4) * bStack_1be4;
  bVar280 = (bStack_1be3 < bStack_1bf3) * bStack_1bf3 | (bStack_1be3 >= bStack_1bf3) * bStack_1be3;
  bVar281 = (bStack_1be2 < bStack_1bf2) * bStack_1bf2 | (bStack_1be2 >= bStack_1bf2) * bStack_1be2;
  bVar289 = (bStack_1be1 < bStack_1bf1) * bStack_1bf1 | (bStack_1be1 >= bStack_1bf1) * bStack_1be1;
  bVar290 = (bStack_1be0 < bStack_1bf0) * bStack_1bf0 | (bStack_1be0 >= bStack_1bf0) * bStack_1be0;
  bVar304 = (bStack_1bdf < bStack_1bef) * bStack_1bef | (bStack_1bdf >= bStack_1bef) * bStack_1bdf;
  bVar305 = (bStack_1bde < bStack_1bee) * bStack_1bee | (bStack_1bde >= bStack_1bee) * bStack_1bde;
  bVar313 = (bStack_1bdd < bStack_1bed) * bStack_1bed | (bStack_1bdd >= bStack_1bed) * bStack_1bdd;
  bVar314 = (bStack_1bdc < bStack_1bec) * bStack_1bec | (bStack_1bdc >= bStack_1bec) * bStack_1bdc;
  bVar323 = (bStack_1bdb < bStack_1beb) * bStack_1beb | (bStack_1bdb >= bStack_1beb) * bStack_1bdb;
  bVar324 = (bStack_1bda < bStack_1bea) * bStack_1bea | (bStack_1bda >= bStack_1bea) * bStack_1bda;
  bVar332 = (bStack_1bd9 < bStack_1be9) * bStack_1be9 | (bStack_1bd9 >= bStack_1be9) * bStack_1bd9;
  local_1c08 = CONCAT17(bVar289,CONCAT16(bVar281,CONCAT15(bVar280,CONCAT14(bVar271,CONCAT13(bVar270,
                                                  CONCAT12(bVar263,CONCAT11(bVar262,bVar247)))))));
  uStack_1c00 = CONCAT17(bVar332,CONCAT16(bVar324,CONCAT15(bVar323,CONCAT14(bVar314,CONCAT13(bVar313
                                                  ,CONCAT12(bVar305,CONCAT11(bVar304,bVar290)))))));
  local_1c18 = local_2168;
  uVar5 = local_1c18;
  uStack_1c10 = uStack_2160;
  uVar6 = uStack_1c10;
  local_1c18._0_1_ = (byte)local_2168;
  local_1c18._1_1_ = local_2168._1_1_;
  local_1c18._2_1_ = local_2168._2_1_;
  local_1c18._3_1_ = local_2168._3_1_;
  local_1c18._4_1_ = local_2168._4_1_;
  local_1c18._5_1_ = local_2168._5_1_;
  local_1c18._6_1_ = local_2168._6_1_;
  local_1c18._7_1_ = local_2168._7_1_;
  uStack_1c10._0_1_ = local_2168._8_1_;
  uStack_1c10._1_1_ = local_2168._9_1_;
  uStack_1c10._2_1_ = local_2168._10_1_;
  uStack_1c10._3_1_ = local_2168._11_1_;
  uStack_1c10._4_1_ = local_2168._12_1_;
  uStack_1c10._5_1_ = local_2168._13_1_;
  uStack_1c10._6_1_ = local_2168._14_1_;
  uStack_1c10._7_1_ = local_2168._15_1_;
  bVar247 = (bVar247 < (byte)local_1c18) * (byte)local_1c18 |
            (bVar247 >= (byte)local_1c18) * bVar247;
  bVar262 = (bVar262 < local_1c18._1_1_) * local_1c18._1_1_ |
            (bVar262 >= local_1c18._1_1_) * bVar262;
  bVar263 = (bVar263 < local_1c18._2_1_) * local_1c18._2_1_ |
            (bVar263 >= local_1c18._2_1_) * bVar263;
  bVar270 = (bVar270 < local_1c18._3_1_) * local_1c18._3_1_ |
            (bVar270 >= local_1c18._3_1_) * bVar270;
  bVar271 = (bVar271 < local_1c18._4_1_) * local_1c18._4_1_ |
            (bVar271 >= local_1c18._4_1_) * bVar271;
  bVar280 = (bVar280 < local_1c18._5_1_) * local_1c18._5_1_ |
            (bVar280 >= local_1c18._5_1_) * bVar280;
  bVar281 = (bVar281 < local_1c18._6_1_) * local_1c18._6_1_ |
            (bVar281 >= local_1c18._6_1_) * bVar281;
  bVar289 = (bVar289 < local_1c18._7_1_) * local_1c18._7_1_ |
            (bVar289 >= local_1c18._7_1_) * bVar289;
  bVar290 = (bVar290 < (byte)uStack_1c10) * (byte)uStack_1c10 |
            (bVar290 >= (byte)uStack_1c10) * bVar290;
  bVar304 = (bVar304 < uStack_1c10._1_1_) * uStack_1c10._1_1_ |
            (bVar304 >= uStack_1c10._1_1_) * bVar304;
  bVar305 = (bVar305 < uStack_1c10._2_1_) * uStack_1c10._2_1_ |
            (bVar305 >= uStack_1c10._2_1_) * bVar305;
  bVar313 = (bVar313 < uStack_1c10._3_1_) * uStack_1c10._3_1_ |
            (bVar313 >= uStack_1c10._3_1_) * bVar313;
  bVar314 = (bVar314 < uStack_1c10._4_1_) * uStack_1c10._4_1_ |
            (bVar314 >= uStack_1c10._4_1_) * bVar314;
  bVar323 = (bVar323 < uStack_1c10._5_1_) * uStack_1c10._5_1_ |
            (bVar323 >= uStack_1c10._5_1_) * bVar323;
  bVar324 = (bVar324 < uStack_1c10._6_1_) * uStack_1c10._6_1_ |
            (bVar324 >= uStack_1c10._6_1_) * bVar324;
  bVar332 = (bVar332 < uStack_1c10._7_1_) * uStack_1c10._7_1_ |
            (bVar332 >= uStack_1c10._7_1_) * bVar332;
  local_2168._0_2_ = CONCAT11(bVar262,bVar247);
  local_2168._0_3_ = CONCAT12(bVar263,(undefined2)local_2168);
  local_2168._0_4_ = CONCAT13(bVar270,(undefined3)local_2168);
  local_2168._0_5_ = CONCAT14(bVar271,(undefined4)local_2168);
  local_2168._0_6_ = CONCAT15(bVar280,(undefined5)local_2168);
  local_2168._0_7_ = CONCAT16(bVar281,(undefined6)local_2168);
  local_2168 = CONCAT17(bVar289,(undefined7)local_2168);
  uStack_2160._0_1_ = bVar290;
  uStack_2160._1_1_ = bVar304;
  uStack_2160._2_1_ = bVar305;
  uStack_2160._3_1_ = bVar313;
  uStack_2160._4_1_ = bVar314;
  uStack_2160._5_1_ = bVar323;
  uStack_2160._6_1_ = bVar324;
  uStack_2160._7_1_ = bVar332;
  local_1c28 = local_2168;
  uStack_1c20 = uStack_2160;
  local_1c38 = uStack_2160;
  uStack_1c30 = 0;
  local_2168._0_2_ =
       CONCAT11((bVar262 < bVar304) * bVar304 | (bVar262 >= bVar304) * bVar262,
                (bVar247 < bVar290) * bVar290 | (bVar247 >= bVar290) * bVar247);
  local_2168._0_3_ =
       CONCAT12((bVar263 < bVar305) * bVar305 | (bVar263 >= bVar305) * bVar263,
                (undefined2)local_2168);
  local_2168._0_4_ =
       CONCAT13((bVar270 < bVar313) * bVar313 | (bVar270 >= bVar313) * bVar270,
                (undefined3)local_2168);
  local_2168._0_5_ =
       CONCAT14((bVar271 < bVar314) * bVar314 | (bVar271 >= bVar314) * bVar271,
                (undefined4)local_2168);
  local_2168._0_6_ =
       CONCAT15((bVar280 < bVar323) * bVar323 | (bVar280 >= bVar323) * bVar280,
                (undefined5)local_2168);
  local_2168._0_7_ =
       CONCAT16((bVar281 < bVar324) * bVar324 | (bVar281 >= bVar324) * bVar281,
                (undefined6)local_2168);
  local_2168 = CONCAT17((bVar289 < bVar332) * bVar332 | (bVar289 >= bVar332) * bVar289,
                        (undefined7)local_2168);
  local_1738 = *(undefined8 *)*local_2130;
  uStack_1730 = *(undefined8 *)(*local_2130 + 8);
  local_1728 = local_2168;
  uStack_1720 = uStack_2160;
  auVar111._8_8_ = uStack_2160;
  auVar111._0_8_ = local_2168;
  auVar260 = psubusb(auVar111,*local_2130);
  local_2168 = auVar260._0_8_;
  uStack_2160 = auVar260._8_8_;
  local_1d68 = local_2168;
  uVar3 = local_1d68;
  uStack_1d60 = uStack_2160;
  uVar4 = uStack_1d60;
  local_1d78 = local_2148;
  uVar1 = local_1d78;
  uStack_1d70 = uStack_2140;
  uVar2 = uStack_1d70;
  local_1d68._0_1_ = auVar260[0];
  local_1d68._1_1_ = auVar260[1];
  local_1d68._2_1_ = auVar260[2];
  local_1d68._3_1_ = auVar260[3];
  local_1d68._4_1_ = auVar260[4];
  local_1d68._5_1_ = auVar260[5];
  local_1d68._6_1_ = auVar260[6];
  local_1d68._7_1_ = auVar260[7];
  uStack_1d60._0_1_ = auVar260[8];
  uStack_1d60._1_1_ = auVar260[9];
  uStack_1d60._2_1_ = auVar260[10];
  uStack_1d60._3_1_ = auVar260[0xb];
  uStack_1d60._4_1_ = auVar260[0xc];
  uStack_1d60._5_1_ = auVar260[0xd];
  uStack_1d60._6_1_ = auVar260[0xe];
  uStack_1d60._7_1_ = auVar260[0xf];
  local_1d78._0_1_ = (char)local_2148;
  local_1d78._1_1_ = (char)((ulong)local_2148 >> 8);
  local_1d78._2_1_ = (char)((ulong)local_2148 >> 0x10);
  local_1d78._3_1_ = (char)((ulong)local_2148 >> 0x18);
  local_1d78._4_1_ = (char)((ulong)local_2148 >> 0x20);
  local_1d78._5_1_ = (char)((ulong)local_2148 >> 0x28);
  local_1d78._6_1_ = (char)((ulong)local_2148 >> 0x30);
  local_1d78._7_1_ = (char)((ulong)local_2148 >> 0x38);
  uStack_1d70._0_1_ = (char)uStack_2140;
  uStack_1d70._1_1_ = (char)((ulong)uStack_2140 >> 8);
  uStack_1d70._2_1_ = (char)((ulong)uStack_2140 >> 0x10);
  uStack_1d70._3_1_ = (char)((ulong)uStack_2140 >> 0x18);
  uStack_1d70._4_1_ = (char)((ulong)uStack_2140 >> 0x20);
  uStack_1d70._5_1_ = (char)((ulong)uStack_2140 >> 0x28);
  uStack_1d70._6_1_ = (char)((ulong)uStack_2140 >> 0x30);
  uStack_1d70._7_1_ = (char)((ulong)uStack_2140 >> 0x38);
  local_2168._0_2_ =
       CONCAT11(-(local_1d68._1_1_ == local_1d78._1_1_),-((char)local_1d68 == (char)local_1d78));
  local_2168._0_3_ = CONCAT12(-(local_1d68._2_1_ == local_1d78._2_1_),(undefined2)local_2168);
  local_2168._0_4_ = CONCAT13(-(local_1d68._3_1_ == local_1d78._3_1_),(undefined3)local_2168);
  local_2168._0_5_ = CONCAT14(-(local_1d68._4_1_ == local_1d78._4_1_),(undefined4)local_2168);
  local_2168._0_6_ = CONCAT15(-(local_1d68._5_1_ == local_1d78._5_1_),(undefined5)local_2168);
  local_2168._0_7_ = CONCAT16(-(local_1d68._6_1_ == local_1d78._6_1_),(undefined6)local_2168);
  local_2168 = CONCAT17(-(local_1d68._7_1_ == local_1d78._7_1_),(undefined7)local_2168);
  uStack_2160._0_1_ = -((char)uStack_1d60 == (char)uStack_1d70);
  uStack_2160._1_1_ = -(uStack_1d60._1_1_ == uStack_1d70._1_1_);
  uStack_2160._2_1_ = -(uStack_1d60._2_1_ == uStack_1d70._2_1_);
  uStack_2160._3_1_ = -(uStack_1d60._3_1_ == uStack_1d70._3_1_);
  uStack_2160._4_1_ = -(uStack_1d60._4_1_ == uStack_1d70._4_1_);
  uStack_2160._5_1_ = -(uStack_1d60._5_1_ == uStack_1d70._5_1_);
  uStack_2160._6_1_ = -(uStack_1d60._6_1_ == uStack_1d70._6_1_);
  uStack_2160._7_1_ = -(uStack_1d60._7_1_ == uStack_1d70._7_1_);
  local_430 = &local_21c8;
  local_438 = &local_21d8;
  local_440 = &local_2178;
  local_448 = &local_2168;
  local_450 = local_21e8;
  local_458 = local_21f8;
  local_ed = 3;
  local_ee = 3;
  local_ef = 3;
  local_f0 = 3;
  local_f1 = 3;
  local_f2 = 3;
  local_f3 = 3;
  local_f4 = 3;
  local_f5 = 4;
  local_f6 = 4;
  local_f7 = 4;
  local_f8 = 4;
  local_f9 = 4;
  local_fa = 4;
  local_fb = 4;
  local_fc = 4;
  local_468 = 0x404040404040404;
  uStack_460 = 0x303030303030303;
  local_399 = 0x80;
  local_119 = 0x80;
  local_11a = 0x80;
  local_11b = 0x80;
  local_11c = 0x80;
  local_11d = 0x80;
  local_11e = 0x80;
  local_11f = 0x80;
  local_120 = 0x80;
  local_121 = 0x80;
  local_122 = 0x80;
  local_123 = 0x80;
  local_124 = 0x80;
  local_125 = 0x80;
  local_126 = 0x80;
  local_127 = 0x80;
  local_128 = 0x80;
  local_478 = 0x8080808080808080;
  uStack_470 = 0x8080808080808080;
  local_4e8 = 0xff;
  uStack_4e7 = 0xff;
  uStack_4e6 = 0xff;
  uStack_4e5 = 0xff;
  uStack_4e4 = 0xff;
  uStack_4e3 = 0xff;
  uStack_4e2 = 0xff;
  uStack_4e1 = 0xff;
  uStack_4e0 = 0xff;
  uStack_4df = 0xff;
  uStack_4de = 0xff;
  uStack_4dd = 0xff;
  uStack_4dc = 0xff;
  uStack_4db = 0xff;
  uStack_4da = 0xff;
  uStack_4d9 = 0xff;
  local_2c8 = local_21c8;
  local_208 = local_21c8 ^ 0x8080808080808080;
  uStack_200 = uStack_21c0 ^ 0x8080808080808080;
  uStack_2e0 = CONCAT44(uStack_21cc,uStack_21d0);
  local_218 = CONCAT44(uStack_21d4,local_21d8) ^ 0x8080808080808080;
  uStack_2a0 = uStack_2e0 ^ 0x8080808080808080;
  auVar120._8_8_ = uStack_200;
  auVar120._0_8_ = local_208;
  auVar119._8_8_ = uStack_2a0;
  auVar119._0_8_ = local_218;
  local_4a8 = psubsb(auVar120,auVar119);
  local_358 = local_2178;
  uStack_350 = uStack_2170;
  local_348 = local_4a8._8_8_;
  uStack_340 = 0;
  local_228 = local_4a8._8_8_ & local_2178;
  uStack_220 = 0;
  local_238 = local_4a8._0_8_;
  uStack_230 = local_4a8._8_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = local_228;
  auVar260 = psubsb(auVar118,local_4a8);
  local_488 = auVar260._0_8_;
  uStack_480 = auVar260._8_8_;
  local_248 = local_488;
  uStack_240 = uStack_480;
  local_258 = local_4a8._0_8_;
  uStack_250 = local_4a8._8_8_;
  auVar260 = psubsb(auVar260,local_4a8);
  local_488 = auVar260._0_8_;
  uStack_480 = auVar260._8_8_;
  local_268 = local_488;
  uStack_260 = uStack_480;
  local_278 = local_4a8._0_8_;
  uStack_270 = local_4a8._8_8_;
  auVar260 = psubsb(auVar260,local_4a8);
  local_488 = auVar260._0_8_;
  uStack_480 = auVar260._8_8_;
  local_378 = local_2168;
  uStack_370 = uStack_2160;
  local_368 = local_488;
  uStack_360 = uStack_480;
  local_3c8 = local_488 & local_2168;
  uStack_3c0 = uStack_480 & uStack_2160;
  auVar124._8_8_ = local_3c8;
  auVar124._0_8_ = local_3c8;
  auVar123._8_8_ = 0x303030303030303;
  auVar123._0_8_ = 0x404040404040404;
  auVar260 = paddsb(auVar124,auVar123);
  local_498 = auVar260._0_8_;
  uStack_490 = auVar260._8_8_;
  local_188 = local_498;
  uStack_180 = uStack_490;
  uVar22 = uStack_180;
  local_198 = local_498;
  uStack_190 = uStack_490;
  uStack_180._0_1_ = auVar260[8];
  uStack_180._1_1_ = auVar260[9];
  uStack_180._2_1_ = auVar260[10];
  uStack_180._3_1_ = auVar260[0xb];
  uStack_180._4_1_ = auVar260[0xc];
  uStack_180._5_1_ = auVar260[0xd];
  uStack_180._6_1_ = auVar260[0xe];
  uStack_180._7_1_ = auVar260[0xf];
  local_488._0_2_ = CONCAT11((undefined1)uStack_180,(undefined1)uStack_180);
  local_488._0_3_ = CONCAT12(uStack_180._1_1_,(undefined2)local_488);
  local_488._0_4_ = CONCAT13(uStack_180._1_1_,(undefined3)local_488);
  local_488._0_5_ = CONCAT14(uStack_180._2_1_,(undefined4)local_488);
  local_488._0_6_ = CONCAT15(uStack_180._2_1_,(undefined5)local_488);
  local_488._0_7_ = CONCAT16(uStack_180._3_1_,(undefined6)local_488);
  local_488 = CONCAT17(uStack_180._3_1_,(undefined7)local_488);
  uStack_480._0_1_ = uStack_180._4_1_;
  uStack_480._1_1_ = uStack_180._4_1_;
  uStack_480._2_1_ = uStack_180._5_1_;
  uStack_480._3_1_ = uStack_180._5_1_;
  uStack_480._4_1_ = uStack_180._6_1_;
  uStack_480._5_1_ = uStack_180._6_1_;
  uStack_480._6_1_ = uStack_180._7_1_;
  uStack_480._7_1_ = uStack_180._7_1_;
  local_3f8 = local_498;
  uVar21 = local_3f8;
  uStack_3f0 = uStack_490;
  local_408 = local_498;
  uStack_400 = uStack_490;
  local_3f8._0_1_ = auVar260[0];
  local_3f8._1_1_ = auVar260[1];
  local_3f8._2_1_ = auVar260[2];
  local_3f8._3_1_ = auVar260[3];
  local_3f8._4_1_ = auVar260[4];
  local_3f8._5_1_ = auVar260[5];
  local_3f8._6_1_ = auVar260[6];
  local_3f8._7_1_ = auVar260[7];
  local_498._0_2_ = CONCAT11((undefined1)local_3f8,(undefined1)local_3f8);
  local_498._0_3_ = CONCAT12(local_3f8._1_1_,(undefined2)local_498);
  local_498._0_4_ = CONCAT13(local_3f8._1_1_,(undefined3)local_498);
  local_498._0_5_ = CONCAT14(local_3f8._2_1_,(undefined4)local_498);
  local_498._0_6_ = CONCAT15(local_3f8._2_1_,(undefined5)local_498);
  local_498._0_7_ = CONCAT16(local_3f8._3_1_,(undefined6)local_498);
  local_498 = CONCAT17(local_3f8._3_1_,(undefined7)local_498);
  uStack_490._0_1_ = local_3f8._4_1_;
  uStack_490._1_1_ = local_3f8._4_1_;
  uStack_490._2_1_ = local_3f8._5_1_;
  uStack_490._3_1_ = local_3f8._5_1_;
  uStack_490._4_1_ = local_3f8._6_1_;
  uStack_490._5_1_ = local_3f8._6_1_;
  uStack_490._6_1_ = local_3f8._7_1_;
  uStack_490._7_1_ = local_3f8._7_1_;
  local_a8 = local_498;
  uStack_a0 = uStack_490;
  local_ac = 0xb;
  auVar127._8_8_ = uStack_490;
  auVar127._0_8_ = local_498;
  auVar260 = psraw(auVar127,ZEXT416(0xb));
  local_c8 = local_488;
  uStack_c0 = uStack_480;
  local_cc = 0xb;
  auVar126._8_8_ = uStack_480;
  auVar126._0_8_ = local_488;
  auVar261 = psraw(auVar126,ZEXT416(0xb));
  local_498 = auVar260._0_8_;
  uStack_490 = auVar260._8_8_;
  local_488 = auVar261._0_8_;
  uStack_480 = auVar261._8_8_;
  local_148 = local_498;
  uStack_140 = uStack_490;
  local_158 = local_488;
  uStack_150 = uStack_480;
  auVar261 = packsswb(auVar260,auVar261);
  local_498 = auVar261._0_8_;
  uStack_490 = auVar261._8_8_;
  uStack_3d0 = uStack_490;
  local_298 = 0xffffffffffffffff;
  uStack_290 = 0xffffffffffffffff;
  local_288 = local_498;
  uStack_280 = uStack_490;
  auVar117._8_8_ = 0xffffffffffffffff;
  auVar117._0_8_ = 0xffffffffffffffff;
  auVar260 = psubsb(auVar261,auVar117);
  local_488 = auVar260._0_8_;
  uStack_480 = auVar260._8_8_;
  local_418 = local_488;
  uVar20 = local_418;
  uStack_410 = uStack_480;
  local_428 = local_488;
  uStack_420 = uStack_480;
  local_418._0_1_ = auVar260[0];
  local_418._1_1_ = auVar260[1];
  local_418._2_1_ = auVar260[2];
  local_418._3_1_ = auVar260[3];
  local_418._4_1_ = auVar260[4];
  local_418._5_1_ = auVar260[5];
  local_418._6_1_ = auVar260[6];
  local_418._7_1_ = auVar260[7];
  local_488._0_2_ = CONCAT11((undefined1)local_418,(undefined1)local_418);
  local_488._0_3_ = CONCAT12(local_418._1_1_,(undefined2)local_488);
  local_488._0_4_ = CONCAT13(local_418._1_1_,(undefined3)local_488);
  local_488._0_5_ = CONCAT14(local_418._2_1_,(undefined4)local_488);
  local_488._0_6_ = CONCAT15(local_418._2_1_,(undefined5)local_488);
  local_488._0_7_ = CONCAT16(local_418._3_1_,(undefined6)local_488);
  local_488 = CONCAT17(local_418._3_1_,(undefined7)local_488);
  uStack_480._0_1_ = local_418._4_1_;
  uStack_480._1_1_ = local_418._4_1_;
  uStack_480._2_1_ = local_418._5_1_;
  uStack_480._3_1_ = local_418._5_1_;
  uStack_480._4_1_ = local_418._6_1_;
  uStack_480._5_1_ = local_418._6_1_;
  uStack_480._6_1_ = local_418._7_1_;
  uStack_480._7_1_ = local_418._7_1_;
  local_e8 = local_488;
  uStack_e0 = uStack_480;
  local_ec = 9;
  auVar125._8_8_ = uStack_480;
  auVar125._0_8_ = local_488;
  auVar260 = psraw(auVar125,ZEXT416(9));
  local_488 = auVar260._0_8_;
  uStack_480 = auVar260._8_8_;
  local_168 = local_488;
  uStack_160 = uStack_480;
  local_178 = local_488;
  uStack_170 = uStack_480;
  auVar260 = packsswb(auVar260,auVar260);
  local_1a8 = local_2178;
  uStack_1a0 = uStack_2170;
  local_488 = auVar260._0_8_;
  uStack_480 = auVar260._8_8_;
  local_1b8 = local_488;
  uStack_1b0 = uStack_480;
  local_3e8 = ~local_2178 & local_488;
  uStack_3e0 = ~uStack_2170 & uStack_480;
  uStack_480 = uStack_3e0;
  local_488 = local_3e8;
  auVar260 = _local_488;
  uStack_490._4_4_ = auVar261._12_4_;
  uVar16 = uStack_490._4_4_;
  local_488._0_4_ = (undefined4)local_3e8;
  uStack_480._4_4_ = (undefined4)(uStack_3e0 >> 0x20);
  uStack_7c = uStack_490._4_4_;
  local_78 = CONCAT44(local_78._4_4_,(undefined4)local_488);
  uStack_8c = uStack_480._4_4_;
  _local_88 = CONCAT44(auVar261._4_4_,0x80808080);
  uStack_4d0 = uStack_80;
  uStack_4cc = uStack_490._4_4_;
  local_4c8._4_4_ = uStack_480._4_4_;
  local_4c8._0_4_ = uStack_90;
  local_3d8 = local_498;
  uStack_490 = local_3e8;
  local_2a8 = local_4c8._0_8_;
  local_2b8 = local_498;
  auVar116._8_8_ = uStack_2a0;
  auVar116._0_8_ = local_4c8._0_8_;
  auVar115._8_8_ = local_3e8;
  auVar115._0_8_ = local_498;
  local_4c8 = psubsb(auVar116,auVar115);
  uStack_1f0 = CONCAT44(uVar16,uStack_80);
  local_1f8 = local_4d8;
  auVar122._8_8_ = uStack_200;
  auVar122._0_8_ = local_208;
  auVar121._8_8_ = uStack_1f0;
  auVar121._0_8_ = local_4d8;
  local_4b8 = paddsb(auVar122,auVar121);
  local_308 = local_4c8._0_8_;
  uStack_300 = local_4c8._8_8_;
  uStack_21a0 = local_4c8._0_8_ ^ 0x8080808080808080;
  uStack_21dc = local_4c8._12_4_ ^ 0x80808080;
  local_21e8[0] = (undefined4)uStack_21a0;
  local_328 = local_4b8._0_8_;
  uStack_320 = local_4b8._8_8_;
  local_338 = 0x8080808080808080;
  uStack_330 = 0x8080808080808080;
  local_1fa8 = local_4b8._0_8_ ^ 0x8080808080808080;
  uStack_21ec = local_4b8._12_4_ ^ 0x80808080;
  uStack_50c = uStack_21ec;
  _local_508 = CONCAT44(uStack_504,local_21e8[0]);
  uStack_51c = uStack_21dc;
  _local_518 = CONCAT44((int)(local_1fa8 >> 0x20),local_21d8);
  uStack_21b0 = CONCAT44(local_4b8._12_4_,uStack_510) ^ 0x8080808000000000;
  local_21a8 = CONCAT44(local_4c8._12_4_,uStack_520) ^ 0x8080808000000000;
  b_02[1] = (longlong)puVar244;
  a_03[1] = (longlong)ppalVar246;
  a_03[0] = (longlong)puVar242;
  local_1d78 = uVar1;
  uStack_1d70 = uVar2;
  local_1d68 = uVar3;
  uStack_1d60 = uVar4;
  local_1c18 = uVar5;
  uStack_1c10 = uVar6;
  _local_488 = auVar260;
  local_418 = uVar20;
  local_3f8 = uVar21;
  local_3b8 = local_3c8;
  uStack_3b0 = uStack_3c0;
  local_398 = local_478;
  uStack_390 = uStack_470;
  local_388 = local_478;
  uStack_380 = uStack_470;
  local_318 = local_478;
  uStack_310 = uStack_470;
  local_2f8 = local_478;
  uStack_2f0 = uStack_470;
  local_2d8 = local_478;
  uStack_2d0 = uStack_470;
  uStack_2b0 = local_3e8;
  uStack_210 = uStack_2a0;
  local_1e8 = local_208;
  uStack_1e0 = uStack_200;
  local_1d8 = local_468;
  uStack_1d0 = uStack_460;
  local_1c8 = local_3c8;
  uStack_1c0 = local_3c8;
  uStack_180 = uVar22;
  local_138 = local_478;
  uStack_130 = uStack_470;
  local_118 = local_468;
  uStack_110 = uStack_460;
  local_98 = local_3e8;
  alVar333 = abs_diff(a_03,b_02);
  b_03[0] = alVar333[1];
  b_03[1] = (longlong)puVar244;
  a_04[1] = (longlong)ppalVar246;
  a_04[0] = (longlong)puVar242;
  alVar333 = abs_diff(a_04,b_03);
  puVar129 = local_2120;
  uVar302 = uStack_21a0;
  b_04[0] = alVar333[1];
  local_1c48 = (byte)extraout_XMM0_Qa_03;
  bStack_1c47 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_1c46 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_1c45 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_1c44 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_1c43 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_1c42 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_1c41 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_1c40 = (byte)extraout_XMM0_Qb_03;
  bStack_1c3f = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_1c3e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_1c3d = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_1c3c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_1c3b = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_1c3a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_1c39 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_1c58 = (byte)extraout_XMM0_Qa_04;
  bStack_1c57 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_1c56 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_1c55 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_1c54 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_1c53 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_1c52 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_1c51 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_1c50 = (byte)extraout_XMM0_Qb_04;
  bStack_1c4f = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_1c4e = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_1c4d = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_1c4c = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_1c4b = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_1c4a = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_1c49 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  bVar247 = (local_1c48 < local_1c58) * local_1c58 | (local_1c48 >= local_1c58) * local_1c48;
  bVar262 = (bStack_1c47 < bStack_1c57) * bStack_1c57 | (bStack_1c47 >= bStack_1c57) * bStack_1c47;
  bVar263 = (bStack_1c46 < bStack_1c56) * bStack_1c56 | (bStack_1c46 >= bStack_1c56) * bStack_1c46;
  bVar270 = (bStack_1c45 < bStack_1c55) * bStack_1c55 | (bStack_1c45 >= bStack_1c55) * bStack_1c45;
  bVar271 = (bStack_1c44 < bStack_1c54) * bStack_1c54 | (bStack_1c44 >= bStack_1c54) * bStack_1c44;
  bVar280 = (bStack_1c43 < bStack_1c53) * bStack_1c53 | (bStack_1c43 >= bStack_1c53) * bStack_1c43;
  bVar281 = (bStack_1c42 < bStack_1c52) * bStack_1c52 | (bStack_1c42 >= bStack_1c52) * bStack_1c42;
  bVar289 = (bStack_1c41 < bStack_1c51) * bStack_1c51 | (bStack_1c41 >= bStack_1c51) * bStack_1c41;
  bVar290 = (bStack_1c40 < bStack_1c50) * bStack_1c50 | (bStack_1c40 >= bStack_1c50) * bStack_1c40;
  bVar304 = (bStack_1c3f < bStack_1c4f) * bStack_1c4f | (bStack_1c3f >= bStack_1c4f) * bStack_1c3f;
  bVar305 = (bStack_1c3e < bStack_1c4e) * bStack_1c4e | (bStack_1c3e >= bStack_1c4e) * bStack_1c3e;
  bVar313 = (bStack_1c3d < bStack_1c4d) * bStack_1c4d | (bStack_1c3d >= bStack_1c4d) * bStack_1c3d;
  bVar314 = (bStack_1c3c < bStack_1c4c) * bStack_1c4c | (bStack_1c3c >= bStack_1c4c) * bStack_1c3c;
  bVar323 = (bStack_1c3b < bStack_1c4b) * bStack_1c4b | (bStack_1c3b >= bStack_1c4b) * bStack_1c3b;
  bVar324 = (bStack_1c3a < bStack_1c4a) * bStack_1c4a | (bStack_1c3a >= bStack_1c4a) * bStack_1c3a;
  bVar332 = (bStack_1c39 < bStack_1c49) * bStack_1c49 | (bStack_1c39 >= bStack_1c49) * bStack_1c39;
  local_2188._0_2_ = CONCAT11(bVar262,bVar247);
  local_2188._0_3_ = CONCAT12(bVar263,(undefined2)local_2188);
  local_2188._0_4_ = CONCAT13(bVar270,(undefined3)local_2188);
  local_2188._0_5_ = CONCAT14(bVar271,(undefined4)local_2188);
  local_2188._0_6_ = CONCAT15(bVar280,(undefined5)local_2188);
  local_2188._0_7_ = CONCAT16(bVar281,(undefined6)local_2188);
  local_2188 = CONCAT17(bVar289,(undefined7)local_2188);
  uStack_2180._0_1_ = bVar290;
  uStack_2180._1_1_ = bVar304;
  uStack_2180._2_1_ = bVar305;
  uStack_2180._3_1_ = bVar313;
  uStack_2180._4_1_ = bVar314;
  uStack_2180._5_1_ = bVar323;
  uStack_2180._6_1_ = bVar324;
  uStack_2180._7_1_ = bVar332;
  local_1c78 = local_2188;
  uStack_1c70 = uStack_2180;
  bVar247 = (local_1d08 < bVar247) * bVar247 | (local_1d08 >= bVar247) * local_1d08;
  bVar262 = (bStack_1d07 < bVar262) * bVar262 | (bStack_1d07 >= bVar262) * bStack_1d07;
  bVar263 = (bStack_1d06 < bVar263) * bVar263 | (bStack_1d06 >= bVar263) * bStack_1d06;
  bVar270 = (bStack_1d05 < bVar270) * bVar270 | (bStack_1d05 >= bVar270) * bStack_1d05;
  bVar271 = (bStack_1d04 < bVar271) * bVar271 | (bStack_1d04 >= bVar271) * bStack_1d04;
  bVar280 = (bStack_1d03 < bVar280) * bVar280 | (bStack_1d03 >= bVar280) * bStack_1d03;
  bVar281 = (bStack_1d02 < bVar281) * bVar281 | (bStack_1d02 >= bVar281) * bStack_1d02;
  bVar289 = (bStack_1d01 < bVar289) * bVar289 | (bStack_1d01 >= bVar289) * bStack_1d01;
  bVar290 = (bStack_1d00 < bVar290) * bVar290 | (bStack_1d00 >= bVar290) * bStack_1d00;
  bVar304 = (bStack_1cff < bVar304) * bVar304 | (bStack_1cff >= bVar304) * bStack_1cff;
  bVar305 = (bStack_1cfe < bVar305) * bVar305 | (bStack_1cfe >= bVar305) * bStack_1cfe;
  bVar313 = (bStack_1cfd < bVar313) * bVar313 | (bStack_1cfd >= bVar313) * bStack_1cfd;
  bVar314 = (bStack_1cfc < bVar314) * bVar314 | (bStack_1cfc >= bVar314) * bStack_1cfc;
  bVar323 = (bStack_1cfb < bVar323) * bVar323 | (bStack_1cfb >= bVar323) * bStack_1cfb;
  bVar324 = (bStack_1cfa < bVar324) * bVar324 | (bStack_1cfa >= bVar324) * bStack_1cfa;
  bVar332 = (bStack_1cf9 < bVar332) * bVar332 | (bStack_1cf9 >= bVar332) * bStack_1cf9;
  local_2188._0_2_ = CONCAT11(bVar262,bVar247);
  local_2188._0_3_ = CONCAT12(bVar263,(undefined2)local_2188);
  local_2188._0_4_ = CONCAT13(bVar270,(undefined3)local_2188);
  local_2188._0_5_ = CONCAT14(bVar271,(undefined4)local_2188);
  local_2188._0_6_ = CONCAT15(bVar280,(undefined5)local_2188);
  local_2188._0_7_ = CONCAT16(bVar281,(undefined6)local_2188);
  local_2188 = CONCAT17(bVar289,(undefined7)local_2188);
  uStack_2180._0_1_ = bVar290;
  uStack_2180._1_1_ = bVar304;
  uStack_2180._2_1_ = bVar305;
  uStack_2180._3_1_ = bVar313;
  uStack_2180._4_1_ = bVar314;
  uStack_2180._5_1_ = bVar323;
  uStack_2180._6_1_ = bVar324;
  uStack_2180._7_1_ = bVar332;
  local_1c88 = local_2188;
  uStack_1c80 = uStack_2180;
  local_1c98 = uStack_2180;
  uStack_1c90 = 0;
  local_2188._0_2_ =
       CONCAT11((bVar262 < bVar304) * bVar304 | (bVar262 >= bVar304) * bVar262,
                (bVar247 < bVar290) * bVar290 | (bVar247 >= bVar290) * bVar247);
  local_2188._0_3_ =
       CONCAT12((bVar263 < bVar305) * bVar305 | (bVar263 >= bVar305) * bVar263,
                (undefined2)local_2188);
  local_2188._0_4_ =
       CONCAT13((bVar270 < bVar313) * bVar313 | (bVar270 >= bVar313) * bVar270,
                (undefined3)local_2188);
  local_2188._0_5_ =
       CONCAT14((bVar271 < bVar314) * bVar314 | (bVar271 >= bVar314) * bVar271,
                (undefined4)local_2188);
  local_2188._0_6_ =
       CONCAT15((bVar280 < bVar323) * bVar323 | (bVar280 >= bVar323) * bVar280,
                (undefined5)local_2188);
  local_2188._0_7_ =
       CONCAT16((bVar281 < bVar324) * bVar324 | (bVar281 >= bVar324) * bVar281,
                (undefined6)local_2188);
  local_2188 = CONCAT17((bVar289 < bVar332) * bVar332 | (bVar289 >= bVar332) * bVar289,
                        (undefined7)local_2188);
  local_1748 = local_2188;
  uStack_1740 = uStack_2180;
  local_1758 = local_2158;
  uStack_1750 = uStack_2150;
  auVar110._8_8_ = uStack_2180;
  auVar110._0_8_ = local_2188;
  auVar109._8_8_ = uStack_2150;
  auVar109._0_8_ = local_2158;
  auVar260 = psubusb(auVar110,auVar109);
  local_2188 = auVar260._0_8_;
  uStack_2180 = auVar260._8_8_;
  local_1d88 = local_2188;
  uVar3 = local_1d88;
  uStack_1d80 = uStack_2180;
  uVar4 = uStack_1d80;
  local_1d98 = local_2148;
  uVar1 = local_1d98;
  uStack_1d90 = uStack_2140;
  uVar2 = uStack_1d90;
  local_1d88._0_1_ = auVar260[0];
  local_1d88._1_1_ = auVar260[1];
  local_1d88._2_1_ = auVar260[2];
  local_1d88._3_1_ = auVar260[3];
  local_1d88._4_1_ = auVar260[4];
  local_1d88._5_1_ = auVar260[5];
  local_1d88._6_1_ = auVar260[6];
  local_1d88._7_1_ = auVar260[7];
  uStack_1d80._0_1_ = auVar260[8];
  uStack_1d80._1_1_ = auVar260[9];
  uStack_1d80._2_1_ = auVar260[10];
  uStack_1d80._3_1_ = auVar260[0xb];
  uStack_1d80._4_1_ = auVar260[0xc];
  uStack_1d80._5_1_ = auVar260[0xd];
  uStack_1d80._6_1_ = auVar260[0xe];
  uStack_1d80._7_1_ = auVar260[0xf];
  local_1d98._0_1_ = (char)local_2148;
  cVar178 = (char)local_1d98;
  local_1d98._1_1_ = (char)((ulong)local_2148 >> 8);
  cVar179 = local_1d98._1_1_;
  local_1d98._2_1_ = (char)((ulong)local_2148 >> 0x10);
  cVar180 = local_1d98._2_1_;
  local_1d98._3_1_ = (char)((ulong)local_2148 >> 0x18);
  cVar181 = local_1d98._3_1_;
  local_1d98._4_1_ = (char)((ulong)local_2148 >> 0x20);
  cVar182 = local_1d98._4_1_;
  local_1d98._5_1_ = (char)((ulong)local_2148 >> 0x28);
  cVar183 = local_1d98._5_1_;
  local_1d98._6_1_ = (char)((ulong)local_2148 >> 0x30);
  cVar184 = local_1d98._6_1_;
  local_1d98._7_1_ = (char)((ulong)local_2148 >> 0x38);
  cVar185 = local_1d98._7_1_;
  uStack_1d90._0_1_ = (char)uStack_2140;
  cVar186 = (char)uStack_1d90;
  uStack_1d90._1_1_ = (char)((ulong)uStack_2140 >> 8);
  cVar187 = uStack_1d90._1_1_;
  uStack_1d90._2_1_ = (char)((ulong)uStack_2140 >> 0x10);
  cVar188 = uStack_1d90._2_1_;
  uStack_1d90._3_1_ = (char)((ulong)uStack_2140 >> 0x18);
  cVar189 = uStack_1d90._3_1_;
  uStack_1d90._4_1_ = (char)((ulong)uStack_2140 >> 0x20);
  cVar190 = uStack_1d90._4_1_;
  uStack_1d90._5_1_ = (char)((ulong)uStack_2140 >> 0x28);
  cVar191 = uStack_1d90._5_1_;
  uStack_1d90._6_1_ = (char)((ulong)uStack_2140 >> 0x30);
  cVar192 = uStack_1d90._6_1_;
  uStack_1d90._7_1_ = (char)((ulong)uStack_2140 >> 0x38);
  cVar193 = uStack_1d90._7_1_;
  local_2188._0_2_ =
       CONCAT11(-(local_1d88._1_1_ == local_1d98._1_1_),-((char)local_1d88 == (char)local_1d98));
  local_2188._0_3_ = CONCAT12(-(local_1d88._2_1_ == local_1d98._2_1_),(undefined2)local_2188);
  local_2188._0_4_ = CONCAT13(-(local_1d88._3_1_ == local_1d98._3_1_),(undefined3)local_2188);
  local_2188._0_5_ = CONCAT14(-(local_1d88._4_1_ == local_1d98._4_1_),(undefined4)local_2188);
  local_2188._0_6_ = CONCAT15(-(local_1d88._5_1_ == local_1d98._5_1_),(undefined5)local_2188);
  local_2188._0_7_ = CONCAT16(-(local_1d88._6_1_ == local_1d98._6_1_),(undefined6)local_2188);
  local_2188 = CONCAT17(-(local_1d88._7_1_ == local_1d98._7_1_),(undefined7)local_2188);
  uStack_2180._0_1_ = -((char)uStack_1d80 == (char)uStack_1d90);
  uStack_2180._1_1_ = -(uStack_1d80._1_1_ == uStack_1d90._1_1_);
  uStack_2180._2_1_ = -(uStack_1d80._2_1_ == uStack_1d90._2_1_);
  uStack_2180._3_1_ = -(uStack_1d80._3_1_ == uStack_1d90._3_1_);
  uStack_2180._4_1_ = -(uStack_1d80._4_1_ == uStack_1d90._4_1_);
  uStack_2180._5_1_ = -(uStack_1d80._5_1_ == uStack_1d90._5_1_);
  uStack_2180._6_1_ = -(uStack_1d80._6_1_ == uStack_1d90._6_1_);
  uStack_2180._7_1_ = -(uStack_1d80._7_1_ == uStack_1d90._7_1_);
  local_17a8 = local_2188;
  uStack_17a0 = uStack_2180;
  local_17b8 = local_2168;
  uStack_17b0 = uStack_2160;
  local_2188 = local_2188 & local_2168;
  uStack_2180 = uStack_2180 & uStack_2160;
  local_1db8 = local_2148;
  uStack_1db0 = uStack_2140;
  local_1da8._0_1_ = (char)local_2188;
  local_1da8._1_1_ = (char)(local_2188 >> 8);
  local_1da8._2_1_ = (char)(local_2188 >> 0x10);
  local_1da8._3_1_ = (char)(local_2188 >> 0x18);
  local_1da8._4_1_ = (char)(local_2188 >> 0x20);
  local_1da8._5_1_ = (char)(local_2188 >> 0x28);
  local_1da8._6_1_ = (char)(local_2188 >> 0x30);
  local_1da8._7_1_ = (char)(local_2188 >> 0x38);
  uStack_1da0._0_1_ = (char)uStack_2180;
  uStack_1da0._1_1_ = (char)(uStack_2180 >> 8);
  uStack_1da0._2_1_ = (char)(uStack_2180 >> 0x10);
  uStack_1da0._3_1_ = (char)(uStack_2180 >> 0x18);
  uStack_1da0._4_1_ = (char)(uStack_2180 >> 0x20);
  uStack_1da0._5_1_ = (char)(uStack_2180 >> 0x28);
  uStack_1da0._6_1_ = (char)(uStack_2180 >> 0x30);
  uStack_1da0._7_1_ = (char)(uStack_2180 >> 0x38);
  local_1688 = -((char)local_1da8 == (char)local_1d98);
  cStack_1687 = -(local_1da8._1_1_ == local_1d98._1_1_);
  cStack_1686 = -(local_1da8._2_1_ == local_1d98._2_1_);
  cStack_1685 = -(local_1da8._3_1_ == local_1d98._3_1_);
  cStack_1684 = -(local_1da8._4_1_ == local_1d98._4_1_);
  cStack_1683 = -(local_1da8._5_1_ == local_1d98._5_1_);
  cStack_1682 = -(local_1da8._6_1_ == local_1d98._6_1_);
  cStack_1681 = -(local_1da8._7_1_ == local_1d98._7_1_);
  cStack_1680 = -((char)uStack_1da0 == (char)uStack_1d90);
  cStack_167f = -(uStack_1da0._1_1_ == uStack_1d90._1_1_);
  cStack_167e = -(uStack_1da0._2_1_ == uStack_1d90._2_1_);
  cStack_167d = -(uStack_1da0._3_1_ == uStack_1d90._3_1_);
  cStack_167c = -(uStack_1da0._4_1_ == uStack_1d90._4_1_);
  cStack_167b = -(uStack_1da0._5_1_ == uStack_1d90._5_1_);
  cStack_167a = -(uStack_1da0._6_1_ == uStack_1d90._6_1_);
  bStack_1679 = -(uStack_1da0._7_1_ == uStack_1d90._7_1_);
  auVar114[1] = cStack_1687;
  auVar114[0] = local_1688;
  auVar114[2] = cStack_1686;
  auVar114[3] = cStack_1685;
  auVar114[4] = cStack_1684;
  auVar114[5] = cStack_1683;
  auVar114[6] = cStack_1682;
  auVar114[7] = cStack_1681;
  auVar114[8] = cStack_1680;
  auVar114[9] = cStack_167f;
  auVar114[10] = cStack_167e;
  auVar114[0xb] = cStack_167d;
  auVar114[0xc] = cStack_167c;
  auVar114[0xd] = cStack_167b;
  auVar114[0xe] = cStack_167a;
  auVar114[0xf] = bStack_1679;
  uVar256 = (ushort)(SUB161(auVar114 >> 7,0) & 1) | (ushort)(SUB161(auVar114 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar114 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar114 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar114 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar114 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar114 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar114 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar114 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar114 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar114 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar114 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar114 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar114 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar114 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_1679 >> 7) << 0xf;
  local_1da8 = local_2188;
  uStack_1da0 = uStack_2180;
  local_1d98 = uVar1;
  uStack_1d90 = uVar2;
  local_1d88 = uVar3;
  uStack_1d80 = uVar4;
  if (uVar256 == 0xffff) {
    *local_2120 = local_21a8;
    puVar129[1] = uVar302;
    puVar129 = local_2118;
    uVar302 = uStack_21b0;
    *local_2118 = local_21b8;
    puVar129[1] = uVar302;
  }
  else {
    local_142a = 8;
    local_5a = 8;
    local_5c = 8;
    local_5e = 8;
    local_60 = 8;
    local_62 = 8;
    local_64 = 8;
    local_66 = 8;
    local_68 = 8;
    local_9b8 = 0x8000800080008;
    uStack_9b0 = 0x8000800080008;
    local_142c = 4;
    local_32 = 4;
    local_34 = 4;
    local_36 = 4;
    local_38 = 4;
    local_3a = 4;
    local_3c = 4;
    local_3e = 4;
    local_40 = 4;
    local_9f8 = 0x4000400040004;
    uStack_9f0 = 0x4000400040004;
    palVar303 = *local_20f0;
    palStack_2000 = local_20f0[1];
    local_2018 = local_2148;
    uStack_2010 = uStack_2140;
    local_2008._0_1_ = SUB81(palVar303,0);
    uVar170 = (undefined1)local_2008;
    local_2008._1_1_ = (undefined1)((ulong)palVar303 >> 8);
    uVar171 = local_2008._1_1_;
    local_2008._2_1_ = (undefined1)((ulong)palVar303 >> 0x10);
    uVar172 = local_2008._2_1_;
    local_2008._3_1_ = (undefined1)((ulong)palVar303 >> 0x18);
    uVar173 = local_2008._3_1_;
    local_2008._4_1_ = (undefined1)((ulong)palVar303 >> 0x20);
    uVar174 = local_2008._4_1_;
    local_2008._5_1_ = (undefined1)((ulong)palVar303 >> 0x28);
    uVar175 = local_2008._5_1_;
    local_2008._6_1_ = (undefined1)((ulong)palVar303 >> 0x30);
    uVar176 = local_2008._6_1_;
    local_2008._7_1_ = (undefined1)((ulong)palVar303 >> 0x38);
    uVar177 = local_2008._7_1_;
    palVar7 = *local_20f8;
    palStack_2020 = local_20f8[1];
    local_2038 = local_2148;
    uStack_2030 = uStack_2140;
    local_2028._0_1_ = SUB81(palVar7,0);
    uVar162 = (undefined1)local_2028;
    local_2028._1_1_ = (undefined1)((ulong)palVar7 >> 8);
    uVar163 = local_2028._1_1_;
    local_2028._2_1_ = (undefined1)((ulong)palVar7 >> 0x10);
    uVar164 = local_2028._2_1_;
    local_2028._3_1_ = (undefined1)((ulong)palVar7 >> 0x18);
    uVar165 = local_2028._3_1_;
    local_2028._4_1_ = (undefined1)((ulong)palVar7 >> 0x20);
    uVar166 = local_2028._4_1_;
    local_2028._5_1_ = (undefined1)((ulong)palVar7 >> 0x28);
    uVar167 = local_2028._5_1_;
    local_2028._6_1_ = (undefined1)((ulong)palVar7 >> 0x30);
    uVar168 = local_2028._6_1_;
    local_2028._7_1_ = (undefined1)((ulong)palVar7 >> 0x38);
    uVar169 = local_2028._7_1_;
    palVar8 = *local_2100;
    palStack_2040 = local_2100[1];
    local_2058 = local_2148;
    uStack_2050 = uStack_2140;
    local_2048._0_1_ = SUB81(palVar8,0);
    uVar154 = (undefined1)local_2048;
    local_2048._1_1_ = (undefined1)((ulong)palVar8 >> 8);
    uVar155 = local_2048._1_1_;
    local_2048._2_1_ = (undefined1)((ulong)palVar8 >> 0x10);
    uVar156 = local_2048._2_1_;
    local_2048._3_1_ = (undefined1)((ulong)palVar8 >> 0x18);
    uVar157 = local_2048._3_1_;
    local_2048._4_1_ = (undefined1)((ulong)palVar8 >> 0x20);
    uVar158 = local_2048._4_1_;
    local_2048._5_1_ = (undefined1)((ulong)palVar8 >> 0x28);
    uVar159 = local_2048._5_1_;
    local_2048._6_1_ = (undefined1)((ulong)palVar8 >> 0x30);
    uVar160 = local_2048._6_1_;
    local_2048._7_1_ = (undefined1)((ulong)palVar8 >> 0x38);
    uVar161 = local_2048._7_1_;
    uVar302 = *local_2108;
    uStack_2060 = local_2108[1];
    local_2078 = local_2148;
    uStack_2070 = uStack_2140;
    local_2068._0_1_ = (undefined1)uVar302;
    uVar146 = (undefined1)local_2068;
    local_2068._1_1_ = (undefined1)(uVar302 >> 8);
    uVar147 = local_2068._1_1_;
    local_2068._2_1_ = (undefined1)(uVar302 >> 0x10);
    uVar148 = local_2068._2_1_;
    local_2068._3_1_ = (undefined1)(uVar302 >> 0x18);
    uVar149 = local_2068._3_1_;
    local_2068._4_1_ = (undefined1)(uVar302 >> 0x20);
    uVar150 = local_2068._4_1_;
    local_2068._5_1_ = (undefined1)(uVar302 >> 0x28);
    uVar151 = local_2068._5_1_;
    local_2068._6_1_ = (undefined1)(uVar302 >> 0x30);
    uVar152 = local_2068._6_1_;
    local_2068._7_1_ = (undefined1)(uVar302 >> 0x38);
    uVar153 = local_2068._7_1_;
    uVar258 = *local_2110;
    uStack_2080 = local_2110[1];
    local_2098 = local_2148;
    uStack_2090 = uStack_2140;
    local_2088._0_1_ = (undefined1)uVar258;
    uVar138 = (undefined1)local_2088;
    local_2088._1_1_ = (undefined1)(uVar258 >> 8);
    uVar139 = local_2088._1_1_;
    local_2088._2_1_ = (undefined1)(uVar258 >> 0x10);
    uVar140 = local_2088._2_1_;
    local_2088._3_1_ = (undefined1)(uVar258 >> 0x18);
    uVar141 = local_2088._3_1_;
    local_2088._4_1_ = (undefined1)(uVar258 >> 0x20);
    uVar142 = local_2088._4_1_;
    local_2088._5_1_ = (undefined1)(uVar258 >> 0x28);
    uVar143 = local_2088._5_1_;
    local_2088._6_1_ = (undefined1)(uVar258 >> 0x30);
    uVar144 = local_2088._6_1_;
    local_2088._7_1_ = (undefined1)(uVar258 >> 0x38);
    uVar145 = local_2088._7_1_;
    uVar259 = *local_2118;
    uStack_20a0 = local_2118[1];
    local_20b8 = local_2148;
    uStack_20b0 = uStack_2140;
    local_20a8._0_1_ = (undefined1)uVar259;
    uVar130 = (undefined1)local_20a8;
    local_20a8._1_1_ = (undefined1)(uVar259 >> 8);
    uVar131 = local_20a8._1_1_;
    local_20a8._2_1_ = (undefined1)(uVar259 >> 0x10);
    uVar132 = local_20a8._2_1_;
    local_20a8._3_1_ = (undefined1)(uVar259 >> 0x18);
    uVar133 = local_20a8._3_1_;
    local_20a8._4_1_ = (undefined1)(uVar259 >> 0x20);
    uVar134 = local_20a8._4_1_;
    local_20a8._5_1_ = (undefined1)(uVar259 >> 0x28);
    uVar135 = local_20a8._5_1_;
    local_20a8._6_1_ = (undefined1)(uVar259 >> 0x30);
    uVar136 = local_20a8._6_1_;
    local_20a8._7_1_ = (undefined1)(uVar259 >> 0x38);
    uVar137 = local_20a8._7_1_;
    uVar301 = *local_2120;
    uStack_20c0 = local_2120[1];
    local_20d8 = local_2148;
    uStack_20d0 = uStack_2140;
    local_20c8._0_1_ = (undefined1)uVar301;
    local_20c8._1_1_ = (undefined1)(uVar301 >> 8);
    local_20c8._2_1_ = (undefined1)(uVar301 >> 0x10);
    local_20c8._3_1_ = (undefined1)(uVar301 >> 0x18);
    local_20c8._4_1_ = (undefined1)(uVar301 >> 0x20);
    local_20c8._5_1_ = (undefined1)(uVar301 >> 0x28);
    local_20c8._6_1_ = (undefined1)(uVar301 >> 0x30);
    local_20c8._7_1_ = (undefined1)(uVar301 >> 0x38);
    local_1358 = *local_2120;
    uVar9 = local_2120[1];
    local_1368 = local_2148;
    uStack_1360 = uStack_2140;
    uStack_1350._0_1_ = (undefined1)uVar9;
    uStack_1350._1_1_ = (undefined1)(uVar9 >> 8);
    uStack_1350._2_1_ = (undefined1)(uVar9 >> 0x10);
    uStack_1350._3_1_ = (undefined1)(uVar9 >> 0x18);
    uStack_1350._4_1_ = (undefined1)(uVar9 >> 0x20);
    uStack_1350._5_1_ = (undefined1)(uVar9 >> 0x28);
    uStack_1350._6_1_ = (undefined1)(uVar9 >> 0x30);
    uStack_1350._7_1_ = (undefined1)(uVar9 >> 0x38);
    local_1378 = *local_2118;
    uVar10 = local_2118[1];
    local_1388 = local_2148;
    uStack_1380 = uStack_2140;
    uStack_1370._0_1_ = (undefined1)uVar10;
    uVar234 = (undefined1)uStack_1370;
    uStack_1370._1_1_ = (undefined1)(uVar10 >> 8);
    uVar235 = uStack_1370._1_1_;
    uStack_1370._2_1_ = (undefined1)(uVar10 >> 0x10);
    uVar236 = uStack_1370._2_1_;
    uStack_1370._3_1_ = (undefined1)(uVar10 >> 0x18);
    uVar237 = uStack_1370._3_1_;
    uStack_1370._4_1_ = (undefined1)(uVar10 >> 0x20);
    uVar238 = uStack_1370._4_1_;
    uStack_1370._5_1_ = (undefined1)(uVar10 >> 0x28);
    uVar239 = uStack_1370._5_1_;
    uStack_1370._6_1_ = (undefined1)(uVar10 >> 0x30);
    uVar240 = uStack_1370._6_1_;
    uStack_1370._7_1_ = (undefined1)(uVar10 >> 0x38);
    uVar241 = uStack_1370._7_1_;
    local_1398 = *local_2110;
    uVar11 = local_2110[1];
    local_13a8 = local_2148;
    uStack_13a0 = uStack_2140;
    uStack_1390._0_1_ = (undefined1)uVar11;
    uVar226 = (undefined1)uStack_1390;
    uStack_1390._1_1_ = (undefined1)(uVar11 >> 8);
    uVar227 = uStack_1390._1_1_;
    uStack_1390._2_1_ = (undefined1)(uVar11 >> 0x10);
    uVar228 = uStack_1390._2_1_;
    uStack_1390._3_1_ = (undefined1)(uVar11 >> 0x18);
    uVar229 = uStack_1390._3_1_;
    uStack_1390._4_1_ = (undefined1)(uVar11 >> 0x20);
    uVar230 = uStack_1390._4_1_;
    uStack_1390._5_1_ = (undefined1)(uVar11 >> 0x28);
    uVar231 = uStack_1390._5_1_;
    uStack_1390._6_1_ = (undefined1)(uVar11 >> 0x30);
    uVar232 = uStack_1390._6_1_;
    uStack_1390._7_1_ = (undefined1)(uVar11 >> 0x38);
    uVar233 = uStack_1390._7_1_;
    local_13b8 = *local_2108;
    uVar12 = local_2108[1];
    local_13c8 = local_2148;
    uStack_13c0 = uStack_2140;
    uStack_13b0._0_1_ = (undefined1)uVar12;
    uVar218 = (undefined1)uStack_13b0;
    uStack_13b0._1_1_ = (undefined1)(uVar12 >> 8);
    uVar219 = uStack_13b0._1_1_;
    uStack_13b0._2_1_ = (undefined1)(uVar12 >> 0x10);
    uVar220 = uStack_13b0._2_1_;
    uStack_13b0._3_1_ = (undefined1)(uVar12 >> 0x18);
    uVar221 = uStack_13b0._3_1_;
    uStack_13b0._4_1_ = (undefined1)(uVar12 >> 0x20);
    uVar222 = uStack_13b0._4_1_;
    uStack_13b0._5_1_ = (undefined1)(uVar12 >> 0x28);
    uVar223 = uStack_13b0._5_1_;
    uStack_13b0._6_1_ = (undefined1)(uVar12 >> 0x30);
    uVar224 = uStack_13b0._6_1_;
    uStack_13b0._7_1_ = (undefined1)(uVar12 >> 0x38);
    uVar225 = uStack_13b0._7_1_;
    local_13d8 = *local_2100;
    palVar13 = local_2100[1];
    local_13e8 = local_2148;
    uStack_13e0 = uStack_2140;
    uStack_13d0._0_1_ = SUB81(palVar13,0);
    uVar210 = (undefined1)uStack_13d0;
    uStack_13d0._1_1_ = (undefined1)((ulong)palVar13 >> 8);
    uVar211 = uStack_13d0._1_1_;
    uStack_13d0._2_1_ = (undefined1)((ulong)palVar13 >> 0x10);
    uVar212 = uStack_13d0._2_1_;
    uStack_13d0._3_1_ = (undefined1)((ulong)palVar13 >> 0x18);
    uVar213 = uStack_13d0._3_1_;
    uStack_13d0._4_1_ = (undefined1)((ulong)palVar13 >> 0x20);
    uVar214 = uStack_13d0._4_1_;
    uStack_13d0._5_1_ = (undefined1)((ulong)palVar13 >> 0x28);
    uVar215 = uStack_13d0._5_1_;
    uStack_13d0._6_1_ = (undefined1)((ulong)palVar13 >> 0x30);
    uVar216 = uStack_13d0._6_1_;
    uStack_13d0._7_1_ = (undefined1)((ulong)palVar13 >> 0x38);
    uVar217 = uStack_13d0._7_1_;
    local_13f8 = *local_20f8;
    palVar14 = local_20f8[1];
    local_1408 = local_2148;
    uStack_1400 = uStack_2140;
    uStack_13f0._0_1_ = SUB81(palVar14,0);
    uVar202 = (undefined1)uStack_13f0;
    uStack_13f0._1_1_ = (undefined1)((ulong)palVar14 >> 8);
    uVar203 = uStack_13f0._1_1_;
    uStack_13f0._2_1_ = (undefined1)((ulong)palVar14 >> 0x10);
    uVar204 = uStack_13f0._2_1_;
    uStack_13f0._3_1_ = (undefined1)((ulong)palVar14 >> 0x18);
    uVar205 = uStack_13f0._3_1_;
    uStack_13f0._4_1_ = (undefined1)((ulong)palVar14 >> 0x20);
    uVar206 = uStack_13f0._4_1_;
    uStack_13f0._5_1_ = (undefined1)((ulong)palVar14 >> 0x28);
    uVar207 = uStack_13f0._5_1_;
    uStack_13f0._6_1_ = (undefined1)((ulong)palVar14 >> 0x30);
    uVar208 = uStack_13f0._6_1_;
    uStack_13f0._7_1_ = (undefined1)((ulong)palVar14 >> 0x38);
    uVar209 = uStack_13f0._7_1_;
    local_1418 = *local_20f0;
    palVar15 = local_20f0[1];
    local_1428 = local_2148;
    uStack_1420 = uStack_2140;
    uStack_1410._0_1_ = SUB81(palVar15,0);
    uVar194 = (undefined1)uStack_1410;
    uStack_1410._1_1_ = (undefined1)((ulong)palVar15 >> 8);
    uVar195 = uStack_1410._1_1_;
    uStack_1410._2_1_ = (undefined1)((ulong)palVar15 >> 0x10);
    uVar196 = uStack_1410._2_1_;
    uStack_1410._3_1_ = (undefined1)((ulong)palVar15 >> 0x18);
    uVar197 = uStack_1410._3_1_;
    uStack_1410._4_1_ = (undefined1)((ulong)palVar15 >> 0x20);
    uVar198 = uStack_1410._4_1_;
    uStack_1410._5_1_ = (undefined1)((ulong)palVar15 >> 0x28);
    uVar199 = uStack_1410._5_1_;
    uStack_1410._6_1_ = (undefined1)((ulong)palVar15 >> 0x30);
    uVar200 = uStack_1410._6_1_;
    uStack_1410._7_1_ = (undefined1)((ulong)palVar15 >> 0x38);
    uVar201 = uStack_1410._7_1_;
    uVar39 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2028._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2028)));
    uVar40 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2028._2_1_,uVar39));
    uVar100 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2028._3_1_,uVar40));
    uVar45 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2028._5_1_,CONCAT11(local_1d98._4_1_,local_2028._4_1_)));
    uVar46 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2028._6_1_,uVar45));
    uVar102 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2028._7_1_,uVar46));
    uVar25 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2048._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2048)));
    uVar26 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2048._2_1_,uVar25));
    uVar98 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2048._3_1_,uVar26));
    uVar32 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2048._5_1_,CONCAT11(local_1d98._4_1_,local_2048._4_1_)));
    uVar33 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2048._6_1_,uVar32));
    uVar99 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2048._7_1_,uVar33));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2068._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2068)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2068._2_1_,uVar16));
    uVar92 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2068._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2068._5_1_,CONCAT11(local_1d98._4_1_,local_2068._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2068._6_1_,uVar18));
    uVar95 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2068._7_1_,uVar19));
    local_858._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_858._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_858._6_2_ = (short)((ulong)uVar98 >> 0x30);
    uStack_850._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_850._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_850._6_2_ = (short)((ulong)uVar99 >> 0x30);
    local_868._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_868._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_868._6_2_ = (short)((ulong)uVar92 >> 0x30);
    uStack_860._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_860._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_860._6_2_ = (short)((ulong)uVar95 >> 0x30);
    local_888 = CONCAT11((char)local_1d98,(undefined1)local_2048) +
                CONCAT11((char)local_1d98,(undefined1)local_2068);
    sStack_886 = local_858._2_2_ + local_868._2_2_;
    sStack_884 = local_858._4_2_ + local_868._4_2_;
    sStack_882 = local_858._6_2_ + local_868._6_2_;
    sStack_880 = CONCAT11(local_1d98._4_1_,local_2048._4_1_) +
                 CONCAT11(local_1d98._4_1_,local_2068._4_1_);
    sStack_87e = uStack_850._2_2_ + uStack_860._2_2_;
    sStack_87c = uStack_850._4_2_ + uStack_860._4_2_;
    sStack_87a = uStack_850._6_2_ + uStack_860._6_2_;
    local_878._2_2_ = (short)((uint)uVar39 >> 0x10);
    local_878._4_2_ = (short)((uint6)uVar40 >> 0x20);
    local_878._6_2_ = (short)((ulong)uVar100 >> 0x30);
    uStack_870._2_2_ = (short)((uint)uVar45 >> 0x10);
    uStack_870._4_2_ = (short)((uint6)uVar46 >> 0x20);
    uStack_870._6_2_ = (short)((ulong)uVar102 >> 0x30);
    local_9c8 = CONCAT11((char)local_1d98,(undefined1)local_2028) + local_888;
    sStack_9c0 = CONCAT11(local_1d98._4_1_,local_2028._4_1_) + sStack_880;
    uVar39 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_13f0._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_13f0)
                              ));
    uVar40 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_13f0._2_1_,uVar39));
    uVar58 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_13f0._3_1_,uVar40));
    uVar45 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_13f0._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_13f0._4_1_)));
    uVar46 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_13f0._6_1_,uVar45));
    uVar60 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_13f0._7_1_,uVar46));
    uVar25 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_13d0._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_13d0)
                              ));
    uVar26 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_13d0._2_1_,uVar25));
    uVar56 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_13d0._3_1_,uVar26));
    uVar32 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_13d0._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_13d0._4_1_)));
    uVar33 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_13d0._6_1_,uVar32));
    uVar57 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_13d0._7_1_,uVar33));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_13b0._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_13b0._2_1_,uVar16));
    uVar50 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_13b0._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_13b0._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_13b0._6_1_,uVar18));
    uVar53 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_13b0._7_1_,uVar19));
    local_898._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_898._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_898._6_2_ = (short)((ulong)uVar56 >> 0x30);
    uStack_890._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_890._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_890._6_2_ = (short)((ulong)uVar57 >> 0x30);
    local_8a8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_8a8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_8a8._6_2_ = (short)((ulong)uVar50 >> 0x30);
    uStack_8a0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_8a0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_8a0._6_2_ = (short)((ulong)uVar53 >> 0x30);
    local_8c8 = CONCAT11((char)uStack_1d90,(undefined1)uStack_13d0) +
                CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0);
    sStack_8c6 = local_898._2_2_ + local_8a8._2_2_;
    sStack_8c4 = local_898._4_2_ + local_8a8._4_2_;
    sStack_8c2 = local_898._6_2_ + local_8a8._6_2_;
    sStack_8c0 = CONCAT11(uStack_1d90._4_1_,uStack_13d0._4_1_) +
                 CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_);
    sStack_8be = uStack_890._2_2_ + uStack_8a0._2_2_;
    sStack_8bc = uStack_890._4_2_ + uStack_8a0._4_2_;
    sStack_8ba = uStack_890._6_2_ + uStack_8a0._6_2_;
    local_8b8._2_2_ = (short)((uint)uVar39 >> 0x10);
    local_8b8._4_2_ = (short)((uint6)uVar40 >> 0x20);
    local_8b8._6_2_ = (short)((ulong)uVar58 >> 0x30);
    uStack_8b0._2_2_ = (short)((uint)uVar45 >> 0x10);
    uStack_8b0._4_2_ = (short)((uint6)uVar46 >> 0x20);
    uStack_8b0._6_2_ = (short)((ulong)uVar60 >> 0x30);
    sVar248 = CONCAT11((char)uStack_1d90,(undefined1)uStack_13f0) + local_8c8;
    sVar291 = CONCAT11(uStack_1d90._4_1_,uStack_13f0._4_1_) + sStack_8c0;
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20c8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20c8)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20c8._2_1_,uVar16));
    uVar64 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20c8._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20c8._5_1_,CONCAT11(local_1d98._4_1_,local_20c8._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20c8._6_1_,uVar18));
    uVar69 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20c8._7_1_,uVar19));
    uVar39 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2088._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2088)));
    uVar40 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2088._2_1_,uVar39));
    uVar84 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2088._3_1_,uVar40));
    uVar45 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2088._5_1_,CONCAT11(local_1d98._4_1_,local_2088._4_1_)));
    uVar46 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2088._6_1_,uVar45));
    uVar88 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2088._7_1_,uVar46));
    uVar25 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20a8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20a8)));
    uVar26 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20a8._2_1_,uVar25));
    uVar74 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20a8._3_1_,uVar26));
    uVar32 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20a8._5_1_,CONCAT11(local_1d98._4_1_,local_20a8._4_1_)));
    uVar33 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20a8._6_1_,uVar32));
    uVar79 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20a8._7_1_,uVar33));
    local_8d8._2_2_ = (short)((uint)uVar39 >> 0x10);
    local_8d8._4_2_ = (short)((uint6)uVar40 >> 0x20);
    local_8d8._6_2_ = (short)((ulong)uVar84 >> 0x30);
    uStack_8d0._2_2_ = (short)((uint)uVar45 >> 0x10);
    uStack_8d0._4_2_ = (short)((uint6)uVar46 >> 0x20);
    uStack_8d0._6_2_ = (short)((ulong)uVar88 >> 0x30);
    local_8e8._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_8e8._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_8e8._6_2_ = (short)((ulong)uVar74 >> 0x30);
    uStack_8e0._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_8e0._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_8e0._6_2_ = (short)((ulong)uVar79 >> 0x30);
    local_908 = CONCAT11((char)local_1d98,(undefined1)local_2088) +
                CONCAT11((char)local_1d98,(undefined1)local_20a8);
    sStack_906 = local_8d8._2_2_ + local_8e8._2_2_;
    sStack_904 = local_8d8._4_2_ + local_8e8._4_2_;
    sStack_902 = local_8d8._6_2_ + local_8e8._6_2_;
    sStack_900 = CONCAT11(local_1d98._4_1_,local_2088._4_1_) +
                 CONCAT11(local_1d98._4_1_,local_20a8._4_1_);
    sStack_8fe = uStack_8d0._2_2_ + uStack_8e0._2_2_;
    sStack_8fc = uStack_8d0._4_2_ + uStack_8e0._4_2_;
    sStack_8fa = uStack_8d0._6_2_ + uStack_8e0._6_2_;
    local_8f8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_8f8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_8f8._6_2_ = (short)((ulong)uVar64 >> 0x30);
    uStack_8f0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_8f0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_8f0._6_2_ = (short)((ulong)uVar69 >> 0x30);
    local_a08 = CONCAT11((char)local_1d98,(undefined1)local_20c8) + local_908;
    local_8f8._2_2_ = local_8f8._2_2_ + sStack_906;
    local_8f8._4_2_ = local_8f8._4_2_ + sStack_904;
    local_8f8._6_2_ = local_8f8._6_2_ + sStack_902;
    sStack_a00 = CONCAT11(local_1d98._4_1_,local_20c8._4_1_) + sStack_900;
    uStack_8f0._2_2_ = uStack_8f0._2_2_ + sStack_8fe;
    uStack_8f0._4_2_ = uStack_8f0._4_2_ + sStack_8fc;
    uStack_8f0._6_2_ = uStack_8f0._6_2_ + sStack_8fa;
    local_918 = CONCAT26(local_878._6_2_ + sStack_882,
                         CONCAT24(local_878._4_2_ + sStack_884,
                                  CONCAT22(local_878._2_2_ + sStack_886,local_9c8)));
    uStack_910 = CONCAT26(uStack_870._6_2_ + sStack_87a,
                          CONCAT24(uStack_870._4_2_ + sStack_87c,
                                   CONCAT22(uStack_870._2_2_ + sStack_87e,sStack_9c0)));
    local_928 = CONCAT26(local_8f8._6_2_,
                         CONCAT24(local_8f8._4_2_,CONCAT22(local_8f8._2_2_,local_a08)));
    uStack_920 = CONCAT26(uStack_8f0._6_2_,
                          CONCAT24(uStack_8f0._4_2_,CONCAT22(uStack_8f0._2_2_,sStack_a00)));
    local_9c8 = local_9c8 + local_a08;
    sStack_9c6 = local_878._2_2_ + sStack_886 + local_8f8._2_2_;
    sStack_9c4 = local_878._4_2_ + sStack_884 + local_8f8._4_2_;
    sStack_9c2 = local_878._6_2_ + sStack_882 + local_8f8._6_2_;
    sStack_9c0 = sStack_9c0 + sStack_a00;
    sStack_9be = uStack_870._2_2_ + sStack_87e + uStack_8f0._2_2_;
    sStack_9bc = uStack_870._4_2_ + sStack_87c + uStack_8f0._4_2_;
    sStack_9ba = uStack_870._6_2_ + sStack_87a + uStack_8f0._6_2_;
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1350._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1350)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1350._2_1_,uVar16));
    uVar1 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1350._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1350._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1350._6_1_,uVar18));
    uVar6 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1350._7_1_,uVar19));
    uVar39 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1390._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1390)
                              ));
    uVar40 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1390._2_1_,uVar39));
    uVar38 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1390._3_1_,uVar40));
    uVar45 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1390._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_)));
    uVar46 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1390._6_1_,uVar45));
    uVar44 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1390._7_1_,uVar46));
    uVar25 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1370._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1370)
                              ));
    uVar26 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1370._2_1_,uVar25));
    uVar24 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1370._3_1_,uVar26));
    uVar32 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1370._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_)));
    uVar33 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1370._6_1_,uVar32));
    uVar31 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1370._7_1_,uVar33));
    local_938._2_2_ = (short)((uint)uVar39 >> 0x10);
    local_938._4_2_ = (short)((uint6)uVar40 >> 0x20);
    local_938._6_2_ = (short)((ulong)uVar38 >> 0x30);
    uStack_930._2_2_ = (short)((uint)uVar45 >> 0x10);
    uStack_930._4_2_ = (short)((uint6)uVar46 >> 0x20);
    uStack_930._6_2_ = (short)((ulong)uVar44 >> 0x30);
    local_948._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_948._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_948._6_2_ = (short)((ulong)uVar24 >> 0x30);
    uStack_940._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_940._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_940._6_2_ = (short)((ulong)uVar31 >> 0x30);
    local_968 = CONCAT11((char)uStack_1d90,(undefined1)uStack_1390) +
                CONCAT11((char)uStack_1d90,(undefined1)uStack_1370);
    sStack_966 = local_938._2_2_ + local_948._2_2_;
    sStack_964 = local_938._4_2_ + local_948._4_2_;
    sStack_962 = local_938._6_2_ + local_948._6_2_;
    sStack_960 = CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_) +
                 CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_);
    sStack_95e = uStack_930._2_2_ + uStack_940._2_2_;
    sStack_95c = uStack_930._4_2_ + uStack_940._4_2_;
    sStack_95a = uStack_930._6_2_ + uStack_940._6_2_;
    local_958._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_958._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_958._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_950._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_950._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_950._6_2_ = (short)((ulong)uVar6 >> 0x30);
    sVar249 = CONCAT11((char)uStack_1d90,(undefined1)uStack_1350) + local_968;
    local_958._2_2_ = local_958._2_2_ + sStack_966;
    local_958._4_2_ = local_958._4_2_ + sStack_964;
    local_958._6_2_ = local_958._6_2_ + sStack_962;
    sVar292 = CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_) + sStack_960;
    uStack_950._2_2_ = uStack_950._2_2_ + sStack_95e;
    uStack_950._4_2_ = uStack_950._4_2_ + sStack_95c;
    uStack_950._6_2_ = uStack_950._6_2_ + sStack_95a;
    local_978 = CONCAT26(local_8b8._6_2_ + sStack_8c2,
                         CONCAT24(local_8b8._4_2_ + sStack_8c4,
                                  CONCAT22(local_8b8._2_2_ + sStack_8c6,sVar248)));
    uStack_970 = CONCAT26(uStack_8b0._6_2_ + sStack_8ba,
                          CONCAT24(uStack_8b0._4_2_ + sStack_8bc,
                                   CONCAT22(uStack_8b0._2_2_ + sStack_8be,sVar291)));
    local_988 = CONCAT26(local_958._6_2_,CONCAT24(local_958._4_2_,CONCAT22(local_958._2_2_,sVar249))
                        );
    uStack_980 = CONCAT26(uStack_950._6_2_,
                          CONCAT24(uStack_950._4_2_,CONCAT22(uStack_950._2_2_,sVar292)));
    sVar248 = sVar248 + sVar249;
    sVar264 = local_8b8._2_2_ + sStack_8c6 + local_958._2_2_;
    sVar272 = local_8b8._4_2_ + sStack_8c4 + local_958._4_2_;
    sVar282 = local_8b8._6_2_ + sStack_8c2 + local_958._6_2_;
    sVar291 = sVar291 + sVar292;
    sVar306 = uStack_8b0._2_2_ + sStack_8be + uStack_950._2_2_;
    sVar315 = uStack_8b0._4_2_ + sStack_8bc + uStack_950._4_2_;
    sVar325 = uStack_8b0._6_2_ + sStack_8ba + uStack_950._6_2_;
    local_998 = CONCAT26(sStack_9c2,CONCAT24(sStack_9c4,CONCAT22(sStack_9c6,local_9c8)));
    uStack_990 = CONCAT26(sStack_9ba,CONCAT24(sStack_9bc,CONCAT22(sStack_9be,sStack_9c0)));
    local_9a8 = CONCAT26(sVar282,CONCAT24(sVar272,CONCAT22(sVar264,sVar248)));
    uStack_9a0 = CONCAT26(sVar325,CONCAT24(sVar315,CONCAT22(sVar306,sVar291)));
    local_9c8 = local_9c8 + sVar248;
    sStack_9c6 = sStack_9c6 + sVar264;
    sStack_9c4 = sStack_9c4 + sVar272;
    sStack_9c2 = sStack_9c2 + sVar282;
    sStack_9c0 = sStack_9c0 + sVar291;
    sStack_9be = sStack_9be + sVar306;
    sStack_9bc = sStack_9bc + sVar315;
    sStack_9ba = sStack_9ba + sVar325;
    sVar250 = local_9c8 + 8;
    sVar265 = sStack_9c6 + 8;
    sVar273 = sStack_9c4 + 8;
    sVar283 = sStack_9c2 + 8;
    sVar293 = sStack_9c0 + 8;
    sVar307 = sStack_9be + 8;
    sVar316 = sStack_9bc + 8;
    sVar326 = sStack_9ba + 8;
    local_9d8 = CONCAT26(local_8f8._6_2_,
                         CONCAT24(local_8f8._4_2_,CONCAT22(local_8f8._2_2_,local_a08)));
    uStack_9d0 = CONCAT26(uStack_8f0._6_2_,
                          CONCAT24(uStack_8f0._4_2_,CONCAT22(uStack_8f0._2_2_,sStack_a00)));
    local_9e8 = CONCAT26(local_958._6_2_,CONCAT24(local_958._4_2_,CONCAT22(local_958._2_2_,sVar249))
                        );
    uStack_9e0 = CONCAT26(uStack_950._6_2_,
                          CONCAT24(uStack_950._4_2_,CONCAT22(uStack_950._2_2_,sVar292)));
    local_a08 = local_a08 + sVar249;
    sStack_a06 = local_8f8._2_2_ + local_958._2_2_;
    sStack_a04 = local_8f8._4_2_ + local_958._4_2_;
    sStack_a02 = local_8f8._6_2_ + local_958._6_2_;
    sStack_a00 = sStack_a00 + sVar292;
    sStack_9fe = uStack_8f0._2_2_ + uStack_950._2_2_;
    sStack_9fc = uStack_8f0._4_2_ + uStack_950._4_2_;
    sStack_9fa = uStack_8f0._6_2_ + uStack_950._6_2_;
    sVar251 = local_a08 + 4;
    sVar266 = sStack_a06 + 4;
    sVar274 = sStack_a04 + 4;
    sVar284 = sStack_a02 + 4;
    sVar294 = sStack_a00 + 4;
    sVar308 = sStack_9fe + 4;
    sVar317 = sStack_9fc + 4;
    sVar327 = sStack_9fa + 4;
    local_a78 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
    uStack_a70 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
    uVar25 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2008._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2008)));
    uVar26 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2008._2_1_,uVar25));
    uVar104 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2008._3_1_,uVar26));
    uVar32 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2008._5_1_,CONCAT11(local_1d98._4_1_,local_2008._4_1_)));
    uVar33 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2008._6_1_,uVar32));
    uVar105 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2008._7_1_,uVar33));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20c8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20c8)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20c8._2_1_,uVar16));
    uVar65 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20c8._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20c8._5_1_,CONCAT11(local_1d98._4_1_,local_20c8._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20c8._6_1_,uVar18));
    uVar70 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20c8._7_1_,uVar19));
    local_a18._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_a18._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_a18._6_2_ = (short)((ulong)uVar104 >> 0x30);
    uStack_a10._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_a10._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_a10._6_2_ = (short)((ulong)uVar105 >> 0x30);
    local_a28._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_a28._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_a28._6_2_ = (short)((ulong)uVar65 >> 0x30);
    uStack_a20._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_a20._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_a20._6_2_ = (short)((ulong)uVar70 >> 0x30);
    local_a58 = CONCAT11((char)local_1d98,(undefined1)local_2008) +
                CONCAT11((char)local_1d98,(undefined1)local_20c8);
    sStack_a56 = local_a18._2_2_ + local_a28._2_2_;
    sStack_a54 = local_a18._4_2_ + local_a28._4_2_;
    sStack_a52 = local_a18._6_2_ + local_a28._6_2_;
    sStack_a50 = CONCAT11(local_1d98._4_1_,local_2008._4_1_) +
                 CONCAT11(local_1d98._4_1_,local_20c8._4_1_);
    sStack_a4e = uStack_a10._2_2_ + uStack_a20._2_2_;
    sStack_a4c = uStack_a10._4_2_ + uStack_a20._4_2_;
    sStack_a4a = uStack_a10._6_2_ + uStack_a20._6_2_;
    uVar25 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20a8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20a8)));
    uVar26 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20a8._2_1_,uVar25));
    uVar75 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20a8._3_1_,uVar26));
    uVar32 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20a8._5_1_,CONCAT11(local_1d98._4_1_,local_20a8._4_1_)));
    uVar33 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20a8._6_1_,uVar32));
    uVar80 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20a8._7_1_,uVar33));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1350._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1350)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1350._2_1_,uVar16));
    uVar2 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1350._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1350._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1350._6_1_,uVar18));
    uVar20 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1350._7_1_,uVar19));
    local_a38._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_a38._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_a38._6_2_ = (short)((ulong)uVar75 >> 0x30);
    uStack_a30._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_a30._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_a30._6_2_ = (short)((ulong)uVar80 >> 0x30);
    local_a48._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_a48._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_a48._6_2_ = (short)((ulong)uVar2 >> 0x30);
    uStack_a40._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_a40._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_a40._6_2_ = (short)((ulong)uVar20 >> 0x30);
    local_a68 = CONCAT11((char)local_1d98,(undefined1)local_20a8) +
                CONCAT11((char)uStack_1d90,(undefined1)uStack_1350);
    sStack_a66 = local_a38._2_2_ + local_a48._2_2_;
    sStack_a64 = local_a38._4_2_ + local_a48._4_2_;
    sStack_a62 = local_a38._6_2_ + local_a48._6_2_;
    sStack_a60 = CONCAT11(local_1d98._4_1_,local_20a8._4_1_) +
                 CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_);
    sStack_a5e = uStack_a30._2_2_ + uStack_a40._2_2_;
    sStack_a5c = uStack_a30._4_2_ + uStack_a40._4_2_;
    sStack_a5a = uStack_a30._6_2_ + uStack_a40._6_2_;
    local_a88 = local_a58 + local_a68;
    sStack_a86 = sStack_a56 + sStack_a66;
    sStack_a84 = sStack_a54 + sStack_a64;
    sStack_a82 = sStack_a52 + sStack_a62;
    sStack_a80 = sStack_a50 + sStack_a60;
    sStack_a7e = sStack_a4e + sStack_a5e;
    sStack_a7c = sStack_a4c + sStack_a5c;
    sStack_a7a = sStack_a4a + sStack_a5a;
    local_1928 = sVar250 + local_a88;
    uStack_1926 = sVar265 + sStack_a86;
    uStack_1924 = sVar273 + sStack_a84;
    uStack_1922 = sVar283 + sStack_a82;
    uStack_1920 = sVar293 + sStack_a80;
    uStack_191e = sVar307 + sStack_a7e;
    uStack_191c = sVar316 + sStack_a7c;
    uStack_191a = sVar326 + sStack_a7a;
    local_192c = 4;
    uVar252 = local_1928 >> 4;
    uVar267 = uStack_1926 >> 4;
    uVar275 = uStack_1924 >> 4;
    uVar285 = uStack_1922 >> 4;
    uVar295 = uStack_1920 >> 4;
    uVar309 = uStack_191e >> 4;
    uVar318 = uStack_191c >> 4;
    uVar328 = uStack_191a >> 4;
    local_af8 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
    uStack_af0 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
    uVar25 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1410._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1410)
                              ));
    uVar26 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1410._2_1_,uVar25));
    uVar62 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1410._3_1_,uVar26));
    uVar32 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1410._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1410._4_1_)));
    uVar33 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1410._6_1_,uVar32));
    uVar63 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1410._7_1_,uVar33));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1350._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1350)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1350._2_1_,uVar16));
    uVar3 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1350._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1350._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1350._6_1_,uVar18));
    uVar21 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1350._7_1_,uVar19));
    local_a98._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_a98._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_a98._6_2_ = (short)((ulong)uVar62 >> 0x30);
    uStack_a90._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_a90._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_a90._6_2_ = (short)((ulong)uVar63 >> 0x30);
    local_aa8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_aa8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_aa8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_aa0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_aa0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_aa0._6_2_ = (short)((ulong)uVar21 >> 0x30);
    local_ad8 = CONCAT11((char)uStack_1d90,(undefined1)uStack_1410) +
                CONCAT11((char)uStack_1d90,(undefined1)uStack_1350);
    sStack_ad6 = local_a98._2_2_ + local_aa8._2_2_;
    sStack_ad4 = local_a98._4_2_ + local_aa8._4_2_;
    sStack_ad2 = local_a98._6_2_ + local_aa8._6_2_;
    sStack_ad0 = CONCAT11(uStack_1d90._4_1_,uStack_1410._4_1_) +
                 CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_);
    sStack_ace = uStack_a90._2_2_ + uStack_aa0._2_2_;
    sStack_acc = uStack_a90._4_2_ + uStack_aa0._4_2_;
    sStack_aca = uStack_a90._6_2_ + uStack_aa0._6_2_;
    uVar25 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20c8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20c8)));
    uVar26 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20c8._2_1_,uVar25));
    uVar66 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20c8._3_1_,uVar26));
    uVar32 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20c8._5_1_,CONCAT11(local_1d98._4_1_,local_20c8._4_1_)));
    uVar33 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20c8._6_1_,uVar32));
    uVar71 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20c8._7_1_,uVar33));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1370._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1370)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1370._2_1_,uVar16));
    uVar27 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1370._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1370._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1370._6_1_,uVar18));
    uVar34 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1370._7_1_,uVar19));
    local_ab8._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_ab8._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_ab8._6_2_ = (short)((ulong)uVar66 >> 0x30);
    uStack_ab0._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_ab0._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_ab0._6_2_ = (short)((ulong)uVar71 >> 0x30);
    local_ac8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_ac8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_ac8._6_2_ = (short)((ulong)uVar27 >> 0x30);
    uStack_ac0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_ac0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_ac0._6_2_ = (short)((ulong)uVar34 >> 0x30);
    local_ae8 = CONCAT11((char)local_1d98,(undefined1)local_20c8) +
                CONCAT11((char)uStack_1d90,(undefined1)uStack_1370);
    sStack_ae6 = local_ab8._2_2_ + local_ac8._2_2_;
    sStack_ae4 = local_ab8._4_2_ + local_ac8._4_2_;
    sStack_ae2 = local_ab8._6_2_ + local_ac8._6_2_;
    sStack_ae0 = CONCAT11(local_1d98._4_1_,local_20c8._4_1_) +
                 CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_);
    sStack_ade = uStack_ab0._2_2_ + uStack_ac0._2_2_;
    sStack_adc = uStack_ab0._4_2_ + uStack_ac0._4_2_;
    sStack_ada = uStack_ab0._6_2_ + uStack_ac0._6_2_;
    local_b08 = local_ad8 + local_ae8;
    sStack_b06 = sStack_ad6 + sStack_ae6;
    sStack_b04 = sStack_ad4 + sStack_ae4;
    sStack_b02 = sStack_ad2 + sStack_ae2;
    sStack_b00 = sStack_ad0 + sStack_ae0;
    sStack_afe = sStack_ace + sStack_ade;
    sStack_afc = sStack_acc + sStack_adc;
    sStack_afa = sStack_aca + sStack_ada;
    local_1948 = sVar250 + local_b08;
    uStack_1946 = sVar265 + sStack_b06;
    uStack_1944 = sVar273 + sStack_b04;
    uStack_1942 = sVar283 + sStack_b02;
    uStack_1940 = sVar293 + sStack_b00;
    uStack_193e = sVar307 + sStack_afe;
    uStack_193c = sVar316 + sStack_afc;
    uStack_193a = sVar326 + sStack_afa;
    local_194c = 4;
    uVar253 = local_1948 >> 4;
    uVar268 = uStack_1946 >> 4;
    uVar276 = uStack_1944 >> 4;
    uVar286 = uStack_1942 >> 4;
    uVar296 = uStack_1940 >> 4;
    uVar310 = uStack_193e >> 4;
    uVar319 = uStack_193c >> 4;
    uVar329 = uStack_193a >> 4;
    local_538 = CONCAT26(uVar285,CONCAT24(uVar275,CONCAT22(uVar267,uVar252)));
    uStack_530 = CONCAT26(uVar328,CONCAT24(uVar318,CONCAT22(uVar309,uVar295)));
    local_548 = CONCAT26(uVar286,CONCAT24(uVar276,CONCAT22(uVar268,uVar253)));
    uStack_540 = CONCAT26(uVar329,CONCAT24(uVar319,CONCAT22(uVar310,uVar296)));
    local_22c8 = CONCAT17((uVar328 != 0) * (uVar328 < 0x100) * (char)uVar328 - (0xff < uVar328),
                          CONCAT16((uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 -
                                   (0xff < uVar318),
                                   CONCAT15((uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 -
                                            (0xff < uVar309),
                                            CONCAT14((uVar295 != 0) * (uVar295 < 0x100) *
                                                     (char)uVar295 - (0xff < uVar295),
                                                     CONCAT13((uVar285 != 0) * (uVar285 < 0x100) *
                                                              (char)uVar285 - (0xff < uVar285),
                                                              CONCAT12((uVar275 != 0) *
                                                                       (uVar275 < 0x100) *
                                                                       (char)uVar275 -
                                                                       (0xff < uVar275),
                                                                       CONCAT11((uVar267 != 0) *
                                                                                (uVar267 < 0x100) *
                                                                                (char)uVar267 -
                                                                                (0xff < uVar267),
                                                                                (uVar252 != 0) *
                                                                                (uVar252 < 0x100) *
                                                                                (char)uVar252 -
                                                                                (0xff < uVar252)))))
                                           )));
    uStack_22c0 = CONCAT17((uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329),
                           CONCAT16((uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 -
                                    (0xff < uVar319),
                                    CONCAT15((uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 -
                                             (0xff < uVar310),
                                             CONCAT14((uVar296 != 0) * (uVar296 < 0x100) *
                                                      (char)uVar296 - (0xff < uVar296),
                                                      CONCAT13((uVar286 != 0) * (uVar286 < 0x100) *
                                                               (char)uVar286 - (0xff < uVar286),
                                                               CONCAT12((uVar276 != 0) *
                                                                        (uVar276 < 0x100) *
                                                                        (char)uVar276 -
                                                                        (0xff < uVar276),
                                                                        CONCAT11((uVar268 != 0) *
                                                                                 (uVar268 < 0x100) *
                                                                                 (char)uVar268 -
                                                                                 (0xff < uVar268),
                                                                                 (uVar253 != 0) *
                                                                                 (uVar253 < 0x100) *
                                                                                 (char)uVar253 -
                                                                                 (0xff < uVar253))))
                                                     ))));
    local_b38 = CONCAT26(sVar284,CONCAT24(sVar274,CONCAT22(sVar266,sVar251)));
    uStack_b30 = CONCAT26(sVar327,CONCAT24(sVar317,CONCAT22(sVar308,sVar294)));
    uVar25 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2068._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2068)));
    uVar26 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2068._2_1_,uVar25));
    uVar93 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2068._3_1_,uVar26));
    uVar32 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2068._5_1_,CONCAT11(local_1d98._4_1_,local_2068._4_1_)));
    uVar33 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2068._6_1_,uVar32));
    uVar96 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2068._7_1_,uVar33));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20c8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20c8)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20c8._2_1_,uVar16));
    uVar67 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20c8._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20c8._5_1_,CONCAT11(local_1d98._4_1_,local_20c8._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20c8._6_1_,uVar18));
    uVar72 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20c8._7_1_,uVar19));
    local_b18._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_b18._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_b18._6_2_ = (short)((ulong)uVar93 >> 0x30);
    uStack_b10._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_b10._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_b10._6_2_ = (short)((ulong)uVar96 >> 0x30);
    local_b28._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_b28._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_b28._6_2_ = (short)((ulong)uVar67 >> 0x30);
    uStack_b20._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_b20._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_b20._6_2_ = (short)((ulong)uVar72 >> 0x30);
    local_b48 = CONCAT11((char)local_1d98,(undefined1)local_2068) +
                CONCAT11((char)local_1d98,(undefined1)local_20c8);
    sStack_b46 = local_b18._2_2_ + local_b28._2_2_;
    sStack_b44 = local_b18._4_2_ + local_b28._4_2_;
    sStack_b42 = local_b18._6_2_ + local_b28._6_2_;
    sStack_b40 = CONCAT11(local_1d98._4_1_,local_2068._4_1_) +
                 CONCAT11(local_1d98._4_1_,local_20c8._4_1_);
    sStack_b3e = uStack_b10._2_2_ + uStack_b20._2_2_;
    sStack_b3c = uStack_b10._4_2_ + uStack_b20._4_2_;
    sStack_b3a = uStack_b10._6_2_ + uStack_b20._6_2_;
    local_1968 = sVar251 + local_b48;
    uStack_1966 = sVar266 + sStack_b46;
    uStack_1964 = sVar274 + sStack_b44;
    uStack_1962 = sVar284 + sStack_b42;
    uStack_1960 = sVar294 + sStack_b40;
    uStack_195e = sVar308 + sStack_b3e;
    uStack_195c = sVar317 + sStack_b3c;
    uStack_195a = sVar327 + sStack_b3a;
    local_196c = 3;
    uVar252 = local_1968 >> 3;
    uVar267 = uStack_1966 >> 3;
    uVar275 = uStack_1964 >> 3;
    uVar285 = uStack_1962 >> 3;
    uVar295 = uStack_1960 >> 3;
    uVar309 = uStack_195e >> 3;
    uVar318 = uStack_195c >> 3;
    uVar328 = uStack_195a >> 3;
    local_b78 = CONCAT26(sVar284,CONCAT24(sVar274,CONCAT22(sVar266,sVar251)));
    uStack_b70 = CONCAT26(sVar327,CONCAT24(sVar317,CONCAT22(sVar308,sVar294)));
    uVar25 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_13b0._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0)
                              ));
    uVar26 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_13b0._2_1_,uVar25));
    uVar51 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_13b0._3_1_,uVar26));
    uVar32 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_13b0._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_)));
    uVar33 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_13b0._6_1_,uVar32));
    uVar54 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_13b0._7_1_,uVar33));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1350._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1350)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1350._2_1_,uVar16));
    uVar4 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1350._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1350._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1350._6_1_,uVar18));
    uVar22 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1350._7_1_,uVar19));
    local_b58._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_b58._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_b58._6_2_ = (short)((ulong)uVar51 >> 0x30);
    uStack_b50._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_b50._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_b50._6_2_ = (short)((ulong)uVar54 >> 0x30);
    local_b68._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_b68._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_b68._6_2_ = (short)((ulong)uVar4 >> 0x30);
    uStack_b60._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_b60._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_b60._6_2_ = (short)((ulong)uVar22 >> 0x30);
    local_b88 = CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0) +
                CONCAT11((char)uStack_1d90,(undefined1)uStack_1350);
    sStack_b86 = local_b58._2_2_ + local_b68._2_2_;
    sStack_b84 = local_b58._4_2_ + local_b68._4_2_;
    sStack_b82 = local_b58._6_2_ + local_b68._6_2_;
    sStack_b80 = CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_) +
                 CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_);
    sStack_b7e = uStack_b50._2_2_ + uStack_b60._2_2_;
    sStack_b7c = uStack_b50._4_2_ + uStack_b60._4_2_;
    sStack_b7a = uStack_b50._6_2_ + uStack_b60._6_2_;
    local_1988 = sVar251 + local_b88;
    uStack_1986 = sVar266 + sStack_b86;
    uStack_1984 = sVar274 + sStack_b84;
    uStack_1982 = sVar284 + sStack_b82;
    uStack_1980 = sVar294 + sStack_b80;
    uStack_197e = sVar308 + sStack_b7e;
    uStack_197c = sVar317 + sStack_b7c;
    uStack_197a = sVar327 + sStack_b7a;
    local_198c = 3;
    uVar253 = local_1988 >> 3;
    uVar268 = uStack_1986 >> 3;
    uVar276 = uStack_1984 >> 3;
    uVar286 = uStack_1982 >> 3;
    uVar296 = uStack_1980 >> 3;
    uVar310 = uStack_197e >> 3;
    uVar319 = uStack_197c >> 3;
    uVar329 = uStack_197a >> 3;
    local_558 = CONCAT26(uVar285,CONCAT24(uVar275,CONCAT22(uVar267,uVar252)));
    uStack_550 = CONCAT26(uVar328,CONCAT24(uVar318,CONCAT22(uVar309,uVar295)));
    local_568 = CONCAT26(uVar286,CONCAT24(uVar276,CONCAT22(uVar268,uVar253)));
    uStack_560 = CONCAT26(uVar329,CONCAT24(uVar319,CONCAT22(uVar310,uVar296)));
    local_22f8 = CONCAT17((uVar328 != 0) * (uVar328 < 0x100) * (char)uVar328 - (0xff < uVar328),
                          CONCAT16((uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 -
                                   (0xff < uVar318),
                                   CONCAT15((uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 -
                                            (0xff < uVar309),
                                            CONCAT14((uVar295 != 0) * (uVar295 < 0x100) *
                                                     (char)uVar295 - (0xff < uVar295),
                                                     CONCAT13((uVar285 != 0) * (uVar285 < 0x100) *
                                                              (char)uVar285 - (0xff < uVar285),
                                                              CONCAT12((uVar275 != 0) *
                                                                       (uVar275 < 0x100) *
                                                                       (char)uVar275 -
                                                                       (0xff < uVar275),
                                                                       CONCAT11((uVar267 != 0) *
                                                                                (uVar267 < 0x100) *
                                                                                (char)uVar267 -
                                                                                (0xff < uVar267),
                                                                                (uVar252 != 0) *
                                                                                (uVar252 < 0x100) *
                                                                                (char)uVar252 -
                                                                                (0xff < uVar252)))))
                                           )));
    uStack_22f0 = CONCAT17((uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329),
                           CONCAT16((uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 -
                                    (0xff < uVar319),
                                    CONCAT15((uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 -
                                             (0xff < uVar310),
                                             CONCAT14((uVar296 != 0) * (uVar296 < 0x100) *
                                                      (char)uVar296 - (0xff < uVar296),
                                                      CONCAT13((uVar286 != 0) * (uVar286 < 0x100) *
                                                               (char)uVar286 - (0xff < uVar286),
                                                               CONCAT12((uVar276 != 0) *
                                                                        (uVar276 < 0x100) *
                                                                        (char)uVar276 -
                                                                        (0xff < uVar276),
                                                                        CONCAT11((uVar268 != 0) *
                                                                                 (uVar268 < 0x100) *
                                                                                 (char)uVar268 -
                                                                                 (0xff < uVar268),
                                                                                 (uVar253 != 0) *
                                                                                 (uVar253 < 0x100) *
                                                                                 (char)uVar253 -
                                                                                 (0xff < uVar253))))
                                                     ))));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2008._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2008)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2008._2_1_,uVar16));
    local_ba8 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2008._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2008._5_1_,CONCAT11(local_1d98._4_1_,local_2008._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2008._6_1_,uVar18));
    uStack_ba0 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2008._7_1_,uVar19));
    local_b98._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_b98._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_b98._6_2_ = (short)((ulong)local_ba8 >> 0x30);
    uStack_b90._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_b90._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_b90._6_2_ = (short)((ulong)uStack_ba0 >> 0x30);
    sVar249 = CONCAT11((char)local_1d98,(undefined1)local_2008) * 2;
    sVar248 = local_b98._2_2_ * 2;
    sVar264 = local_b98._4_2_ * 2;
    sVar272 = local_b98._6_2_ * 2;
    sVar282 = CONCAT11(local_1d98._4_1_,local_2008._4_1_) * 2;
    sVar292 = uStack_b90._2_2_ * 2;
    sVar291 = uStack_b90._4_2_ * 2;
    sVar306 = uStack_b90._6_2_ * 2;
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1410._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1410)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1410._2_1_,uVar16));
    local_bc8 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1410._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1410._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1410._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1410._6_1_,uVar18));
    uStack_bc0 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1410._7_1_,uVar19));
    local_bb8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_bb8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_bb8._6_2_ = (short)((ulong)local_bc8 >> 0x30);
    uStack_bb0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_bb0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_bb0._6_2_ = (short)((ulong)uStack_bc0 >> 0x30);
    sVar315 = CONCAT11((char)uStack_1d90,(undefined1)uStack_1410) * 2;
    sVar325 = local_bb8._2_2_ * 2;
    sVar278 = local_bb8._4_2_ * 2;
    sVar288 = local_bb8._6_2_ * 2;
    sVar299 = CONCAT11(uStack_1d90._4_1_,uStack_1410._4_1_) * 2;
    sVar312 = uStack_bb0._2_2_ * 2;
    sVar321 = uStack_bb0._4_2_ * 2;
    sVar331 = uStack_bb0._6_2_ * 2;
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2068._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2068)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2068._2_1_,uVar16));
    local_be8 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2068._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2068._5_1_,CONCAT11(local_1d98._4_1_,local_2068._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2068._6_1_,uVar18));
    uStack_be0 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2068._7_1_,uVar19));
    local_bd8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_bd8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_bd8._6_2_ = (short)((ulong)local_be8 >> 0x30);
    uStack_bd0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_bd0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_bd0._6_2_ = (short)((ulong)uStack_be0 >> 0x30);
    in_stack_ffffffffffffdb88 = CONCAT11((char)local_1d98,(undefined1)local_2068) * 2;
    in_stack_ffffffffffffdb8a = local_bd8._2_2_ * 2;
    in_stack_ffffffffffffdb8c = local_bd8._4_2_ * 2;
    in_stack_ffffffffffffdb8e = local_bd8._6_2_ * 2;
    sStack_e00 = CONCAT11(local_1d98._4_1_,local_2068._4_1_) * 2;
    uStack_bd0._2_2_ = uStack_bd0._2_2_ * 2;
    uStack_bd0._4_2_ = uStack_bd0._4_2_ * 2;
    uStack_bd0._6_2_ = uStack_bd0._6_2_ * 2;
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_13b0._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_13b0._2_1_,uVar16));
    local_c08 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_13b0._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_13b0._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_13b0._6_1_,uVar18));
    uStack_c00 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_13b0._7_1_,uVar19));
    local_bf8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_bf8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_bf8._6_2_ = (short)((ulong)local_c08 >> 0x30);
    uStack_bf0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_bf0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_bf0._6_2_ = (short)((ulong)uStack_c00 >> 0x30);
    in_stack_ffffffffffffdb78 = CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0) * 2;
    in_stack_ffffffffffffdb7a = local_bf8._2_2_ * 2;
    in_stack_ffffffffffffdb7c = local_bf8._4_2_ * 2;
    in_stack_ffffffffffffdb7e = local_bf8._6_2_ * 2;
    in_stack_ffffffffffffdb80 = CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_) * 2;
    in_stack_ffffffffffffdb82 = uStack_bf0._2_2_ * 2;
    in_stack_ffffffffffffdb84 = uStack_bf0._4_2_ * 2;
    in_stack_ffffffffffffdb86 = uStack_bf0._6_2_ * 2;
    local_698 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
    uStack_690 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2028._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2028)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2028._2_1_,uVar16));
    uVar101 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2028._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2028._5_1_,CONCAT11(local_1d98._4_1_,local_2028._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2028._6_1_,uVar18));
    uVar103 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2028._7_1_,uVar19));
    local_6a8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_6a8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_6a8._6_2_ = (short)((ulong)uVar101 >> 0x30);
    uStack_6a0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_6a0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_6a0._6_2_ = (short)((ulong)uVar103 >> 0x30);
    sVar254 = sVar250 - CONCAT11((char)local_1d98,(undefined1)local_2028);
    sVar269 = sVar265 - local_6a8._2_2_;
    sVar277 = sVar273 - local_6a8._4_2_;
    sVar287 = sVar283 - local_6a8._6_2_;
    sVar297 = sVar293 - CONCAT11(local_1d98._4_1_,local_2028._4_1_);
    sVar311 = sVar307 - uStack_6a0._2_2_;
    sVar320 = sVar316 - uStack_6a0._4_2_;
    sVar330 = sVar326 - uStack_6a0._6_2_;
    local_6b8 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
    uStack_6b0 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_13f0._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_13f0)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_13f0._2_1_,uVar16));
    uVar59 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_13f0._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_13f0._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_13f0._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_13f0._6_1_,uVar18));
    uVar61 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_13f0._7_1_,uVar19));
    local_6c8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_6c8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_6c8._6_2_ = (short)((ulong)uVar59 >> 0x30);
    uStack_6c0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_6c0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_6c0._6_2_ = (short)((ulong)uVar61 >> 0x30);
    sVar250 = sVar250 - CONCAT11((char)uStack_1d90,(undefined1)uStack_13f0);
    sVar265 = sVar265 - local_6c8._2_2_;
    sVar273 = sVar273 - local_6c8._4_2_;
    sVar283 = sVar283 - local_6c8._6_2_;
    sVar293 = sVar293 - CONCAT11(uStack_1d90._4_1_,uStack_13f0._4_1_);
    sVar307 = sVar307 - uStack_6c0._2_2_;
    sVar316 = sVar316 - uStack_6c0._4_2_;
    sVar326 = sVar326 - uStack_6c0._6_2_;
    local_c78 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
    uStack_c70 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
    local_c58 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
    uStack_c50 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
    uVar25 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20a8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20a8)));
    uVar26 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20a8._2_1_,uVar25));
    uVar76 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20a8._3_1_,uVar26));
    uVar32 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20a8._5_1_,CONCAT11(local_1d98._4_1_,local_20a8._4_1_)));
    uVar33 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20a8._6_1_,uVar32));
    uVar81 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20a8._7_1_,uVar33));
    uVar39 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2088._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2088)));
    uVar40 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2088._2_1_,uVar39));
    uVar85 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2088._3_1_,uVar40));
    uVar45 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2088._5_1_,CONCAT11(local_1d98._4_1_,local_2088._4_1_)));
    uVar46 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2088._6_1_,uVar45));
    uVar89 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2088._7_1_,uVar46));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20c8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20c8)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20c8._2_1_,uVar16));
    uVar68 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20c8._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20c8._5_1_,CONCAT11(local_1d98._4_1_,local_20c8._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20c8._6_1_,uVar18));
    uVar73 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20c8._7_1_,uVar19));
    local_c18._2_2_ = (short)((uint)uVar39 >> 0x10);
    local_c18._4_2_ = (short)((uint6)uVar40 >> 0x20);
    local_c18._6_2_ = (short)((ulong)uVar85 >> 0x30);
    uStack_c10._2_2_ = (short)((uint)uVar45 >> 0x10);
    uStack_c10._4_2_ = (short)((uint6)uVar46 >> 0x20);
    uStack_c10._6_2_ = (short)((ulong)uVar89 >> 0x30);
    local_c28._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_c28._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_c28._6_2_ = (short)((ulong)uVar68 >> 0x30);
    uStack_c20._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_c20._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_c20._6_2_ = (short)((ulong)uVar73 >> 0x30);
    local_c48 = CONCAT11((char)local_1d98,(undefined1)local_2088) +
                CONCAT11((char)local_1d98,(undefined1)local_20c8);
    sStack_c46 = local_c18._2_2_ + local_c28._2_2_;
    sStack_c44 = local_c18._4_2_ + local_c28._4_2_;
    sStack_c42 = local_c18._6_2_ + local_c28._6_2_;
    sStack_c40 = CONCAT11(local_1d98._4_1_,local_2088._4_1_) +
                 CONCAT11(local_1d98._4_1_,local_20c8._4_1_);
    sStack_c3e = uStack_c10._2_2_ + uStack_c20._2_2_;
    sStack_c3c = uStack_c10._4_2_ + uStack_c20._4_2_;
    sStack_c3a = uStack_c10._6_2_ + uStack_c20._6_2_;
    local_c38._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_c38._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_c38._6_2_ = (short)((ulong)uVar76 >> 0x30);
    uStack_c30._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_c30._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_c30._6_2_ = (short)((ulong)uVar81 >> 0x30);
    local_c68 = CONCAT11((char)local_1d98,(undefined1)local_20a8) + local_c48;
    sStack_c66 = local_c38._2_2_ + sStack_c46;
    sStack_c64 = local_c38._4_2_ + sStack_c44;
    sStack_c62 = local_c38._6_2_ + sStack_c42;
    sStack_c60 = CONCAT11(local_1d98._4_1_,local_20a8._4_1_) + sStack_c40;
    sStack_c5e = uStack_c30._2_2_ + sStack_c3e;
    sStack_c5c = uStack_c30._4_2_ + sStack_c3c;
    sStack_c5a = uStack_c30._6_2_ + sStack_c3a;
    local_c88 = sVar249 + local_c68;
    sStack_c86 = sVar248 + sStack_c66;
    sStack_c84 = sVar264 + sStack_c64;
    sStack_c82 = sVar272 + sStack_c62;
    sStack_c80 = sVar282 + sStack_c60;
    sStack_c7e = sVar292 + sStack_c5e;
    sStack_c7c = sVar291 + sStack_c5c;
    sStack_c7a = sVar306 + sStack_c5a;
    local_19a8 = sVar250 + local_c88;
    uStack_19a6 = sVar265 + sStack_c86;
    uStack_19a4 = sVar273 + sStack_c84;
    uStack_19a2 = sVar283 + sStack_c82;
    uStack_19a0 = sVar293 + sStack_c80;
    uStack_199e = sVar307 + sStack_c7e;
    uStack_199c = sVar316 + sStack_c7c;
    uStack_199a = sVar326 + sStack_c7a;
    local_19ac = 4;
    uVar252 = local_19a8 >> 4;
    uVar267 = uStack_19a6 >> 4;
    uVar275 = uStack_19a4 >> 4;
    uVar285 = uStack_19a2 >> 4;
    uVar295 = uStack_19a0 >> 4;
    uVar309 = uStack_199e >> 4;
    uVar318 = uStack_199c >> 4;
    uVar328 = uStack_199a >> 4;
    local_cf8 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
    uStack_cf0 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
    local_cd8 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
    uStack_cd0 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
    uVar25 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1370._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1370)
                              ));
    uVar26 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1370._2_1_,uVar25));
    uVar28 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1370._3_1_,uVar26));
    uVar32 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1370._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_)));
    uVar33 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1370._6_1_,uVar32));
    uVar35 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1370._7_1_,uVar33));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1350._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1350)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1350._2_1_,uVar16));
    uVar5 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1350._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1350._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1350._6_1_,uVar18));
    uVar23 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1350._7_1_,uVar19));
    uVar39 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1390._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1390)
                              ));
    uVar40 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1390._2_1_,uVar39));
    uVar41 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1390._3_1_,uVar40));
    uVar45 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1390._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_)));
    uVar46 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1390._6_1_,uVar45));
    uVar47 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1390._7_1_,uVar46));
    local_c98._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_c98._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_c98._6_2_ = (short)((ulong)uVar5 >> 0x30);
    uStack_c90._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_c90._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_c90._6_2_ = (short)((ulong)uVar23 >> 0x30);
    local_ca8._2_2_ = (short)((uint)uVar39 >> 0x10);
    local_ca8._4_2_ = (short)((uint6)uVar40 >> 0x20);
    local_ca8._6_2_ = (short)((ulong)uVar41 >> 0x30);
    uStack_ca0._2_2_ = (short)((uint)uVar45 >> 0x10);
    uStack_ca0._4_2_ = (short)((uint6)uVar46 >> 0x20);
    uStack_ca0._6_2_ = (short)((ulong)uVar47 >> 0x30);
    local_cc8 = CONCAT11((char)uStack_1d90,(undefined1)uStack_1350) +
                CONCAT11((char)uStack_1d90,(undefined1)uStack_1390);
    sStack_cc6 = local_c98._2_2_ + local_ca8._2_2_;
    sStack_cc4 = local_c98._4_2_ + local_ca8._4_2_;
    sStack_cc2 = local_c98._6_2_ + local_ca8._6_2_;
    sStack_cc0 = CONCAT11(uStack_1d90._4_1_,uStack_1350._4_1_) +
                 CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_);
    sStack_cbe = uStack_c90._2_2_ + uStack_ca0._2_2_;
    sStack_cbc = uStack_c90._4_2_ + uStack_ca0._4_2_;
    sStack_cba = uStack_c90._6_2_ + uStack_ca0._6_2_;
    local_cb8._2_2_ = (short)((uint)uVar25 >> 0x10);
    local_cb8._4_2_ = (short)((uint6)uVar26 >> 0x20);
    local_cb8._6_2_ = (short)((ulong)uVar28 >> 0x30);
    uStack_cb0._2_2_ = (short)((uint)uVar32 >> 0x10);
    uStack_cb0._4_2_ = (short)((uint6)uVar33 >> 0x20);
    uStack_cb0._6_2_ = (short)((ulong)uVar35 >> 0x30);
    local_ce8 = CONCAT11((char)uStack_1d90,(undefined1)uStack_1370) + local_cc8;
    sStack_ce6 = local_cb8._2_2_ + sStack_cc6;
    sStack_ce4 = local_cb8._4_2_ + sStack_cc4;
    sStack_ce2 = local_cb8._6_2_ + sStack_cc2;
    sStack_ce0 = CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_) + sStack_cc0;
    sStack_cde = uStack_cb0._2_2_ + sStack_cbe;
    sStack_cdc = uStack_cb0._4_2_ + sStack_cbc;
    sStack_cda = uStack_cb0._6_2_ + sStack_cba;
    local_d08 = sVar315 + local_ce8;
    sStack_d06 = sVar325 + sStack_ce6;
    sStack_d04 = sVar278 + sStack_ce4;
    sStack_d02 = sVar288 + sStack_ce2;
    sStack_d00 = sVar299 + sStack_ce0;
    sStack_cfe = sVar312 + sStack_cde;
    sStack_cfc = sVar321 + sStack_cdc;
    sStack_cfa = sVar331 + sStack_cda;
    local_19c8 = sVar254 + local_d08;
    uStack_19c6 = sVar269 + sStack_d06;
    uStack_19c4 = sVar277 + sStack_d04;
    uStack_19c2 = sVar287 + sStack_d02;
    uStack_19c0 = sVar297 + sStack_d00;
    uStack_19be = sVar311 + sStack_cfe;
    uStack_19bc = sVar320 + sStack_cfc;
    uStack_19ba = sVar330 + sStack_cfa;
    local_19cc = 4;
    uVar253 = local_19c8 >> 4;
    uVar268 = uStack_19c6 >> 4;
    uVar276 = uStack_19c4 >> 4;
    uVar286 = uStack_19c2 >> 4;
    uVar296 = uStack_19c0 >> 4;
    uVar310 = uStack_19be >> 4;
    uVar319 = uStack_19bc >> 4;
    uVar329 = uStack_19ba >> 4;
    local_578 = CONCAT26(uVar285,CONCAT24(uVar275,CONCAT22(uVar267,uVar252)));
    uStack_570 = CONCAT26(uVar328,CONCAT24(uVar318,CONCAT22(uVar309,uVar295)));
    local_588 = CONCAT26(uVar286,CONCAT24(uVar276,CONCAT22(uVar268,uVar253)));
    uStack_580 = CONCAT26(uVar329,CONCAT24(uVar319,CONCAT22(uVar310,uVar296)));
    local_22b8 = CONCAT17((uVar328 != 0) * (uVar328 < 0x100) * (char)uVar328 - (0xff < uVar328),
                          CONCAT16((uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 -
                                   (0xff < uVar318),
                                   CONCAT15((uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 -
                                            (0xff < uVar309),
                                            CONCAT14((uVar295 != 0) * (uVar295 < 0x100) *
                                                     (char)uVar295 - (0xff < uVar295),
                                                     CONCAT13((uVar285 != 0) * (uVar285 < 0x100) *
                                                              (char)uVar285 - (0xff < uVar285),
                                                              CONCAT12((uVar275 != 0) *
                                                                       (uVar275 < 0x100) *
                                                                       (char)uVar275 -
                                                                       (0xff < uVar275),
                                                                       CONCAT11((uVar267 != 0) *
                                                                                (uVar267 < 0x100) *
                                                                                (char)uVar267 -
                                                                                (0xff < uVar267),
                                                                                (uVar252 != 0) *
                                                                                (uVar252 < 0x100) *
                                                                                (char)uVar252 -
                                                                                (0xff < uVar252)))))
                                           )));
    uStack_22b0 = CONCAT17((uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329),
                           CONCAT16((uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 -
                                    (0xff < uVar319),
                                    CONCAT15((uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 -
                                             (0xff < uVar310),
                                             CONCAT14((uVar296 != 0) * (uVar296 < 0x100) *
                                                      (char)uVar296 - (0xff < uVar296),
                                                      CONCAT13((uVar286 != 0) * (uVar286 < 0x100) *
                                                               (char)uVar286 - (0xff < uVar286),
                                                               CONCAT12((uVar276 != 0) *
                                                                        (uVar276 < 0x100) *
                                                                        (char)uVar276 -
                                                                        (0xff < uVar276),
                                                                        CONCAT11((uVar268 != 0) *
                                                                                 (uVar268 < 0x100) *
                                                                                 (char)uVar268 -
                                                                                 (0xff < uVar268),
                                                                                 (uVar253 != 0) *
                                                                                 (uVar253 < 0x100) *
                                                                                 (char)uVar253 -
                                                                                 (0xff < uVar253))))
                                                     ))));
    local_6d8 = CONCAT26(sVar284,CONCAT24(sVar274,CONCAT22(sVar266,sVar251)));
    uStack_6d0 = CONCAT26(sVar327,CONCAT24(sVar317,CONCAT22(sVar308,sVar294)));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2088._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2088)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2088._2_1_,uVar16));
    uVar86 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2088._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2088._5_1_,CONCAT11(local_1d98._4_1_,local_2088._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2088._6_1_,uVar18));
    uVar90 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2088._7_1_,uVar19));
    local_6e8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_6e8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_6e8._6_2_ = (short)((ulong)uVar86 >> 0x30);
    uStack_6e0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_6e0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_6e0._6_2_ = (short)((ulong)uVar90 >> 0x30);
    sVar255 = sVar251 - CONCAT11((char)local_1d98,(undefined1)local_2088);
    local_6e8._2_2_ = sVar266 - local_6e8._2_2_;
    local_6e8._4_2_ = sVar274 - local_6e8._4_2_;
    local_6e8._6_2_ = sVar284 - local_6e8._6_2_;
    sVar298 = sVar294 - CONCAT11(local_1d98._4_1_,local_2088._4_1_);
    uStack_6e0._2_2_ = sVar308 - uStack_6e0._2_2_;
    uStack_6e0._4_2_ = sVar317 - uStack_6e0._4_2_;
    uStack_6e0._6_2_ = sVar327 - uStack_6e0._6_2_;
    local_6f8 = CONCAT26(sVar284,CONCAT24(sVar274,CONCAT22(sVar266,sVar251)));
    uStack_6f0 = CONCAT26(sVar327,CONCAT24(sVar317,CONCAT22(sVar308,sVar294)));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1390._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1390)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1390._2_1_,uVar16));
    uVar42 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1390._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1390._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1390._6_1_,uVar18));
    uVar48 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1390._7_1_,uVar19));
    local_708._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_708._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_708._6_2_ = (short)((ulong)uVar42 >> 0x30);
    uStack_700._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_700._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_700._6_2_ = (short)((ulong)uVar48 >> 0x30);
    sVar251 = sVar251 - CONCAT11((char)uStack_1d90,(undefined1)uStack_1390);
    sVar266 = sVar266 - local_708._2_2_;
    sVar274 = sVar274 - local_708._4_2_;
    sVar284 = sVar284 - local_708._6_2_;
    sVar294 = sVar294 - CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_);
    sVar308 = sVar308 - uStack_700._2_2_;
    sVar317 = sVar317 - uStack_700._4_2_;
    sVar327 = sVar327 - uStack_700._6_2_;
    local_d38 = CONCAT26(sVar284,CONCAT24(sVar274,CONCAT22(sVar266,sVar251)));
    uStack_d30 = CONCAT26(sVar327,CONCAT24(sVar317,CONCAT22(sVar308,sVar294)));
    local_d18 = CONCAT26(in_stack_ffffffffffffdb8e,
                         CONCAT24(in_stack_ffffffffffffdb8c,
                                  CONCAT22(in_stack_ffffffffffffdb8a,in_stack_ffffffffffffdb88)));
    uStack_d10 = CONCAT26(uStack_bd0._6_2_,
                          CONCAT24(uStack_bd0._4_2_,CONCAT22(uStack_bd0._2_2_,sStack_e00)));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20a8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20a8)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20a8._2_1_,uVar16));
    uVar77 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20a8._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20a8._5_1_,CONCAT11(local_1d98._4_1_,local_20a8._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20a8._6_1_,uVar18));
    uVar82 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20a8._7_1_,uVar19));
    local_d28._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_d28._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_d28._6_2_ = (short)((ulong)uVar77 >> 0x30);
    uStack_d20._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_d20._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_d20._6_2_ = (short)((ulong)uVar82 >> 0x30);
    local_d48 = in_stack_ffffffffffffdb88 + CONCAT11((char)local_1d98,(undefined1)local_20a8);
    sStack_d46 = in_stack_ffffffffffffdb8a + local_d28._2_2_;
    sStack_d44 = in_stack_ffffffffffffdb8c + local_d28._4_2_;
    sStack_d42 = in_stack_ffffffffffffdb8e + local_d28._6_2_;
    sStack_d40 = sStack_e00 + CONCAT11(local_1d98._4_1_,local_20a8._4_1_);
    sStack_d3e = uStack_bd0._2_2_ + uStack_d20._2_2_;
    sStack_d3c = uStack_bd0._4_2_ + uStack_d20._4_2_;
    sStack_d3a = uStack_bd0._6_2_ + uStack_d20._6_2_;
    local_19e8 = sVar251 + local_d48;
    uStack_19e6 = sVar266 + sStack_d46;
    uStack_19e4 = sVar274 + sStack_d44;
    uStack_19e2 = sVar284 + sStack_d42;
    uStack_19e0 = sVar294 + sStack_d40;
    uStack_19de = sVar308 + sStack_d3e;
    uStack_19dc = sVar317 + sStack_d3c;
    uStack_19da = sVar327 + sStack_d3a;
    local_19ec = 3;
    uVar252 = local_19e8 >> 3;
    uVar267 = uStack_19e6 >> 3;
    uVar275 = uStack_19e4 >> 3;
    uVar285 = uStack_19e2 >> 3;
    uVar295 = uStack_19e0 >> 3;
    uVar309 = uStack_19de >> 3;
    uVar318 = uStack_19dc >> 3;
    uVar328 = uStack_19da >> 3;
    local_d78 = CONCAT26(local_6e8._6_2_,CONCAT24(local_6e8._4_2_,CONCAT22(local_6e8._2_2_,sVar255))
                        );
    uStack_d70 = CONCAT26(uStack_6e0._6_2_,
                          CONCAT24(uStack_6e0._4_2_,CONCAT22(uStack_6e0._2_2_,sVar298)));
    local_d58 = CONCAT26(in_stack_ffffffffffffdb7e,
                         CONCAT24(in_stack_ffffffffffffdb7c,
                                  CONCAT22(in_stack_ffffffffffffdb7a,in_stack_ffffffffffffdb78)));
    uStack_d50 = CONCAT26(in_stack_ffffffffffffdb86,
                          CONCAT24(in_stack_ffffffffffffdb84,
                                   CONCAT22(in_stack_ffffffffffffdb82,in_stack_ffffffffffffdb80)));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1370._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1370)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1370._2_1_,uVar16));
    uVar29 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1370._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1370._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1370._6_1_,uVar18));
    uVar36 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1370._7_1_,uVar19));
    local_d68._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_d68._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_d68._6_2_ = (short)((ulong)uVar29 >> 0x30);
    uStack_d60._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_d60._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_d60._6_2_ = (short)((ulong)uVar36 >> 0x30);
    local_d88 = in_stack_ffffffffffffdb78 + CONCAT11((char)uStack_1d90,(undefined1)uStack_1370);
    sStack_d86 = in_stack_ffffffffffffdb7a + local_d68._2_2_;
    sStack_d84 = in_stack_ffffffffffffdb7c + local_d68._4_2_;
    sStack_d82 = in_stack_ffffffffffffdb7e + local_d68._6_2_;
    sStack_d80 = in_stack_ffffffffffffdb80 + CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_);
    sStack_d7e = in_stack_ffffffffffffdb82 + uStack_d60._2_2_;
    sStack_d7c = in_stack_ffffffffffffdb84 + uStack_d60._4_2_;
    sStack_d7a = in_stack_ffffffffffffdb86 + uStack_d60._6_2_;
    local_1a08 = sVar255 + local_d88;
    uStack_1a06 = local_6e8._2_2_ + sStack_d86;
    uStack_1a04 = local_6e8._4_2_ + sStack_d84;
    uStack_1a02 = local_6e8._6_2_ + sStack_d82;
    uStack_1a00 = sVar298 + sStack_d80;
    uStack_19fe = uStack_6e0._2_2_ + sStack_d7e;
    uStack_19fc = uStack_6e0._4_2_ + sStack_d7c;
    uStack_19fa = uStack_6e0._6_2_ + sStack_d7a;
    local_1a0c = 3;
    uVar253 = local_1a08 >> 3;
    uVar268 = uStack_1a06 >> 3;
    uVar276 = uStack_1a04 >> 3;
    uVar286 = uStack_1a02 >> 3;
    uVar296 = uStack_1a00 >> 3;
    uVar310 = uStack_19fe >> 3;
    uVar319 = uStack_19fc >> 3;
    uVar329 = uStack_19fa >> 3;
    local_598 = CONCAT26(uVar285,CONCAT24(uVar275,CONCAT22(uVar267,uVar252)));
    uStack_590 = CONCAT26(uVar328,CONCAT24(uVar318,CONCAT22(uVar309,uVar295)));
    local_5a8 = CONCAT26(uVar286,CONCAT24(uVar276,CONCAT22(uVar268,uVar253)));
    uStack_5a0 = CONCAT26(uVar329,CONCAT24(uVar319,CONCAT22(uVar310,uVar296)));
    local_22e8 = CONCAT17((uVar328 != 0) * (uVar328 < 0x100) * (char)uVar328 - (0xff < uVar328),
                          CONCAT16((uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 -
                                   (0xff < uVar318),
                                   CONCAT15((uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 -
                                            (0xff < uVar309),
                                            CONCAT14((uVar295 != 0) * (uVar295 < 0x100) *
                                                     (char)uVar295 - (0xff < uVar295),
                                                     CONCAT13((uVar285 != 0) * (uVar285 < 0x100) *
                                                              (char)uVar285 - (0xff < uVar285),
                                                              CONCAT12((uVar275 != 0) *
                                                                       (uVar275 < 0x100) *
                                                                       (char)uVar275 -
                                                                       (0xff < uVar275),
                                                                       CONCAT11((uVar267 != 0) *
                                                                                (uVar267 < 0x100) *
                                                                                (char)uVar267 -
                                                                                (0xff < uVar267),
                                                                                (uVar252 != 0) *
                                                                                (uVar252 < 0x100) *
                                                                                (char)uVar252 -
                                                                                (0xff < uVar252)))))
                                           )));
    uStack_22e0 = CONCAT17((uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329),
                           CONCAT16((uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 -
                                    (0xff < uVar319),
                                    CONCAT15((uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 -
                                             (0xff < uVar310),
                                             CONCAT14((uVar296 != 0) * (uVar296 < 0x100) *
                                                      (char)uVar296 - (0xff < uVar296),
                                                      CONCAT13((uVar286 != 0) * (uVar286 < 0x100) *
                                                               (char)uVar286 - (0xff < uVar286),
                                                               CONCAT12((uVar276 != 0) *
                                                                        (uVar276 < 0x100) *
                                                                        (char)uVar276 -
                                                                        (0xff < uVar276),
                                                                        CONCAT11((uVar268 != 0) *
                                                                                 (uVar268 < 0x100) *
                                                                                 (char)uVar268 -
                                                                                 (0xff < uVar268),
                                                                                 (uVar253 != 0) *
                                                                                 (uVar253 < 0x100) *
                                                                                 (char)uVar253 -
                                                                                 (0xff < uVar253))))
                                                     ))));
    local_718 = CONCAT26(sVar284,CONCAT24(sVar274,CONCAT22(sVar266,sVar251)));
    uStack_710 = CONCAT26(sVar327,CONCAT24(sVar317,CONCAT22(sVar308,sVar294)));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1370._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1370)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1370._2_1_,uVar16));
    uVar30 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1370._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1370._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1370._6_1_,uVar18));
    uVar37 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1370._7_1_,uVar19));
    local_728._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_728._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_728._6_2_ = (short)((ulong)uVar30 >> 0x30);
    uStack_720._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_720._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_720._6_2_ = (short)((ulong)uVar37 >> 0x30);
    sVar251 = sVar251 - CONCAT11((char)uStack_1d90,(undefined1)uStack_1370);
    sVar294 = sVar294 - CONCAT11(uStack_1d90._4_1_,uStack_1370._4_1_);
    local_738 = CONCAT26(local_6e8._6_2_,CONCAT24(local_6e8._4_2_,CONCAT22(local_6e8._2_2_,sVar255))
                        );
    uStack_730 = CONCAT26(uStack_6e0._6_2_,
                          CONCAT24(uStack_6e0._4_2_,CONCAT22(uStack_6e0._2_2_,sVar298)));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_20a8._1_1_,CONCAT11((char)local_1d98,(undefined1)local_20a8)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_20a8._2_1_,uVar16));
    uVar78 = CONCAT17(local_1d98._3_1_,CONCAT16(local_20a8._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_20a8._5_1_,CONCAT11(local_1d98._4_1_,local_20a8._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_20a8._6_1_,uVar18));
    uVar83 = CONCAT17(local_1d98._7_1_,CONCAT16(local_20a8._7_1_,uVar19));
    local_748._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_748._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_748._6_2_ = (short)((ulong)uVar78 >> 0x30);
    uStack_740._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_740._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_740._6_2_ = (short)((ulong)uVar83 >> 0x30);
    sVar255 = sVar255 - CONCAT11((char)local_1d98,(undefined1)local_20a8);
    sVar298 = sVar298 - CONCAT11(local_1d98._4_1_,local_20a8._4_1_);
    local_d98 = CONCAT26(in_stack_ffffffffffffdb8e,
                         CONCAT24(in_stack_ffffffffffffdb8c,
                                  CONCAT22(in_stack_ffffffffffffdb8a,in_stack_ffffffffffffdb88)));
    uStack_d90 = CONCAT26(uStack_bd0._6_2_,
                          CONCAT24(uStack_bd0._4_2_,CONCAT22(uStack_bd0._2_2_,sStack_e00)));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2068._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2068)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2068._2_1_,uVar16));
    uVar94 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2068._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2068._5_1_,CONCAT11(local_1d98._4_1_,local_2068._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2068._6_1_,uVar18));
    uVar97 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2068._7_1_,uVar19));
    local_da8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_da8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_da8._6_2_ = (short)((ulong)uVar94 >> 0x30);
    uStack_da0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_da0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_da0._6_2_ = (short)((ulong)uVar97 >> 0x30);
    in_stack_ffffffffffffdb88 =
         in_stack_ffffffffffffdb88 + CONCAT11((char)local_1d98,(undefined1)local_2068);
    in_stack_ffffffffffffdb8a = in_stack_ffffffffffffdb8a + local_da8._2_2_;
    in_stack_ffffffffffffdb8c = in_stack_ffffffffffffdb8c + local_da8._4_2_;
    in_stack_ffffffffffffdb8e = in_stack_ffffffffffffdb8e + local_da8._6_2_;
    sStack_e00 = sStack_e00 + CONCAT11(local_1d98._4_1_,local_2068._4_1_);
    local_db8 = CONCAT26(in_stack_ffffffffffffdb7e,
                         CONCAT24(in_stack_ffffffffffffdb7c,
                                  CONCAT22(in_stack_ffffffffffffdb7a,in_stack_ffffffffffffdb78)));
    uStack_db0 = CONCAT26(in_stack_ffffffffffffdb86,
                          CONCAT24(in_stack_ffffffffffffdb84,
                                   CONCAT22(in_stack_ffffffffffffdb82,in_stack_ffffffffffffdb80)));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_13b0._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_13b0._2_1_,uVar16));
    uVar52 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_13b0._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_13b0._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_13b0._6_1_,uVar18));
    uVar55 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_13b0._7_1_,uVar19));
    local_dc8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_dc8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_dc8._6_2_ = (short)((ulong)uVar52 >> 0x30);
    uStack_dc0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_dc0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_dc0._6_2_ = (short)((ulong)uVar55 >> 0x30);
    in_stack_ffffffffffffdb78 =
         in_stack_ffffffffffffdb78 + CONCAT11((char)uStack_1d90,(undefined1)uStack_13b0);
    in_stack_ffffffffffffdb7a = in_stack_ffffffffffffdb7a + local_dc8._2_2_;
    in_stack_ffffffffffffdb7c = in_stack_ffffffffffffdb7c + local_dc8._4_2_;
    in_stack_ffffffffffffdb7e = in_stack_ffffffffffffdb7e + local_dc8._6_2_;
    in_stack_ffffffffffffdb80 =
         in_stack_ffffffffffffdb80 + CONCAT11(uStack_1d90._4_1_,uStack_13b0._4_1_);
    in_stack_ffffffffffffdb82 = in_stack_ffffffffffffdb82 + uStack_dc0._2_2_;
    in_stack_ffffffffffffdb84 = in_stack_ffffffffffffdb84 + uStack_dc0._4_2_;
    in_stack_ffffffffffffdb86 = in_stack_ffffffffffffdb86 + uStack_dc0._6_2_;
    local_df8 = CONCAT26(sVar284 - local_728._6_2_,
                         CONCAT24(sVar274 - local_728._4_2_,
                                  CONCAT22(sVar266 - local_728._2_2_,sVar251)));
    uStack_df0 = CONCAT26(sVar327 - uStack_720._6_2_,
                          CONCAT24(sVar317 - uStack_720._4_2_,
                                   CONCAT22(sVar308 - uStack_720._2_2_,sVar294)));
    local_dd8 = CONCAT26(in_stack_ffffffffffffdb8e,
                         CONCAT24(in_stack_ffffffffffffdb8c,
                                  CONCAT22(in_stack_ffffffffffffdb8a,in_stack_ffffffffffffdb88)));
    uStack_dd0 = CONCAT26(uStack_bd0._6_2_ + uStack_da0._6_2_,
                          CONCAT24(uStack_bd0._4_2_ + uStack_da0._4_2_,
                                   CONCAT22(uStack_bd0._2_2_ + uStack_da0._2_2_,sStack_e00)));
    uVar16 = CONCAT13(local_1d98._1_1_,
                      CONCAT12(local_2088._1_1_,CONCAT11((char)local_1d98,(undefined1)local_2088)));
    uVar17 = CONCAT15(local_1d98._2_1_,CONCAT14(local_2088._2_1_,uVar16));
    uVar87 = CONCAT17(local_1d98._3_1_,CONCAT16(local_2088._3_1_,uVar17));
    uVar18 = CONCAT13(local_1d98._5_1_,
                      CONCAT12(local_2088._5_1_,CONCAT11(local_1d98._4_1_,local_2088._4_1_)));
    uVar19 = CONCAT15(local_1d98._6_1_,CONCAT14(local_2088._6_1_,uVar18));
    uVar91 = CONCAT17(local_1d98._7_1_,CONCAT16(local_2088._7_1_,uVar19));
    local_de8._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_de8._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_de8._6_2_ = (short)((ulong)uVar87 >> 0x30);
    uStack_de0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_de0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_de0._6_2_ = (short)((ulong)uVar91 >> 0x30);
    local_e08 = in_stack_ffffffffffffdb88 + CONCAT11((char)local_1d98,(undefined1)local_2088);
    sStack_e06 = in_stack_ffffffffffffdb8a + local_de8._2_2_;
    sStack_e04 = in_stack_ffffffffffffdb8c + local_de8._4_2_;
    sStack_e02 = in_stack_ffffffffffffdb8e + local_de8._6_2_;
    sStack_e00 = sStack_e00 + CONCAT11(local_1d98._4_1_,local_2088._4_1_);
    sStack_dfe = uStack_bd0._2_2_ + uStack_da0._2_2_ + uStack_de0._2_2_;
    sStack_dfc = uStack_bd0._4_2_ + uStack_da0._4_2_ + uStack_de0._4_2_;
    sStack_dfa = uStack_bd0._6_2_ + uStack_da0._6_2_ + uStack_de0._6_2_;
    local_1a28 = sVar251 + local_e08;
    uStack_1a26 = (sVar266 - local_728._2_2_) + sStack_e06;
    uStack_1a24 = (sVar274 - local_728._4_2_) + sStack_e04;
    uStack_1a22 = (sVar284 - local_728._6_2_) + sStack_e02;
    uStack_1a20 = sVar294 + sStack_e00;
    uStack_1a1e = (sVar308 - uStack_720._2_2_) + sStack_dfe;
    uStack_1a1c = (sVar317 - uStack_720._4_2_) + sStack_dfc;
    uStack_1a1a = (sVar327 - uStack_720._6_2_) + sStack_dfa;
    local_1a2c = 3;
    in_stack_ffffffffffffdb68 = local_1a28 >> 3;
    in_stack_ffffffffffffdb6a = uStack_1a26 >> 3;
    in_stack_ffffffffffffdb6c = uStack_1a24 >> 3;
    in_stack_ffffffffffffdb6e = uStack_1a22 >> 3;
    in_stack_ffffffffffffdb70 = uStack_1a20 >> 3;
    in_stack_ffffffffffffdb72 = uStack_1a1e >> 3;
    in_stack_ffffffffffffdb74 = uStack_1a1c >> 3;
    in_stack_ffffffffffffdb76 = uStack_1a1a >> 3;
    local_e38 = CONCAT26(local_6e8._6_2_ - local_748._6_2_,
                         CONCAT24(local_6e8._4_2_ - local_748._4_2_,
                                  CONCAT22(local_6e8._2_2_ - local_748._2_2_,sVar255)));
    uStack_e30 = CONCAT26(uStack_6e0._6_2_ - uStack_740._6_2_,
                          CONCAT24(uStack_6e0._4_2_ - uStack_740._4_2_,
                                   CONCAT22(uStack_6e0._2_2_ - uStack_740._2_2_,sVar298)));
    local_e18 = CONCAT26(in_stack_ffffffffffffdb7e,
                         CONCAT24(in_stack_ffffffffffffdb7c,
                                  CONCAT22(in_stack_ffffffffffffdb7a,in_stack_ffffffffffffdb78)));
    uStack_e10 = CONCAT26(in_stack_ffffffffffffdb86,
                          CONCAT24(in_stack_ffffffffffffdb84,
                                   CONCAT22(in_stack_ffffffffffffdb82,in_stack_ffffffffffffdb80)));
    uVar16 = CONCAT13(uStack_1d90._1_1_,
                      CONCAT12(uStack_1390._1_1_,CONCAT11((char)uStack_1d90,(undefined1)uStack_1390)
                              ));
    uVar17 = CONCAT15(uStack_1d90._2_1_,CONCAT14(uStack_1390._2_1_,uVar16));
    uVar43 = CONCAT17(uStack_1d90._3_1_,CONCAT16(uStack_1390._3_1_,uVar17));
    uVar18 = CONCAT13(uStack_1d90._5_1_,
                      CONCAT12(uStack_1390._5_1_,CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_)));
    uVar19 = CONCAT15(uStack_1d90._6_1_,CONCAT14(uStack_1390._6_1_,uVar18));
    uVar49 = CONCAT17(uStack_1d90._7_1_,CONCAT16(uStack_1390._7_1_,uVar19));
    local_e28._2_2_ = (short)((uint)uVar16 >> 0x10);
    local_e28._4_2_ = (short)((uint6)uVar17 >> 0x20);
    local_e28._6_2_ = (short)((ulong)uVar43 >> 0x30);
    uStack_e20._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_e20._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_e20._6_2_ = (short)((ulong)uVar49 >> 0x30);
    local_e48 = in_stack_ffffffffffffdb78 + CONCAT11((char)uStack_1d90,(undefined1)uStack_1390);
    sStack_e46 = in_stack_ffffffffffffdb7a + local_e28._2_2_;
    sStack_e44 = in_stack_ffffffffffffdb7c + local_e28._4_2_;
    sStack_e42 = in_stack_ffffffffffffdb7e + local_e28._6_2_;
    sStack_e40 = in_stack_ffffffffffffdb80 + CONCAT11(uStack_1d90._4_1_,uStack_1390._4_1_);
    sStack_e3e = in_stack_ffffffffffffdb82 + uStack_e20._2_2_;
    sStack_e3c = in_stack_ffffffffffffdb84 + uStack_e20._4_2_;
    sStack_e3a = in_stack_ffffffffffffdb86 + uStack_e20._6_2_;
    local_1a48 = sVar255 + local_e48;
    uStack_1a46 = (local_6e8._2_2_ - local_748._2_2_) + sStack_e46;
    uStack_1a44 = (local_6e8._4_2_ - local_748._4_2_) + sStack_e44;
    uStack_1a42 = (local_6e8._6_2_ - local_748._6_2_) + sStack_e42;
    uStack_1a40 = sVar298 + sStack_e40;
    uStack_1a3e = (uStack_6e0._2_2_ - uStack_740._2_2_) + sStack_e3e;
    uStack_1a3c = (uStack_6e0._4_2_ - uStack_740._4_2_) + sStack_e3c;
    uStack_1a3a = (uStack_6e0._6_2_ - uStack_740._6_2_) + sStack_e3a;
    local_1a4c = 3;
    in_stack_ffffffffffffdb58 = local_1a48 >> 3;
    in_stack_ffffffffffffdb5a = uStack_1a46 >> 3;
    in_stack_ffffffffffffdb5c = uStack_1a44 >> 3;
    in_stack_ffffffffffffdb5e = uStack_1a42 >> 3;
    in_stack_ffffffffffffdb60 = uStack_1a40 >> 3;
    in_stack_ffffffffffffdb62 = uStack_1a3e >> 3;
    in_stack_ffffffffffffdb64 = uStack_1a3c >> 3;
    in_stack_ffffffffffffdb66 = uStack_1a3a >> 3;
    local_5b8 = CONCAT26(in_stack_ffffffffffffdb6e,
                         CONCAT24(in_stack_ffffffffffffdb6c,
                                  CONCAT22(in_stack_ffffffffffffdb6a,in_stack_ffffffffffffdb68)));
    uStack_5b0 = CONCAT26(in_stack_ffffffffffffdb76,
                          CONCAT24(in_stack_ffffffffffffdb74,
                                   CONCAT22(in_stack_ffffffffffffdb72,in_stack_ffffffffffffdb70)));
    local_5c8 = CONCAT26(in_stack_ffffffffffffdb5e,
                         CONCAT24(in_stack_ffffffffffffdb5c,
                                  CONCAT22(in_stack_ffffffffffffdb5a,in_stack_ffffffffffffdb58)));
    uStack_5c0 = CONCAT26(in_stack_ffffffffffffdb66,
                          CONCAT24(in_stack_ffffffffffffdb64,
                                   CONCAT22(in_stack_ffffffffffffdb62,in_stack_ffffffffffffdb60)));
    local_22d8 = CONCAT17((in_stack_ffffffffffffdb76 != 0) * (in_stack_ffffffffffffdb76 < 0x100) *
                          (char)in_stack_ffffffffffffdb76 - (0xff < in_stack_ffffffffffffdb76),
                          CONCAT16((in_stack_ffffffffffffdb74 != 0) *
                                   (in_stack_ffffffffffffdb74 < 0x100) *
                                   (char)in_stack_ffffffffffffdb74 -
                                   (0xff < in_stack_ffffffffffffdb74),
                                   CONCAT15((in_stack_ffffffffffffdb72 != 0) *
                                            (in_stack_ffffffffffffdb72 < 0x100) *
                                            (char)in_stack_ffffffffffffdb72 -
                                            (0xff < in_stack_ffffffffffffdb72),
                                            CONCAT14((in_stack_ffffffffffffdb70 != 0) *
                                                     (in_stack_ffffffffffffdb70 < 0x100) *
                                                     (char)in_stack_ffffffffffffdb70 -
                                                     (0xff < in_stack_ffffffffffffdb70),
                                                     CONCAT13((in_stack_ffffffffffffdb6e != 0) *
                                                              (in_stack_ffffffffffffdb6e < 0x100) *
                                                              (char)in_stack_ffffffffffffdb6e -
                                                              (0xff < in_stack_ffffffffffffdb6e),
                                                              CONCAT12((in_stack_ffffffffffffdb6c !=
                                                                       0) * (
                                                  in_stack_ffffffffffffdb6c < 0x100) *
                                                  (char)in_stack_ffffffffffffdb6c -
                                                  (0xff < in_stack_ffffffffffffdb6c),
                                                  CONCAT11((in_stack_ffffffffffffdb6a != 0) *
                                                           (in_stack_ffffffffffffdb6a < 0x100) *
                                                           (char)in_stack_ffffffffffffdb6a -
                                                           (0xff < in_stack_ffffffffffffdb6a),
                                                           (in_stack_ffffffffffffdb68 != 0) *
                                                           (in_stack_ffffffffffffdb68 < 0x100) *
                                                           (char)in_stack_ffffffffffffdb68 -
                                                           (0xff < in_stack_ffffffffffffdb68))))))))
    ;
    uStack_22d0 = CONCAT17((in_stack_ffffffffffffdb66 != 0) * (in_stack_ffffffffffffdb66 < 0x100) *
                           (char)in_stack_ffffffffffffdb66 - (0xff < in_stack_ffffffffffffdb66),
                           CONCAT16((in_stack_ffffffffffffdb64 != 0) *
                                    (in_stack_ffffffffffffdb64 < 0x100) *
                                    (char)in_stack_ffffffffffffdb64 -
                                    (0xff < in_stack_ffffffffffffdb64),
                                    CONCAT15((in_stack_ffffffffffffdb62 != 0) *
                                             (in_stack_ffffffffffffdb62 < 0x100) *
                                             (char)in_stack_ffffffffffffdb62 -
                                             (0xff < in_stack_ffffffffffffdb62),
                                             CONCAT14((in_stack_ffffffffffffdb60 != 0) *
                                                      (in_stack_ffffffffffffdb60 < 0x100) *
                                                      (char)in_stack_ffffffffffffdb60 -
                                                      (0xff < in_stack_ffffffffffffdb60),
                                                      CONCAT13((in_stack_ffffffffffffdb5e != 0) *
                                                               (in_stack_ffffffffffffdb5e < 0x100) *
                                                               (char)in_stack_ffffffffffffdb5e -
                                                               (0xff < in_stack_ffffffffffffdb5e),
                                                               CONCAT12((in_stack_ffffffffffffdb5c
                                                                        != 0) * (
                                                  in_stack_ffffffffffffdb5c < 0x100) *
                                                  (char)in_stack_ffffffffffffdb5c -
                                                  (0xff < in_stack_ffffffffffffdb5c),
                                                  CONCAT11((in_stack_ffffffffffffdb5a != 0) *
                                                           (in_stack_ffffffffffffdb5a < 0x100) *
                                                           (char)in_stack_ffffffffffffdb5a -
                                                           (0xff < in_stack_ffffffffffffdb5a),
                                                           (in_stack_ffffffffffffdb58 != 0) *
                                                           (in_stack_ffffffffffffdb58 < 0x100) *
                                                           (char)in_stack_ffffffffffffdb58 -
                                                           (0xff < in_stack_ffffffffffffdb58))))))))
    ;
    b_04[1]._0_2_ = uVar256;
    b_04[1]._2_6_ = 0;
    uVar245 = (ulong)uVar256;
    a_05[1] = (longlong)ppalVar246;
    a_05[0] = (longlong)puVar242;
    local_20c8 = uVar301;
    local_20a8 = uVar259;
    local_2088 = uVar258;
    local_2068 = uVar302;
    local_2048 = palVar8;
    local_2028 = palVar7;
    local_2008 = palVar303;
    uStack_1410 = palVar15;
    uStack_13f0 = palVar14;
    uStack_13d0 = palVar13;
    uStack_13b0 = uVar12;
    uStack_1390 = uVar11;
    uStack_1370 = uVar10;
    uStack_1350 = uVar9;
    local_e28 = uVar43;
    uStack_e20 = uVar49;
    local_de8 = uVar87;
    uStack_de0 = uVar91;
    local_dc8 = uVar52;
    uStack_dc0 = uVar55;
    local_da8 = uVar94;
    uStack_da0 = uVar97;
    local_d68 = uVar29;
    uStack_d60 = uVar36;
    local_d28 = uVar77;
    uStack_d20 = uVar82;
    local_cb8 = uVar28;
    uStack_cb0 = uVar35;
    local_ca8 = uVar41;
    uStack_ca0 = uVar47;
    local_c98 = uVar5;
    uStack_c90 = uVar23;
    local_c38 = uVar76;
    uStack_c30 = uVar81;
    local_c28 = uVar68;
    uStack_c20 = uVar73;
    local_c18 = uVar85;
    uStack_c10 = uVar89;
    local_bf8 = local_c08;
    uStack_bf0 = uStack_c00;
    local_bd8 = local_be8;
    uStack_bd0 = uStack_be0;
    local_bb8 = local_bc8;
    uStack_bb0 = uStack_bc0;
    local_b98 = local_ba8;
    uStack_b90 = uStack_ba0;
    local_b68 = uVar4;
    uStack_b60 = uVar22;
    local_b58 = uVar51;
    uStack_b50 = uVar54;
    local_b28 = uVar67;
    uStack_b20 = uVar72;
    local_b18 = uVar93;
    uStack_b10 = uVar96;
    local_ac8 = uVar27;
    uStack_ac0 = uVar34;
    local_ab8 = uVar66;
    uStack_ab0 = uVar71;
    local_aa8 = uVar3;
    uStack_aa0 = uVar21;
    local_a98 = uVar62;
    uStack_a90 = uVar63;
    local_a48 = uVar2;
    uStack_a40 = uVar20;
    local_a38 = uVar75;
    uStack_a30 = uVar80;
    local_a28 = uVar65;
    uStack_a20 = uVar70;
    local_a18 = uVar104;
    uStack_a10 = uVar105;
    local_958 = uVar1;
    uStack_950 = uVar6;
    local_948 = uVar24;
    uStack_940 = uVar31;
    local_938 = uVar38;
    uStack_930 = uVar44;
    local_8f8 = uVar64;
    uStack_8f0 = uVar69;
    local_8e8 = uVar74;
    uStack_8e0 = uVar79;
    local_8d8 = uVar84;
    uStack_8d0 = uVar88;
    local_8b8 = uVar58;
    uStack_8b0 = uVar60;
    local_8a8 = uVar50;
    uStack_8a0 = uVar53;
    local_898 = uVar56;
    uStack_890 = uVar57;
    local_878 = uVar100;
    uStack_870 = uVar102;
    local_868 = uVar92;
    uStack_860 = uVar95;
    local_858 = uVar98;
    uStack_850 = uVar99;
    local_748 = uVar78;
    uStack_740 = uVar83;
    local_728 = uVar30;
    uStack_720 = uVar37;
    local_708 = uVar42;
    uStack_700 = uVar48;
    local_6e8 = uVar86;
    uStack_6e0 = uVar90;
    local_6c8 = uVar59;
    uStack_6c0 = uVar61;
    local_6a8 = uVar101;
    uStack_6a0 = uVar103;
    local_78 = local_9b8;
    uStack_70 = uStack_9b0;
    local_58 = local_9f8;
    uStack_50 = uStack_9f0;
    alVar333 = abs_diff(a_05,b_04);
    b_05[0] = alVar333[1];
    b_05[1] = uVar245;
    a_06[1] = (longlong)ppalVar246;
    a_06[0] = (longlong)puVar242;
    alVar333 = abs_diff(a_06,b_05);
    b_06[0] = alVar333[1];
    local_1ca8 = (byte)extraout_XMM0_Qa_05;
    bStack_1ca7 = (byte)((ulong)extraout_XMM0_Qa_05 >> 8);
    bStack_1ca6 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x10);
    bStack_1ca5 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x18);
    bStack_1ca4 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x20);
    bStack_1ca3 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x28);
    bStack_1ca2 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x30);
    bStack_1ca1 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x38);
    bStack_1ca0 = (byte)extraout_XMM0_Qb_05;
    bStack_1c9f = (byte)((ulong)extraout_XMM0_Qb_05 >> 8);
    bStack_1c9e = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x10);
    bStack_1c9d = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x18);
    bStack_1c9c = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x20);
    bStack_1c9b = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x28);
    bStack_1c9a = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x30);
    bStack_1c99 = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x38);
    local_1cb8 = (byte)extraout_XMM0_Qa_06;
    bStack_1cb7 = (byte)((ulong)extraout_XMM0_Qa_06 >> 8);
    bStack_1cb6 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x10);
    bStack_1cb5 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x18);
    bStack_1cb4 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x20);
    bStack_1cb3 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x28);
    bStack_1cb2 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x30);
    bStack_1cb1 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x38);
    bStack_1cb0 = (byte)extraout_XMM0_Qb_06;
    bStack_1caf = (byte)((ulong)extraout_XMM0_Qb_06 >> 8);
    bStack_1cae = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x10);
    bStack_1cad = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x18);
    bStack_1cac = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x20);
    bStack_1cab = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x28);
    bStack_1caa = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x30);
    bStack_1ca9 = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x38);
    local_2198._1_1_ =
         (bStack_1ca7 < bStack_1cb7) * bStack_1cb7 | (bStack_1ca7 >= bStack_1cb7) * bStack_1ca7;
    local_2198._0_1_ =
         (local_1ca8 < local_1cb8) * local_1cb8 | (local_1ca8 >= local_1cb8) * local_1ca8;
    local_2198._2_1_ =
         (bStack_1ca6 < bStack_1cb6) * bStack_1cb6 | (bStack_1ca6 >= bStack_1cb6) * bStack_1ca6;
    local_2198._3_1_ =
         (bStack_1ca5 < bStack_1cb5) * bStack_1cb5 | (bStack_1ca5 >= bStack_1cb5) * bStack_1ca5;
    local_2198._4_1_ =
         (bStack_1ca4 < bStack_1cb4) * bStack_1cb4 | (bStack_1ca4 >= bStack_1cb4) * bStack_1ca4;
    local_2198._5_1_ =
         (bStack_1ca3 < bStack_1cb3) * bStack_1cb3 | (bStack_1ca3 >= bStack_1cb3) * bStack_1ca3;
    local_2198._6_1_ =
         (bStack_1ca2 < bStack_1cb2) * bStack_1cb2 | (bStack_1ca2 >= bStack_1cb2) * bStack_1ca2;
    local_2198._7_1_ =
         (bStack_1ca1 < bStack_1cb1) * bStack_1cb1 | (bStack_1ca1 >= bStack_1cb1) * bStack_1ca1;
    uStack_2190._0_1_ =
         (bStack_1ca0 < bStack_1cb0) * bStack_1cb0 | (bStack_1ca0 >= bStack_1cb0) * bStack_1ca0;
    uStack_2190._1_1_ =
         (bStack_1c9f < bStack_1caf) * bStack_1caf | (bStack_1c9f >= bStack_1caf) * bStack_1c9f;
    uStack_2190._2_1_ =
         (bStack_1c9e < bStack_1cae) * bStack_1cae | (bStack_1c9e >= bStack_1cae) * bStack_1c9e;
    uStack_2190._3_1_ =
         (bStack_1c9d < bStack_1cad) * bStack_1cad | (bStack_1c9d >= bStack_1cad) * bStack_1c9d;
    uStack_2190._4_1_ =
         (bStack_1c9c < bStack_1cac) * bStack_1cac | (bStack_1c9c >= bStack_1cac) * bStack_1c9c;
    uStack_2190._5_1_ =
         (bStack_1c9b < bStack_1cab) * bStack_1cab | (bStack_1c9b >= bStack_1cab) * bStack_1c9b;
    uStack_2190._6_1_ =
         (bStack_1c9a < bStack_1caa) * bStack_1caa | (bStack_1c9a >= bStack_1caa) * bStack_1c9a;
    uStack_2190._7_1_ =
         (bStack_1c99 < bStack_1ca9) * bStack_1ca9 | (bStack_1c99 >= bStack_1ca9) * bStack_1c99;
    b_06[1] = uVar245;
    a_07[1] = (longlong)ppalVar246;
    a_07[0] = (longlong)puVar242;
    abs_diff(a_07,b_06);
    puVar129 = local_2110;
    local_1cd8 = local_2198;
    uVar5 = local_1cd8;
    uStack_1cd0 = uStack_2190;
    uVar6 = uStack_1cd0;
    local_1cc8 = (byte)extraout_XMM0_Qa_07;
    bStack_1cc7 = (byte)((ulong)extraout_XMM0_Qa_07 >> 8);
    bStack_1cc6 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x10);
    bStack_1cc5 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x18);
    bStack_1cc4 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x20);
    bStack_1cc3 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x28);
    bStack_1cc2 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x30);
    bStack_1cc1 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x38);
    bStack_1cc0 = (byte)extraout_XMM0_Qb_07;
    bStack_1cbf = (byte)((ulong)extraout_XMM0_Qb_07 >> 8);
    bStack_1cbe = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x10);
    bStack_1cbd = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x18);
    bStack_1cbc = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x20);
    bStack_1cbb = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x28);
    bStack_1cba = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x30);
    bStack_1cb9 = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x38);
    local_1cd8._0_1_ = (byte)local_2198;
    local_1cd8._1_1_ = local_2198._1_1_;
    local_1cd8._2_1_ = local_2198._2_1_;
    local_1cd8._3_1_ = local_2198._3_1_;
    local_1cd8._4_1_ = local_2198._4_1_;
    local_1cd8._5_1_ = local_2198._5_1_;
    local_1cd8._6_1_ = local_2198._6_1_;
    local_1cd8._7_1_ = local_2198._7_1_;
    uStack_1cd0._0_1_ = local_2198._8_1_;
    uStack_1cd0._1_1_ = local_2198._9_1_;
    uStack_1cd0._2_1_ = local_2198._10_1_;
    uStack_1cd0._3_1_ = local_2198._11_1_;
    uStack_1cd0._4_1_ = local_2198._12_1_;
    uStack_1cd0._5_1_ = local_2198._13_1_;
    uStack_1cd0._6_1_ = local_2198._14_1_;
    uStack_1cd0._7_1_ = local_2198._15_1_;
    bVar247 = (local_1cc8 < (byte)local_1cd8) * (byte)local_1cd8 |
              (local_1cc8 >= (byte)local_1cd8) * local_1cc8;
    bVar262 = (bStack_1cc7 < local_1cd8._1_1_) * local_1cd8._1_1_ |
              (bStack_1cc7 >= local_1cd8._1_1_) * bStack_1cc7;
    bVar263 = (bStack_1cc6 < local_1cd8._2_1_) * local_1cd8._2_1_ |
              (bStack_1cc6 >= local_1cd8._2_1_) * bStack_1cc6;
    bVar270 = (bStack_1cc5 < local_1cd8._3_1_) * local_1cd8._3_1_ |
              (bStack_1cc5 >= local_1cd8._3_1_) * bStack_1cc5;
    bVar271 = (bStack_1cc4 < local_1cd8._4_1_) * local_1cd8._4_1_ |
              (bStack_1cc4 >= local_1cd8._4_1_) * bStack_1cc4;
    bVar280 = (bStack_1cc3 < local_1cd8._5_1_) * local_1cd8._5_1_ |
              (bStack_1cc3 >= local_1cd8._5_1_) * bStack_1cc3;
    bVar281 = (bStack_1cc2 < local_1cd8._6_1_) * local_1cd8._6_1_ |
              (bStack_1cc2 >= local_1cd8._6_1_) * bStack_1cc2;
    bVar289 = (bStack_1cc1 < local_1cd8._7_1_) * local_1cd8._7_1_ |
              (bStack_1cc1 >= local_1cd8._7_1_) * bStack_1cc1;
    bVar290 = (bStack_1cc0 < (byte)uStack_1cd0) * (byte)uStack_1cd0 |
              (bStack_1cc0 >= (byte)uStack_1cd0) * bStack_1cc0;
    bVar304 = (bStack_1cbf < uStack_1cd0._1_1_) * uStack_1cd0._1_1_ |
              (bStack_1cbf >= uStack_1cd0._1_1_) * bStack_1cbf;
    bVar305 = (bStack_1cbe < uStack_1cd0._2_1_) * uStack_1cd0._2_1_ |
              (bStack_1cbe >= uStack_1cd0._2_1_) * bStack_1cbe;
    bVar313 = (bStack_1cbd < uStack_1cd0._3_1_) * uStack_1cd0._3_1_ |
              (bStack_1cbd >= uStack_1cd0._3_1_) * bStack_1cbd;
    bVar314 = (bStack_1cbc < uStack_1cd0._4_1_) * uStack_1cd0._4_1_ |
              (bStack_1cbc >= uStack_1cd0._4_1_) * bStack_1cbc;
    bVar323 = (bStack_1cbb < uStack_1cd0._5_1_) * uStack_1cd0._5_1_ |
              (bStack_1cbb >= uStack_1cd0._5_1_) * bStack_1cbb;
    bVar324 = (bStack_1cba < uStack_1cd0._6_1_) * uStack_1cd0._6_1_ |
              (bStack_1cba >= uStack_1cd0._6_1_) * bStack_1cba;
    bVar332 = (bStack_1cb9 < uStack_1cd0._7_1_) * uStack_1cd0._7_1_ |
              (bStack_1cb9 >= uStack_1cd0._7_1_) * bStack_1cb9;
    local_2198._0_2_ = CONCAT11(bVar262,bVar247);
    local_2198._0_3_ = CONCAT12(bVar263,(undefined2)local_2198);
    local_2198._0_4_ = CONCAT13(bVar270,(undefined3)local_2198);
    local_2198._0_5_ = CONCAT14(bVar271,(undefined4)local_2198);
    local_2198._0_6_ = CONCAT15(bVar280,(undefined5)local_2198);
    local_2198._0_7_ = CONCAT16(bVar281,(undefined6)local_2198);
    local_2198 = CONCAT17(bVar289,(undefined7)local_2198);
    uStack_2190._0_1_ = bVar290;
    uStack_2190._1_1_ = bVar304;
    uStack_2190._2_1_ = bVar305;
    uStack_2190._3_1_ = bVar313;
    uStack_2190._4_1_ = bVar314;
    uStack_2190._5_1_ = bVar323;
    uStack_2190._6_1_ = bVar324;
    uStack_2190._7_1_ = bVar332;
    local_1ce8 = local_2198;
    uStack_1ce0 = uStack_2190;
    local_1cf8 = uStack_2190;
    uStack_1cf0 = 0;
    local_2198._0_2_ =
         CONCAT11((bVar262 < bVar304) * bVar304 | (bVar262 >= bVar304) * bVar262,
                  (bVar247 < bVar290) * bVar290 | (bVar247 >= bVar290) * bVar247);
    local_2198._0_3_ =
         CONCAT12((bVar263 < bVar305) * bVar305 | (bVar263 >= bVar305) * bVar263,
                  (undefined2)local_2198);
    local_2198._0_4_ =
         CONCAT13((bVar270 < bVar313) * bVar313 | (bVar270 >= bVar313) * bVar270,
                  (undefined3)local_2198);
    local_2198._0_5_ =
         CONCAT14((bVar271 < bVar314) * bVar314 | (bVar271 >= bVar314) * bVar271,
                  (undefined4)local_2198);
    local_2198._0_6_ =
         CONCAT15((bVar280 < bVar323) * bVar323 | (bVar280 >= bVar323) * bVar280,
                  (undefined5)local_2198);
    local_2198._0_7_ =
         CONCAT16((bVar281 < bVar324) * bVar324 | (bVar281 >= bVar324) * bVar281,
                  (undefined6)local_2198);
    local_2198 = CONCAT17((bVar289 < bVar332) * bVar332 | (bVar289 >= bVar332) * bVar289,
                          (undefined7)local_2198);
    local_1768 = local_2198;
    uStack_1760 = uStack_2190;
    local_1778 = local_2158;
    uStack_1770 = uStack_2150;
    auVar108._8_8_ = uStack_2190;
    auVar108._0_8_ = local_2198;
    auVar107._8_8_ = uStack_2150;
    auVar107._0_8_ = local_2158;
    auVar260 = psubusb(auVar108,auVar107);
    local_2198 = auVar260._0_8_;
    uStack_2190 = auVar260._8_8_;
    local_1dc8 = local_2198;
    uVar3 = local_1dc8;
    uStack_1dc0 = uStack_2190;
    uVar4 = uStack_1dc0;
    local_1dd8 = local_2148;
    uVar1 = local_1dd8;
    uStack_1dd0 = uStack_2140;
    uVar2 = uStack_1dd0;
    local_1dc8._0_1_ = auVar260[0];
    local_1dc8._1_1_ = auVar260[1];
    local_1dc8._2_1_ = auVar260[2];
    local_1dc8._3_1_ = auVar260[3];
    local_1dc8._4_1_ = auVar260[4];
    local_1dc8._5_1_ = auVar260[5];
    local_1dc8._6_1_ = auVar260[6];
    local_1dc8._7_1_ = auVar260[7];
    uStack_1dc0._0_1_ = auVar260[8];
    uStack_1dc0._1_1_ = auVar260[9];
    uStack_1dc0._2_1_ = auVar260[10];
    uStack_1dc0._3_1_ = auVar260[0xb];
    uStack_1dc0._4_1_ = auVar260[0xc];
    uStack_1dc0._5_1_ = auVar260[0xd];
    uStack_1dc0._6_1_ = auVar260[0xe];
    uStack_1dc0._7_1_ = auVar260[0xf];
    local_1dd8._0_1_ = (char)local_2148;
    local_1dd8._1_1_ = (char)((ulong)local_2148 >> 8);
    local_1dd8._2_1_ = (char)((ulong)local_2148 >> 0x10);
    local_1dd8._3_1_ = (char)((ulong)local_2148 >> 0x18);
    local_1dd8._4_1_ = (char)((ulong)local_2148 >> 0x20);
    local_1dd8._5_1_ = (char)((ulong)local_2148 >> 0x28);
    local_1dd8._6_1_ = (char)((ulong)local_2148 >> 0x30);
    local_1dd8._7_1_ = (char)((ulong)local_2148 >> 0x38);
    uStack_1dd0._0_1_ = (char)uStack_2140;
    uStack_1dd0._1_1_ = (char)((ulong)uStack_2140 >> 8);
    uStack_1dd0._2_1_ = (char)((ulong)uStack_2140 >> 0x10);
    uStack_1dd0._3_1_ = (char)((ulong)uStack_2140 >> 0x18);
    uStack_1dd0._4_1_ = (char)((ulong)uStack_2140 >> 0x20);
    uStack_1dd0._5_1_ = (char)((ulong)uStack_2140 >> 0x28);
    uStack_1dd0._6_1_ = (char)((ulong)uStack_2140 >> 0x30);
    uStack_1dd0._7_1_ = (char)((ulong)uStack_2140 >> 0x38);
    local_2198._0_2_ =
         CONCAT11(-(local_1dc8._1_1_ == local_1dd8._1_1_),-((char)local_1dc8 == (char)local_1dd8));
    local_2198._0_3_ = CONCAT12(-(local_1dc8._2_1_ == local_1dd8._2_1_),(undefined2)local_2198);
    local_2198._0_4_ = CONCAT13(-(local_1dc8._3_1_ == local_1dd8._3_1_),(undefined3)local_2198);
    local_2198._0_5_ = CONCAT14(-(local_1dc8._4_1_ == local_1dd8._4_1_),(undefined4)local_2198);
    local_2198._0_6_ = CONCAT15(-(local_1dc8._5_1_ == local_1dd8._5_1_),(undefined5)local_2198);
    local_2198._0_7_ = CONCAT16(-(local_1dc8._6_1_ == local_1dd8._6_1_),(undefined6)local_2198);
    local_2198 = CONCAT17(-(local_1dc8._7_1_ == local_1dd8._7_1_),(undefined7)local_2198);
    uStack_2190._0_1_ = -((char)uStack_1dc0 == (char)uStack_1dd0);
    uStack_2190._1_1_ = -(uStack_1dc0._1_1_ == uStack_1dd0._1_1_);
    uStack_2190._2_1_ = -(uStack_1dc0._2_1_ == uStack_1dd0._2_1_);
    uStack_2190._3_1_ = -(uStack_1dc0._3_1_ == uStack_1dd0._3_1_);
    uStack_2190._4_1_ = -(uStack_1dc0._4_1_ == uStack_1dd0._4_1_);
    uStack_2190._5_1_ = -(uStack_1dc0._5_1_ == uStack_1dd0._5_1_);
    uStack_2190._6_1_ = -(uStack_1dc0._6_1_ == uStack_1dd0._6_1_);
    uStack_2190._7_1_ = -(uStack_1dc0._7_1_ == uStack_1dd0._7_1_);
    local_17c8 = local_2198;
    uStack_17c0 = uStack_2190;
    local_17d8 = local_2188;
    uStack_17d0 = uStack_2180;
    uStack_2190 = uStack_2190 & uStack_2180;
    local_2198 = local_2198 & local_2188;
    local_1fc8 = local_2188;
    uStack_1fc0 = uStack_2180;
    local_1fd8 = local_2188;
    uStack_1fd0 = uStack_2180;
    uStack_2180 = local_2188;
    local_1458 = *local_2110;
    uStack_1450 = local_2110[1];
    local_1448 = local_2188;
    uStack_1440 = local_2188;
    uVar302 = ~local_2188 & uStack_1450;
    local_1dd8 = uVar1;
    uStack_1dd0 = uVar2;
    local_1dc8 = uVar3;
    uStack_1dc0 = uVar4;
    local_1cd8 = uVar5;
    uStack_1cd0 = uVar6;
    *local_2110 = ~local_2188 & local_1458;
    puVar129[1] = uVar302;
    puVar129 = local_2110;
    local_17e8 = local_2188;
    uStack_17e0 = uStack_2180;
    local_17f8 = local_22d8;
    uStack_17f0 = uStack_22d0;
    local_1578 = local_2188 & local_22d8;
    uStack_1570 = uStack_2180 & uStack_22d0;
    local_1568 = *local_2110;
    uStack_1560 = local_2110[1];
    uVar302 = uStack_1560 | uStack_1570;
    *local_2110 = local_1568 | local_1578;
    puVar129[1] = uVar302;
    puVar129 = local_2118;
    local_1468 = local_2188;
    uStack_1460 = uStack_2180;
    local_1478 = local_21b8;
    uStack_1470 = uStack_21b0;
    local_21b8 = ~local_2188 & local_21b8;
    uStack_21b0 = ~uStack_2180 & uStack_21b0;
    local_1808 = local_2188;
    uStack_1800 = uStack_2180;
    local_1818 = local_22e8;
    uStack_1810 = uStack_22e0;
    local_1598 = local_2188 & local_22e8;
    uStack_1590 = uStack_2180 & uStack_22e0;
    uVar302 = uStack_21b0 | uStack_1590;
    local_1588 = local_21b8;
    uStack_1580 = uStack_21b0;
    *local_2118 = local_21b8 | local_1598;
    puVar129[1] = uVar302;
    puVar129 = local_2120;
    local_1488 = local_2188;
    uStack_1480 = uStack_2180;
    local_1498 = local_21a8;
    uStack_1490 = uStack_21a0;
    local_21a8 = ~local_2188 & local_21a8;
    uStack_21a0 = ~uStack_2180 & uStack_21a0;
    local_1828 = local_2188;
    uStack_1820 = uStack_2180;
    local_1838 = local_22f8;
    uStack_1830 = uStack_22f0;
    local_15b8 = local_2188 & local_22f8;
    uStack_15b0 = uStack_2180 & uStack_22f0;
    uVar302 = uStack_21a0 | uStack_15b0;
    local_15a8 = local_21a8;
    uStack_15a0 = uStack_21a0;
    *local_2120 = local_21a8 | local_15b8;
    puVar129[1] = uVar302;
    ppalVar246 = local_20f8;
    local_1de8 = local_2198;
    uVar302 = local_1de8;
    uStack_1de0 = uStack_2190;
    uVar3 = uStack_1de0;
    local_1df8 = local_2148;
    uVar1 = local_1df8;
    uStack_1df0 = uStack_2140;
    uVar2 = uStack_1df0;
    local_1de8._0_1_ = (char)local_2198;
    local_1de8._1_1_ = local_2198._1_1_;
    local_1de8._2_1_ = local_2198._2_1_;
    local_1de8._3_1_ = local_2198._3_1_;
    local_1de8._4_1_ = local_2198._4_1_;
    local_1de8._5_1_ = local_2198._5_1_;
    local_1de8._6_1_ = local_2198._6_1_;
    local_1de8._7_1_ = local_2198._7_1_;
    uStack_1de0._0_1_ = local_2198._8_1_;
    uStack_1de0._1_1_ = local_2198._9_1_;
    uStack_1de0._2_1_ = local_2198._10_1_;
    uStack_1de0._3_1_ = local_2198._11_1_;
    uStack_1de0._4_1_ = local_2198._12_1_;
    uStack_1de0._5_1_ = local_2198._13_1_;
    uStack_1de0._6_1_ = local_2198._14_1_;
    uStack_1de0._7_1_ = local_2198._15_1_;
    local_1df8._0_1_ = (char)local_2148;
    local_1df8._1_1_ = (char)((ulong)local_2148 >> 8);
    local_1df8._2_1_ = (char)((ulong)local_2148 >> 0x10);
    local_1df8._3_1_ = (char)((ulong)local_2148 >> 0x18);
    local_1df8._4_1_ = (char)((ulong)local_2148 >> 0x20);
    local_1df8._5_1_ = (char)((ulong)local_2148 >> 0x28);
    local_1df8._6_1_ = (char)((ulong)local_2148 >> 0x30);
    local_1df8._7_1_ = (char)((ulong)local_2148 >> 0x38);
    uStack_1df0._0_1_ = (char)uStack_2140;
    uStack_1df0._1_1_ = (char)((ulong)uStack_2140 >> 8);
    uStack_1df0._2_1_ = (char)((ulong)uStack_2140 >> 0x10);
    uStack_1df0._3_1_ = (char)((ulong)uStack_2140 >> 0x18);
    uStack_1df0._4_1_ = (char)((ulong)uStack_2140 >> 0x20);
    uStack_1df0._5_1_ = (char)((ulong)uStack_2140 >> 0x28);
    uStack_1df0._6_1_ = (char)((ulong)uStack_2140 >> 0x30);
    uStack_1df0._7_1_ = (char)((ulong)uStack_2140 >> 0x38);
    local_1698 = -((char)local_1de8 == (char)local_1df8);
    cStack_1697 = -(local_1de8._1_1_ == local_1df8._1_1_);
    cStack_1696 = -(local_1de8._2_1_ == local_1df8._2_1_);
    cStack_1695 = -(local_1de8._3_1_ == local_1df8._3_1_);
    cStack_1694 = -(local_1de8._4_1_ == local_1df8._4_1_);
    cStack_1693 = -(local_1de8._5_1_ == local_1df8._5_1_);
    cStack_1692 = -(local_1de8._6_1_ == local_1df8._6_1_);
    cStack_1691 = -(local_1de8._7_1_ == local_1df8._7_1_);
    cStack_1690 = -((char)uStack_1de0 == (char)uStack_1df0);
    cStack_168f = -(uStack_1de0._1_1_ == uStack_1df0._1_1_);
    cStack_168e = -(uStack_1de0._2_1_ == uStack_1df0._2_1_);
    cStack_168d = -(uStack_1de0._3_1_ == uStack_1df0._3_1_);
    cStack_168c = -(uStack_1de0._4_1_ == uStack_1df0._4_1_);
    cStack_168b = -(uStack_1de0._5_1_ == uStack_1df0._5_1_);
    cStack_168a = -(uStack_1de0._6_1_ == uStack_1df0._6_1_);
    bStack_1689 = -(uStack_1de0._7_1_ == uStack_1df0._7_1_);
    auVar113[1] = cStack_1697;
    auVar113[0] = local_1698;
    auVar113[2] = cStack_1696;
    auVar113[3] = cStack_1695;
    auVar113[4] = cStack_1694;
    auVar113[5] = cStack_1693;
    auVar113[6] = cStack_1692;
    auVar113[7] = cStack_1691;
    auVar113[8] = cStack_1690;
    auVar113[9] = cStack_168f;
    auVar113[10] = cStack_168e;
    auVar113[0xb] = cStack_168d;
    auVar113[0xc] = cStack_168c;
    auVar113[0xd] = cStack_168b;
    auVar113[0xe] = cStack_168a;
    auVar113[0xf] = bStack_1689;
    local_1df8 = uVar1;
    uStack_1df0 = uVar2;
    local_1de8 = uVar302;
    uStack_1de0 = uVar3;
    if ((ushort)((ushort)(SUB161(auVar113 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar113 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar113 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar113 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar113 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar113 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar113 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar113 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar113 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar113 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar113 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar113 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar113 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar113 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar113 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_1689 >> 7) << 0xf
                ) != 0xffff) {
      local_758 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
      uStack_750 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar211,CONCAT11(cVar186,uVar210)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar212,uVar16));
      uVar36 = CONCAT17(cVar189,CONCAT16(uVar213,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar215,CONCAT11(cVar190,uVar214)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar216,uVar18));
      uVar42 = CONCAT17(cVar193,CONCAT16(uVar217,uVar19));
      local_768._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_768._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_768._6_2_ = (short)((ulong)uVar36 >> 0x30);
      uStack_760._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_760._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_760._6_2_ = (short)((ulong)uVar42 >> 0x30);
      sVar250 = sVar250 - CONCAT11(cVar186,uVar210);
      sVar265 = sVar265 - local_768._2_2_;
      sVar273 = sVar273 - local_768._4_2_;
      sVar283 = sVar283 - local_768._6_2_;
      sVar293 = sVar293 - CONCAT11(cVar190,uVar214);
      sVar307 = sVar307 - uStack_760._2_2_;
      sVar316 = sVar316 - uStack_760._4_2_;
      sVar326 = sVar326 - uStack_760._6_2_;
      local_778 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
      uStack_770 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar155,CONCAT11(cVar178,uVar154)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar156,uVar16));
      uVar80 = CONCAT17(cVar181,CONCAT16(uVar157,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar159,CONCAT11(cVar182,uVar158)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar160,uVar18));
      uVar84 = CONCAT17(cVar185,CONCAT16(uVar161,uVar19));
      local_788._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_788._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_788._6_2_ = (short)((ulong)uVar80 >> 0x30);
      uStack_780._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_780._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_780._6_2_ = (short)((ulong)uVar84 >> 0x30);
      sVar254 = sVar254 - CONCAT11(cVar178,uVar154);
      sVar269 = sVar269 - local_788._2_2_;
      sVar277 = sVar277 - local_788._4_2_;
      sVar287 = sVar287 - local_788._6_2_;
      sVar297 = sVar297 - CONCAT11(cVar182,uVar158);
      sVar311 = sVar311 - uStack_780._2_2_;
      sVar320 = sVar320 - uStack_780._4_2_;
      sVar330 = sVar330 - uStack_780._6_2_;
      local_e58 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
      uStack_e50 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar171,CONCAT11(cVar178,uVar170)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar172,uVar16));
      uVar92 = CONCAT17(cVar181,CONCAT16(uVar173,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar175,CONCAT11(cVar182,uVar174)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar176,uVar18));
      uVar97 = CONCAT17(cVar185,CONCAT16(uVar177,uVar19));
      local_e68._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_e68._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_e68._6_2_ = (short)((ulong)uVar92 >> 0x30);
      uStack_e60._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_e60._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_e60._6_2_ = (short)((ulong)uVar97 >> 0x30);
      sVar249 = sVar249 + CONCAT11(cVar178,uVar170);
      sVar248 = sVar248 + local_e68._2_2_;
      sVar264 = sVar264 + local_e68._4_2_;
      sVar272 = sVar272 + local_e68._6_2_;
      sVar282 = sVar282 + CONCAT11(cVar182,uVar174);
      sVar292 = sVar292 + uStack_e60._2_2_;
      sVar291 = sVar291 + uStack_e60._4_2_;
      sVar306 = sVar306 + uStack_e60._6_2_;
      local_e78 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
      uStack_e70 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar195,CONCAT11(cVar186,uVar194)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar196,uVar16));
      uVar52 = CONCAT17(cVar189,CONCAT16(uVar197,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar199,CONCAT11(cVar190,uVar198)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar200,uVar18));
      uVar57 = CONCAT17(cVar193,CONCAT16(uVar201,uVar19));
      local_e88._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_e88._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_e88._6_2_ = (short)((ulong)uVar52 >> 0x30);
      uStack_e80._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_e80._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_e80._6_2_ = (short)((ulong)uVar57 >> 0x30);
      sVar315 = sVar315 + CONCAT11(cVar186,uVar194);
      sVar325 = sVar325 + local_e88._2_2_;
      sVar278 = sVar278 + local_e88._4_2_;
      sVar288 = sVar288 + local_e88._6_2_;
      sVar299 = sVar299 + CONCAT11(cVar190,uVar198);
      sVar312 = sVar312 + uStack_e80._2_2_;
      sVar321 = sVar321 + uStack_e80._4_2_;
      sVar331 = sVar331 + uStack_e80._6_2_;
      local_ef8 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
      uStack_ef0 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
      local_ed8 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
      uStack_ed0 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
      uVar25 = CONCAT13(cVar179,CONCAT12(uVar139,CONCAT11(cVar178,uVar138)));
      uVar26 = CONCAT15(cVar180,CONCAT14(uVar140,uVar25));
      uVar66 = CONCAT17(cVar181,CONCAT16(uVar141,uVar26));
      uVar32 = CONCAT13(cVar183,CONCAT12(uVar143,CONCAT11(cVar182,uVar142)));
      uVar33 = CONCAT15(cVar184,CONCAT14(uVar144,uVar32));
      uVar69 = CONCAT17(cVar185,CONCAT16(uVar145,uVar33));
      uVar39 = CONCAT13(cVar179,CONCAT12(uVar147,CONCAT11(cVar178,uVar146)));
      uVar40 = CONCAT15(cVar180,CONCAT14(uVar148,uVar39));
      uVar72 = CONCAT17(cVar181,CONCAT16(uVar149,uVar40));
      uVar45 = CONCAT13(cVar183,CONCAT12(uVar151,CONCAT11(cVar182,uVar150)));
      uVar46 = CONCAT15(cVar184,CONCAT14(uVar152,uVar45));
      uVar76 = CONCAT17(cVar185,CONCAT16(uVar153,uVar46));
      local_ec8 = CONCAT11(cVar178,uVar130);
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar131,local_ec8));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar132,uVar16));
      uVar62 = CONCAT17(cVar181,CONCAT16(uVar133,uVar17));
      sStack_ec0 = CONCAT11(cVar182,uVar134);
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar135,sStack_ec0));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar136,uVar18));
      uVar64 = CONCAT17(cVar185,CONCAT16(uVar137,uVar19));
      local_e98._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_e98._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_e98._6_2_ = (short)((ulong)uVar72 >> 0x30);
      uStack_e90._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_e90._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_e90._6_2_ = (short)((ulong)uVar76 >> 0x30);
      local_ea8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_ea8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_ea8._6_2_ = (short)((ulong)uVar62 >> 0x30);
      uStack_ea0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_ea0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_ea0._6_2_ = (short)((ulong)uVar64 >> 0x30);
      local_ec8 = CONCAT11(cVar178,uVar146) + local_ec8;
      sStack_ec6 = local_e98._2_2_ + local_ea8._2_2_;
      sStack_ec4 = local_e98._4_2_ + local_ea8._4_2_;
      sStack_ec2 = local_e98._6_2_ + local_ea8._6_2_;
      sStack_ec0 = CONCAT11(cVar182,uVar150) + sStack_ec0;
      sStack_ebe = uStack_e90._2_2_ + uStack_ea0._2_2_;
      sStack_ebc = uStack_e90._4_2_ + uStack_ea0._4_2_;
      sStack_eba = uStack_e90._6_2_ + uStack_ea0._6_2_;
      local_eb8._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_eb8._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_eb8._6_2_ = (short)((ulong)uVar66 >> 0x30);
      uStack_eb0._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_eb0._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_eb0._6_2_ = (short)((ulong)uVar69 >> 0x30);
      local_ee8 = CONCAT11(cVar178,uVar138) + local_ec8;
      sStack_ee6 = local_eb8._2_2_ + sStack_ec6;
      sStack_ee4 = local_eb8._4_2_ + sStack_ec4;
      sStack_ee2 = local_eb8._6_2_ + sStack_ec2;
      sStack_ee0 = CONCAT11(cVar182,uVar142) + sStack_ec0;
      sStack_ede = uStack_eb0._2_2_ + sStack_ebe;
      sStack_edc = uStack_eb0._4_2_ + sStack_ebc;
      sStack_eda = uStack_eb0._6_2_ + sStack_eba;
      local_f08 = sVar249 + local_ee8;
      sStack_f06 = sVar248 + sStack_ee6;
      sStack_f04 = sVar264 + sStack_ee4;
      sStack_f02 = sVar272 + sStack_ee2;
      sStack_f00 = sVar282 + sStack_ee0;
      sStack_efe = sVar292 + sStack_ede;
      sStack_efc = sVar291 + sStack_edc;
      sStack_efa = sVar306 + sStack_eda;
      local_1a68 = sVar250 + local_f08;
      uStack_1a66 = sVar265 + sStack_f06;
      uStack_1a64 = sVar273 + sStack_f04;
      uStack_1a62 = sVar283 + sStack_f02;
      uStack_1a60 = sVar293 + sStack_f00;
      uStack_1a5e = sVar307 + sStack_efe;
      uStack_1a5c = sVar316 + sStack_efc;
      uStack_1a5a = sVar326 + sStack_efa;
      local_1a6c = 4;
      uVar256 = local_1a68 >> 4;
      uVar253 = uStack_1a66 >> 4;
      uVar268 = uStack_1a64 >> 4;
      uVar276 = uStack_1a62 >> 4;
      uVar286 = uStack_1a60 >> 4;
      uVar296 = uStack_1a5e >> 4;
      uVar310 = uStack_1a5c >> 4;
      uVar319 = uStack_1a5a >> 4;
      local_f78 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
      uStack_f70 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
      local_f58 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
      uStack_f50 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
      uVar25 = CONCAT13(cVar187,CONCAT12(uVar227,CONCAT11(cVar186,uVar226)));
      uVar26 = CONCAT15(cVar188,CONCAT14(uVar228,uVar25));
      uVar5 = CONCAT17(cVar189,CONCAT16(uVar229,uVar26));
      uVar32 = CONCAT13(cVar191,CONCAT12(uVar231,CONCAT11(cVar190,uVar230)));
      uVar33 = CONCAT15(cVar192,CONCAT14(uVar232,uVar32));
      uVar21 = CONCAT17(cVar193,CONCAT16(uVar233,uVar33));
      local_f48 = CONCAT11(cVar186,uVar234);
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar235,local_f48));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar236,uVar16));
      uVar1 = CONCAT17(cVar189,CONCAT16(uVar237,uVar17));
      sStack_f40 = CONCAT11(cVar190,uVar238);
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar239,sStack_f40));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar240,uVar18));
      uVar3 = CONCAT17(cVar193,CONCAT16(uVar241,uVar19));
      uVar39 = CONCAT13(cVar187,CONCAT12(uVar219,CONCAT11(cVar186,uVar218)));
      uVar40 = CONCAT15(cVar188,CONCAT14(uVar220,uVar39));
      uVar24 = CONCAT17(cVar189,CONCAT16(uVar221,uVar40));
      uVar45 = CONCAT13(cVar191,CONCAT12(uVar223,CONCAT11(cVar190,uVar222)));
      uVar46 = CONCAT15(cVar192,CONCAT14(uVar224,uVar45));
      uVar30 = CONCAT17(cVar193,CONCAT16(uVar225,uVar46));
      local_f18._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_f18._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_f18._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_f10._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_f10._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_f10._6_2_ = (short)((ulong)uVar3 >> 0x30);
      local_f28._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_f28._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_f28._6_2_ = (short)((ulong)uVar24 >> 0x30);
      uStack_f20._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_f20._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_f20._6_2_ = (short)((ulong)uVar30 >> 0x30);
      local_f48 = local_f48 + CONCAT11(cVar186,uVar218);
      sStack_f46 = local_f18._2_2_ + local_f28._2_2_;
      sStack_f44 = local_f18._4_2_ + local_f28._4_2_;
      sStack_f42 = local_f18._6_2_ + local_f28._6_2_;
      sStack_f40 = sStack_f40 + CONCAT11(cVar190,uVar222);
      sStack_f3e = uStack_f10._2_2_ + uStack_f20._2_2_;
      sStack_f3c = uStack_f10._4_2_ + uStack_f20._4_2_;
      sStack_f3a = uStack_f10._6_2_ + uStack_f20._6_2_;
      local_f38._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_f38._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_f38._6_2_ = (short)((ulong)uVar5 >> 0x30);
      uStack_f30._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_f30._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_f30._6_2_ = (short)((ulong)uVar21 >> 0x30);
      local_f68 = CONCAT11(cVar186,uVar226) + local_f48;
      sStack_f66 = local_f38._2_2_ + sStack_f46;
      sStack_f64 = local_f38._4_2_ + sStack_f44;
      sStack_f62 = local_f38._6_2_ + sStack_f42;
      sStack_f60 = CONCAT11(cVar190,uVar230) + sStack_f40;
      sStack_f5e = uStack_f30._2_2_ + sStack_f3e;
      sStack_f5c = uStack_f30._4_2_ + sStack_f3c;
      sStack_f5a = uStack_f30._6_2_ + sStack_f3a;
      local_f88 = sVar315 + local_f68;
      sStack_f86 = sVar325 + sStack_f66;
      sStack_f84 = sVar278 + sStack_f64;
      sStack_f82 = sVar288 + sStack_f62;
      sStack_f80 = sVar299 + sStack_f60;
      sStack_f7e = sVar312 + sStack_f5e;
      sStack_f7c = sVar321 + sStack_f5c;
      sStack_f7a = sVar331 + sStack_f5a;
      local_1a88 = sVar254 + local_f88;
      uStack_1a86 = sVar269 + sStack_f86;
      uStack_1a84 = sVar277 + sStack_f84;
      uStack_1a82 = sVar287 + sStack_f82;
      uStack_1a80 = sVar297 + sStack_f80;
      uStack_1a7e = sVar311 + sStack_f7e;
      uStack_1a7c = sVar320 + sStack_f7c;
      uStack_1a7a = sVar330 + sStack_f7a;
      local_1a8c = 4;
      uVar252 = local_1a88 >> 4;
      uVar267 = uStack_1a86 >> 4;
      uVar275 = uStack_1a84 >> 4;
      uVar285 = uStack_1a82 >> 4;
      uVar295 = uStack_1a80 >> 4;
      uVar309 = uStack_1a7e >> 4;
      uVar318 = uStack_1a7c >> 4;
      uVar328 = uStack_1a7a >> 4;
      local_5d8 = CONCAT26(uVar276,CONCAT24(uVar268,CONCAT22(uVar253,uVar256)));
      uStack_5d0 = CONCAT26(uVar319,CONCAT24(uVar310,CONCAT22(uVar296,uVar286)));
      local_5e8 = CONCAT26(uVar285,CONCAT24(uVar275,CONCAT22(uVar267,uVar252)));
      uStack_5e0 = CONCAT26(uVar328,CONCAT24(uVar318,CONCAT22(uVar309,uVar295)));
      local_22a8 = CONCAT17((uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319),
                            CONCAT16((uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 -
                                     (0xff < uVar310),
                                     CONCAT15((uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 -
                                              (0xff < uVar296),
                                              CONCAT14((uVar286 != 0) * (uVar286 < 0x100) *
                                                       (char)uVar286 - (0xff < uVar286),
                                                       CONCAT13((uVar276 != 0) * (uVar276 < 0x100) *
                                                                (char)uVar276 - (0xff < uVar276),
                                                                CONCAT12((uVar268 != 0) *
                                                                         (uVar268 < 0x100) *
                                                                         (char)uVar268 -
                                                                         (0xff < uVar268),
                                                                         CONCAT11((uVar253 != 0) *
                                                                                  (uVar253 < 0x100)
                                                                                  * (char)uVar253 -
                                                                                  (0xff < uVar253),
                                                                                  (uVar256 != 0) *
                                                                                  (uVar256 < 0x100)
                                                                                  * (char)uVar256 -
                                                                                  (0xff < uVar256)))
                                                               )))));
      uStack_22a0 = CONCAT17((uVar328 != 0) * (uVar328 < 0x100) * (char)uVar328 - (0xff < uVar328),
                             CONCAT16((uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 -
                                      (0xff < uVar318),
                                      CONCAT15((uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 -
                                               (0xff < uVar309),
                                               CONCAT14((uVar295 != 0) * (uVar295 < 0x100) *
                                                        (char)uVar295 - (0xff < uVar295),
                                                        CONCAT13((uVar285 != 0) * (uVar285 < 0x100)
                                                                 * (char)uVar285 - (0xff < uVar285),
                                                                 CONCAT12((uVar275 != 0) *
                                                                          (uVar275 < 0x100) *
                                                                          (char)uVar275 -
                                                                          (0xff < uVar275),
                                                                          CONCAT11((uVar267 != 0) *
                                                                                   (uVar267 < 0x100)
                                                                                   * (char)uVar267 -
                                                                                   (0xff < uVar267),
                                                                                   (uVar252 != 0) *
                                                                                   (uVar252 < 0x100)
                                                                                   * (char)uVar252 -
                                                                                   (0xff < uVar252))
                                                                         ))))));
      local_f98 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
      uStack_f90 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar171,CONCAT11(cVar178,uVar170)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar172,uVar16));
      uVar93 = CONCAT17(cVar181,CONCAT16(uVar173,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar175,CONCAT11(cVar182,uVar174)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar176,uVar18));
      uVar98 = CONCAT17(cVar185,CONCAT16(uVar177,uVar19));
      local_fa8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_fa8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_fa8._6_2_ = (short)((ulong)uVar93 >> 0x30);
      uStack_fa0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_fa0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_fa0._6_2_ = (short)((ulong)uVar98 >> 0x30);
      sVar249 = sVar249 + CONCAT11(cVar178,uVar170);
      sVar248 = sVar248 + local_fa8._2_2_;
      sVar264 = sVar264 + local_fa8._4_2_;
      sVar272 = sVar272 + local_fa8._6_2_;
      sVar282 = sVar282 + CONCAT11(cVar182,uVar174);
      sVar292 = sVar292 + uStack_fa0._2_2_;
      sVar291 = sVar291 + uStack_fa0._4_2_;
      sVar306 = sVar306 + uStack_fa0._6_2_;
      local_fb8 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
      uStack_fb0 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar195,CONCAT11(cVar186,uVar194)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar196,uVar16));
      uVar53 = CONCAT17(cVar189,CONCAT16(uVar197,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar199,CONCAT11(cVar190,uVar198)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar200,uVar18));
      uVar58 = CONCAT17(cVar193,CONCAT16(uVar201,uVar19));
      local_fc8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_fc8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_fc8._6_2_ = (short)((ulong)uVar53 >> 0x30);
      uStack_fc0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_fc0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_fc0._6_2_ = (short)((ulong)uVar58 >> 0x30);
      sVar315 = sVar315 + CONCAT11(cVar186,uVar194);
      sVar325 = sVar325 + local_fc8._2_2_;
      sVar278 = sVar278 + local_fc8._4_2_;
      sVar288 = sVar288 + local_fc8._6_2_;
      sVar299 = sVar299 + CONCAT11(cVar190,uVar198);
      sVar312 = sVar312 + uStack_fc0._2_2_;
      sVar321 = sVar321 + uStack_fc0._4_2_;
      sVar331 = sVar331 + uStack_fc0._6_2_;
      local_798 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
      uStack_790 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar219,CONCAT11(cVar186,uVar218)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar220,uVar16));
      uVar27 = CONCAT17(cVar189,CONCAT16(uVar221,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar223,CONCAT11(cVar190,uVar222)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar224,uVar18));
      uVar31 = CONCAT17(cVar193,CONCAT16(uVar225,uVar19));
      local_7a8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_7a8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_7a8._6_2_ = (short)((ulong)uVar27 >> 0x30);
      uStack_7a0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_7a0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_7a0._6_2_ = (short)((ulong)uVar31 >> 0x30);
      sVar250 = sVar250 - CONCAT11(cVar186,uVar218);
      sVar265 = sVar265 - local_7a8._2_2_;
      sVar273 = sVar273 - local_7a8._4_2_;
      sVar283 = sVar283 - local_7a8._6_2_;
      sVar293 = sVar293 - CONCAT11(cVar190,uVar222);
      sVar307 = sVar307 - uStack_7a0._2_2_;
      sVar316 = sVar316 - uStack_7a0._4_2_;
      sVar326 = sVar326 - uStack_7a0._6_2_;
      local_7b8 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
      uStack_7b0 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar147,CONCAT11(cVar178,uVar146)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar148,uVar16));
      uVar73 = CONCAT17(cVar181,CONCAT16(uVar149,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar151,CONCAT11(cVar182,uVar150)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar152,uVar18));
      uVar77 = CONCAT17(cVar185,CONCAT16(uVar153,uVar19));
      local_7c8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_7c8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_7c8._6_2_ = (short)((ulong)uVar73 >> 0x30);
      uStack_7c0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_7c0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_7c0._6_2_ = (short)((ulong)uVar77 >> 0x30);
      sVar254 = sVar254 - CONCAT11(cVar178,uVar146);
      sVar269 = sVar269 - local_7c8._2_2_;
      sVar277 = sVar277 - local_7c8._4_2_;
      sVar287 = sVar287 - local_7c8._6_2_;
      sVar297 = sVar297 - CONCAT11(cVar182,uVar150);
      sVar311 = sVar311 - uStack_7c0._2_2_;
      sVar320 = sVar320 - uStack_7c0._4_2_;
      sVar330 = sVar330 - uStack_7c0._6_2_;
      local_1038 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
      uStack_1030 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
      local_1018 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
      uStack_1010 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
      uVar25 = CONCAT13(cVar179,CONCAT12(uVar147,CONCAT11(cVar178,uVar146)));
      uVar26 = CONCAT15(cVar180,CONCAT14(uVar148,uVar25));
      uVar74 = CONCAT17(cVar181,CONCAT16(uVar149,uVar26));
      uVar32 = CONCAT13(cVar183,CONCAT12(uVar151,CONCAT11(cVar182,uVar150)));
      uVar33 = CONCAT15(cVar184,CONCAT14(uVar152,uVar32));
      uVar78 = CONCAT17(cVar185,CONCAT16(uVar153,uVar33));
      uVar39 = CONCAT13(cVar179,CONCAT12(uVar155,CONCAT11(cVar178,uVar154)));
      uVar40 = CONCAT15(cVar180,CONCAT14(uVar156,uVar39));
      uVar81 = CONCAT17(cVar181,CONCAT16(uVar157,uVar40));
      uVar45 = CONCAT13(cVar183,CONCAT12(uVar159,CONCAT11(cVar182,uVar158)));
      uVar46 = CONCAT15(cVar184,CONCAT14(uVar160,uVar45));
      uVar85 = CONCAT17(cVar185,CONCAT16(uVar161,uVar46));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar139,CONCAT11(cVar178,uVar138)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar140,uVar16));
      uVar67 = CONCAT17(cVar181,CONCAT16(uVar141,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar143,CONCAT11(cVar182,uVar142)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar144,uVar18));
      uVar70 = CONCAT17(cVar185,CONCAT16(uVar145,uVar19));
      local_fd8._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_fd8._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_fd8._6_2_ = (short)((ulong)uVar81 >> 0x30);
      uStack_fd0._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_fd0._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_fd0._6_2_ = (short)((ulong)uVar85 >> 0x30);
      local_fe8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_fe8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_fe8._6_2_ = (short)((ulong)uVar67 >> 0x30);
      uStack_fe0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_fe0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_fe0._6_2_ = (short)((ulong)uVar70 >> 0x30);
      local_1008 = CONCAT11(cVar178,uVar154) + CONCAT11(cVar178,uVar138);
      sStack_1006 = local_fd8._2_2_ + local_fe8._2_2_;
      sStack_1004 = local_fd8._4_2_ + local_fe8._4_2_;
      sStack_1002 = local_fd8._6_2_ + local_fe8._6_2_;
      sStack_1000 = CONCAT11(cVar182,uVar158) + CONCAT11(cVar182,uVar142);
      sStack_ffe = uStack_fd0._2_2_ + uStack_fe0._2_2_;
      sStack_ffc = uStack_fd0._4_2_ + uStack_fe0._4_2_;
      sStack_ffa = uStack_fd0._6_2_ + uStack_fe0._6_2_;
      local_ff8._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_ff8._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_ff8._6_2_ = (short)((ulong)uVar74 >> 0x30);
      uStack_ff0._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_ff0._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_ff0._6_2_ = (short)((ulong)uVar78 >> 0x30);
      local_1028 = CONCAT11(cVar178,uVar146) + local_1008;
      sStack_1026 = local_ff8._2_2_ + sStack_1006;
      sStack_1024 = local_ff8._4_2_ + sStack_1004;
      sStack_1022 = local_ff8._6_2_ + sStack_1002;
      sStack_1020 = CONCAT11(cVar182,uVar150) + sStack_1000;
      sStack_101e = uStack_ff0._2_2_ + sStack_ffe;
      sStack_101c = uStack_ff0._4_2_ + sStack_ffc;
      sStack_101a = uStack_ff0._6_2_ + sStack_ffa;
      local_1048 = sVar249 + local_1028;
      sStack_1046 = sVar248 + sStack_1026;
      sStack_1044 = sVar264 + sStack_1024;
      sStack_1042 = sVar272 + sStack_1022;
      sStack_1040 = sVar282 + sStack_1020;
      sStack_103e = sVar292 + sStack_101e;
      sStack_103c = sVar291 + sStack_101c;
      sStack_103a = sVar306 + sStack_101a;
      local_1aa8 = sVar250 + local_1048;
      uStack_1aa6 = sVar265 + sStack_1046;
      uStack_1aa4 = sVar273 + sStack_1044;
      uStack_1aa2 = sVar283 + sStack_1042;
      uStack_1aa0 = sVar293 + sStack_1040;
      uStack_1a9e = sVar307 + sStack_103e;
      uStack_1a9c = sVar316 + sStack_103c;
      uStack_1a9a = sVar326 + sStack_103a;
      local_1aac = 4;
      uVar256 = local_1aa8 >> 4;
      uVar253 = uStack_1aa6 >> 4;
      uVar268 = uStack_1aa4 >> 4;
      uVar276 = uStack_1aa2 >> 4;
      uVar286 = uStack_1aa0 >> 4;
      uVar296 = uStack_1a9e >> 4;
      uVar310 = uStack_1a9c >> 4;
      uVar319 = uStack_1a9a >> 4;
      local_10b8 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
      uStack_10b0 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
      local_1098 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
      uStack_1090 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
      uVar25 = CONCAT13(cVar187,CONCAT12(uVar219,CONCAT11(cVar186,uVar218)));
      uVar26 = CONCAT15(cVar188,CONCAT14(uVar220,uVar25));
      uVar28 = CONCAT17(cVar189,CONCAT16(uVar221,uVar26));
      uVar32 = CONCAT13(cVar191,CONCAT12(uVar223,CONCAT11(cVar190,uVar222)));
      uVar33 = CONCAT15(cVar192,CONCAT14(uVar224,uVar32));
      uVar34 = CONCAT17(cVar193,CONCAT16(uVar225,uVar33));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar227,CONCAT11(cVar186,uVar226)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar228,uVar16));
      uVar6 = CONCAT17(cVar189,CONCAT16(uVar229,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar231,CONCAT11(cVar190,uVar230)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar232,uVar18));
      uVar22 = CONCAT17(cVar193,CONCAT16(uVar233,uVar19));
      uVar39 = CONCAT13(cVar187,CONCAT12(uVar211,CONCAT11(cVar186,uVar210)));
      uVar40 = CONCAT15(cVar188,CONCAT14(uVar212,uVar39));
      uVar37 = CONCAT17(cVar189,CONCAT16(uVar213,uVar40));
      uVar45 = CONCAT13(cVar191,CONCAT12(uVar215,CONCAT11(cVar190,uVar214)));
      uVar46 = CONCAT15(cVar192,CONCAT14(uVar216,uVar45));
      uVar43 = CONCAT17(cVar193,CONCAT16(uVar217,uVar46));
      local_1058._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_1058._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_1058._6_2_ = (short)((ulong)uVar6 >> 0x30);
      uStack_1050._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_1050._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_1050._6_2_ = (short)((ulong)uVar22 >> 0x30);
      local_1068._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_1068._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_1068._6_2_ = (short)((ulong)uVar37 >> 0x30);
      uStack_1060._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_1060._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_1060._6_2_ = (short)((ulong)uVar43 >> 0x30);
      local_1088 = CONCAT11(cVar186,uVar226) + CONCAT11(cVar186,uVar210);
      sStack_1086 = local_1058._2_2_ + local_1068._2_2_;
      sStack_1084 = local_1058._4_2_ + local_1068._4_2_;
      sStack_1082 = local_1058._6_2_ + local_1068._6_2_;
      sStack_1080 = CONCAT11(cVar190,uVar230) + CONCAT11(cVar190,uVar214);
      sStack_107e = uStack_1050._2_2_ + uStack_1060._2_2_;
      sStack_107c = uStack_1050._4_2_ + uStack_1060._4_2_;
      sStack_107a = uStack_1050._6_2_ + uStack_1060._6_2_;
      local_1078._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_1078._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_1078._6_2_ = (short)((ulong)uVar28 >> 0x30);
      uStack_1070._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_1070._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_1070._6_2_ = (short)((ulong)uVar34 >> 0x30);
      local_10a8 = CONCAT11(cVar186,uVar218) + local_1088;
      sStack_10a6 = local_1078._2_2_ + sStack_1086;
      sStack_10a4 = local_1078._4_2_ + sStack_1084;
      sStack_10a2 = local_1078._6_2_ + sStack_1082;
      sStack_10a0 = CONCAT11(cVar190,uVar222) + sStack_1080;
      sStack_109e = uStack_1070._2_2_ + sStack_107e;
      sStack_109c = uStack_1070._4_2_ + sStack_107c;
      sStack_109a = uStack_1070._6_2_ + sStack_107a;
      local_10c8 = sVar315 + local_10a8;
      sStack_10c6 = sVar325 + sStack_10a6;
      sStack_10c4 = sVar278 + sStack_10a4;
      sStack_10c2 = sVar288 + sStack_10a2;
      sStack_10c0 = sVar299 + sStack_10a0;
      sStack_10be = sVar312 + sStack_109e;
      sStack_10bc = sVar321 + sStack_109c;
      sStack_10ba = sVar331 + sStack_109a;
      local_1ac8 = sVar254 + local_10c8;
      uStack_1ac6 = sVar269 + sStack_10c6;
      uStack_1ac4 = sVar277 + sStack_10c4;
      uStack_1ac2 = sVar287 + sStack_10c2;
      uStack_1ac0 = sVar297 + sStack_10c0;
      uStack_1abe = sVar311 + sStack_10be;
      uStack_1abc = sVar320 + sStack_10bc;
      uStack_1aba = sVar330 + sStack_10ba;
      local_1acc = 4;
      uVar252 = local_1ac8 >> 4;
      uVar267 = uStack_1ac6 >> 4;
      uVar275 = uStack_1ac4 >> 4;
      uVar285 = uStack_1ac2 >> 4;
      uVar295 = uStack_1ac0 >> 4;
      uVar309 = uStack_1abe >> 4;
      uVar318 = uStack_1abc >> 4;
      uVar328 = uStack_1aba >> 4;
      local_5f8 = CONCAT26(uVar276,CONCAT24(uVar268,CONCAT22(uVar253,uVar256)));
      uStack_5f0 = CONCAT26(uVar319,CONCAT24(uVar310,CONCAT22(uVar296,uVar286)));
      local_608 = CONCAT26(uVar285,CONCAT24(uVar275,CONCAT22(uVar267,uVar252)));
      uStack_600 = CONCAT26(uVar328,CONCAT24(uVar318,CONCAT22(uVar309,uVar295)));
      local_2298 = CONCAT17((uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319),
                            CONCAT16((uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 -
                                     (0xff < uVar310),
                                     CONCAT15((uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 -
                                              (0xff < uVar296),
                                              CONCAT14((uVar286 != 0) * (uVar286 < 0x100) *
                                                       (char)uVar286 - (0xff < uVar286),
                                                       CONCAT13((uVar276 != 0) * (uVar276 < 0x100) *
                                                                (char)uVar276 - (0xff < uVar276),
                                                                CONCAT12((uVar268 != 0) *
                                                                         (uVar268 < 0x100) *
                                                                         (char)uVar268 -
                                                                         (0xff < uVar268),
                                                                         CONCAT11((uVar253 != 0) *
                                                                                  (uVar253 < 0x100)
                                                                                  * (char)uVar253 -
                                                                                  (0xff < uVar253),
                                                                                  (uVar256 != 0) *
                                                                                  (uVar256 < 0x100)
                                                                                  * (char)uVar256 -
                                                                                  (0xff < uVar256)))
                                                               )))));
      uStack_2290 = CONCAT17((uVar328 != 0) * (uVar328 < 0x100) * (char)uVar328 - (0xff < uVar328),
                             CONCAT16((uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 -
                                      (0xff < uVar318),
                                      CONCAT15((uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 -
                                               (0xff < uVar309),
                                               CONCAT14((uVar295 != 0) * (uVar295 < 0x100) *
                                                        (char)uVar295 - (0xff < uVar295),
                                                        CONCAT13((uVar285 != 0) * (uVar285 < 0x100)
                                                                 * (char)uVar285 - (0xff < uVar285),
                                                                 CONCAT12((uVar275 != 0) *
                                                                          (uVar275 < 0x100) *
                                                                          (char)uVar275 -
                                                                          (0xff < uVar275),
                                                                          CONCAT11((uVar267 != 0) *
                                                                                   (uVar267 < 0x100)
                                                                                   * (char)uVar267 -
                                                                                   (0xff < uVar267),
                                                                                   (uVar252 != 0) *
                                                                                   (uVar252 < 0x100)
                                                                                   * (char)uVar252 -
                                                                                   (0xff < uVar252))
                                                                         ))))));
      local_10d8 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
      uStack_10d0 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar171,CONCAT11(cVar178,uVar170)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar172,uVar16));
      uVar94 = CONCAT17(cVar181,CONCAT16(uVar173,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar175,CONCAT11(cVar182,uVar174)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar176,uVar18));
      uVar99 = CONCAT17(cVar185,CONCAT16(uVar177,uVar19));
      local_10e8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_10e8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_10e8._6_2_ = (short)((ulong)uVar94 >> 0x30);
      uStack_10e0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_10e0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_10e0._6_2_ = (short)((ulong)uVar99 >> 0x30);
      sVar249 = sVar249 + CONCAT11(cVar178,uVar170);
      sVar248 = sVar248 + local_10e8._2_2_;
      sVar264 = sVar264 + local_10e8._4_2_;
      sVar272 = sVar272 + local_10e8._6_2_;
      sVar282 = sVar282 + CONCAT11(cVar182,uVar174);
      sVar292 = sVar292 + uStack_10e0._2_2_;
      sVar291 = sVar291 + uStack_10e0._4_2_;
      sVar306 = sVar306 + uStack_10e0._6_2_;
      local_10f8 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
      uStack_10f0 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar195,CONCAT11(cVar186,uVar194)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar196,uVar16));
      uVar54 = CONCAT17(cVar189,CONCAT16(uVar197,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar199,CONCAT11(cVar190,uVar198)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar200,uVar18));
      uVar59 = CONCAT17(cVar193,CONCAT16(uVar201,uVar19));
      local_1108._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_1108._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_1108._6_2_ = (short)((ulong)uVar54 >> 0x30);
      uStack_1100._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_1100._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_1100._6_2_ = (short)((ulong)uVar59 >> 0x30);
      sVar315 = sVar315 + CONCAT11(cVar186,uVar194);
      sVar325 = sVar325 + local_1108._2_2_;
      sVar278 = sVar278 + local_1108._4_2_;
      sVar288 = sVar288 + local_1108._6_2_;
      sVar299 = sVar299 + CONCAT11(cVar190,uVar198);
      sVar312 = sVar312 + uStack_1100._2_2_;
      sVar321 = sVar321 + uStack_1100._4_2_;
      sVar331 = sVar331 + uStack_1100._6_2_;
      local_7d8 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
      uStack_7d0 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar227,CONCAT11(cVar186,uVar226)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar228,uVar16));
      uVar20 = CONCAT17(cVar189,CONCAT16(uVar229,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar231,CONCAT11(cVar190,uVar230)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar232,uVar18));
      uVar23 = CONCAT17(cVar193,CONCAT16(uVar233,uVar19));
      local_7e8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_7e8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_7e8._6_2_ = (short)((ulong)uVar20 >> 0x30);
      uStack_7e0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_7e0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_7e0._6_2_ = (short)((ulong)uVar23 >> 0x30);
      sVar250 = sVar250 - CONCAT11(cVar186,uVar226);
      sVar265 = sVar265 - local_7e8._2_2_;
      sVar273 = sVar273 - local_7e8._4_2_;
      sVar283 = sVar283 - local_7e8._6_2_;
      sVar293 = sVar293 - CONCAT11(cVar190,uVar230);
      sVar307 = sVar307 - uStack_7e0._2_2_;
      sVar316 = sVar316 - uStack_7e0._4_2_;
      sVar326 = sVar326 - uStack_7e0._6_2_;
      local_7f8 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
      uStack_7f0 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar139,CONCAT11(cVar178,uVar138)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar140,uVar16));
      uVar68 = CONCAT17(cVar181,CONCAT16(uVar141,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar143,CONCAT11(cVar182,uVar142)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar144,uVar18));
      uVar71 = CONCAT17(cVar185,CONCAT16(uVar145,uVar19));
      local_808._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_808._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_808._6_2_ = (short)((ulong)uVar68 >> 0x30);
      uStack_800._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_800._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_800._6_2_ = (short)((ulong)uVar71 >> 0x30);
      sVar254 = sVar254 - CONCAT11(cVar178,uVar138);
      sVar269 = sVar269 - local_808._2_2_;
      sVar277 = sVar277 - local_808._4_2_;
      sVar287 = sVar287 - local_808._6_2_;
      sVar297 = sVar297 - CONCAT11(cVar182,uVar142);
      sVar311 = sVar311 - uStack_800._2_2_;
      sVar320 = sVar320 - uStack_800._4_2_;
      sVar330 = sVar330 - uStack_800._6_2_;
      local_1178 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
      uStack_1170 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
      local_1158 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
      uStack_1150 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
      uVar25 = CONCAT13(cVar179,CONCAT12(uVar155,CONCAT11(cVar178,uVar154)));
      uVar26 = CONCAT15(cVar180,CONCAT14(uVar156,uVar25));
      uVar82 = CONCAT17(cVar181,CONCAT16(uVar157,uVar26));
      uVar32 = CONCAT13(cVar183,CONCAT12(uVar159,CONCAT11(cVar182,uVar158)));
      uVar33 = CONCAT15(cVar184,CONCAT14(uVar160,uVar32));
      uVar86 = CONCAT17(cVar185,CONCAT16(uVar161,uVar33));
      local_1148 = CONCAT11(cVar178,uVar162);
      uVar39 = CONCAT13(cVar179,CONCAT12(uVar163,local_1148));
      uVar40 = CONCAT15(cVar180,CONCAT14(uVar164,uVar39));
      uVar88 = CONCAT17(cVar181,CONCAT16(uVar165,uVar40));
      sStack_1140 = CONCAT11(cVar182,uVar166);
      uVar45 = CONCAT13(cVar183,CONCAT12(uVar167,sStack_1140));
      uVar46 = CONCAT15(cVar184,CONCAT14(uVar168,uVar45));
      uVar90 = CONCAT17(cVar185,CONCAT16(uVar169,uVar46));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar147,CONCAT11(cVar178,uVar146)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar148,uVar16));
      uVar75 = CONCAT17(cVar181,CONCAT16(uVar149,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar151,CONCAT11(cVar182,uVar150)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar152,uVar18));
      uVar79 = CONCAT17(cVar185,CONCAT16(uVar153,uVar19));
      local_1118._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_1118._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_1118._6_2_ = (short)((ulong)uVar88 >> 0x30);
      uStack_1110._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_1110._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_1110._6_2_ = (short)((ulong)uVar90 >> 0x30);
      local_1128._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_1128._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_1128._6_2_ = (short)((ulong)uVar75 >> 0x30);
      uStack_1120._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_1120._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_1120._6_2_ = (short)((ulong)uVar79 >> 0x30);
      local_1148 = local_1148 + CONCAT11(cVar178,uVar146);
      sStack_1146 = local_1118._2_2_ + local_1128._2_2_;
      sStack_1144 = local_1118._4_2_ + local_1128._4_2_;
      sStack_1142 = local_1118._6_2_ + local_1128._6_2_;
      sStack_1140 = sStack_1140 + CONCAT11(cVar182,uVar150);
      sStack_113e = uStack_1110._2_2_ + uStack_1120._2_2_;
      sStack_113c = uStack_1110._4_2_ + uStack_1120._4_2_;
      sStack_113a = uStack_1110._6_2_ + uStack_1120._6_2_;
      local_1138._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_1138._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_1138._6_2_ = (short)((ulong)uVar82 >> 0x30);
      uStack_1130._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_1130._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_1130._6_2_ = (short)((ulong)uVar86 >> 0x30);
      local_1168 = CONCAT11(cVar178,uVar154) + local_1148;
      sStack_1166 = local_1138._2_2_ + sStack_1146;
      sStack_1164 = local_1138._4_2_ + sStack_1144;
      sStack_1162 = local_1138._6_2_ + sStack_1142;
      sStack_1160 = CONCAT11(cVar182,uVar158) + sStack_1140;
      sStack_115e = uStack_1130._2_2_ + sStack_113e;
      sStack_115c = uStack_1130._4_2_ + sStack_113c;
      sStack_115a = uStack_1130._6_2_ + sStack_113a;
      local_1188 = sVar249 + local_1168;
      sStack_1186 = sVar248 + sStack_1166;
      sStack_1184 = sVar264 + sStack_1164;
      sStack_1182 = sVar272 + sStack_1162;
      sStack_1180 = sVar282 + sStack_1160;
      sStack_117e = sVar292 + sStack_115e;
      sStack_117c = sVar291 + sStack_115c;
      sStack_117a = sVar306 + sStack_115a;
      local_1ae8 = sVar250 + local_1188;
      uStack_1ae6 = sVar265 + sStack_1186;
      uStack_1ae4 = sVar273 + sStack_1184;
      uStack_1ae2 = sVar283 + sStack_1182;
      uStack_1ae0 = sVar293 + sStack_1180;
      uStack_1ade = sVar307 + sStack_117e;
      uStack_1adc = sVar316 + sStack_117c;
      uStack_1ada = sVar326 + sStack_117a;
      local_1aec = 4;
      uVar256 = local_1ae8 >> 4;
      uVar253 = uStack_1ae6 >> 4;
      uVar268 = uStack_1ae4 >> 4;
      uVar276 = uStack_1ae2 >> 4;
      uVar286 = uStack_1ae0 >> 4;
      uVar296 = uStack_1ade >> 4;
      uVar310 = uStack_1adc >> 4;
      uVar319 = uStack_1ada >> 4;
      local_11f8 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
      uStack_11f0 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
      local_11d8 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
      uStack_11d0 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
      uVar25 = CONCAT13(cVar187,CONCAT12(uVar211,CONCAT11(cVar186,uVar210)));
      uVar26 = CONCAT15(cVar188,CONCAT14(uVar212,uVar25));
      uVar38 = CONCAT17(cVar189,CONCAT16(uVar213,uVar26));
      uVar32 = CONCAT13(cVar191,CONCAT12(uVar215,CONCAT11(cVar190,uVar214)));
      uVar33 = CONCAT15(cVar192,CONCAT14(uVar216,uVar32));
      uVar44 = CONCAT17(cVar193,CONCAT16(uVar217,uVar33));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar219,CONCAT11(cVar186,uVar218)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar220,uVar16));
      uVar29 = CONCAT17(cVar189,CONCAT16(uVar221,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar223,CONCAT11(cVar190,uVar222)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar224,uVar18));
      uVar35 = CONCAT17(cVar193,CONCAT16(uVar225,uVar19));
      local_11c8 = CONCAT11(cVar186,uVar202);
      uVar39 = CONCAT13(cVar187,CONCAT12(uVar203,local_11c8));
      uVar40 = CONCAT15(cVar188,CONCAT14(uVar204,uVar39));
      uVar48 = CONCAT17(cVar189,CONCAT16(uVar205,uVar40));
      sStack_11c0 = CONCAT11(cVar190,uVar206);
      uVar45 = CONCAT13(cVar191,CONCAT12(uVar207,sStack_11c0));
      uVar46 = CONCAT15(cVar192,CONCAT14(uVar208,uVar45));
      uVar50 = CONCAT17(cVar193,CONCAT16(uVar209,uVar46));
      local_1198._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_1198._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_1198._6_2_ = (short)((ulong)uVar29 >> 0x30);
      uStack_1190._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_1190._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_1190._6_2_ = (short)((ulong)uVar35 >> 0x30);
      local_11a8._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_11a8._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_11a8._6_2_ = (short)((ulong)uVar48 >> 0x30);
      uStack_11a0._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_11a0._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_11a0._6_2_ = (short)((ulong)uVar50 >> 0x30);
      local_11c8 = CONCAT11(cVar186,uVar218) + local_11c8;
      sStack_11c6 = local_1198._2_2_ + local_11a8._2_2_;
      sStack_11c4 = local_1198._4_2_ + local_11a8._4_2_;
      sStack_11c2 = local_1198._6_2_ + local_11a8._6_2_;
      sStack_11c0 = CONCAT11(cVar190,uVar222) + sStack_11c0;
      sStack_11be = uStack_1190._2_2_ + uStack_11a0._2_2_;
      sStack_11bc = uStack_1190._4_2_ + uStack_11a0._4_2_;
      sStack_11ba = uStack_1190._6_2_ + uStack_11a0._6_2_;
      local_11b8._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_11b8._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_11b8._6_2_ = (short)((ulong)uVar38 >> 0x30);
      uStack_11b0._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_11b0._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_11b0._6_2_ = (short)((ulong)uVar44 >> 0x30);
      local_11e8 = CONCAT11(cVar186,uVar210) + local_11c8;
      sStack_11e6 = local_11b8._2_2_ + sStack_11c6;
      sStack_11e4 = local_11b8._4_2_ + sStack_11c4;
      sStack_11e2 = local_11b8._6_2_ + sStack_11c2;
      sStack_11e0 = CONCAT11(cVar190,uVar214) + sStack_11c0;
      sStack_11de = uStack_11b0._2_2_ + sStack_11be;
      sStack_11dc = uStack_11b0._4_2_ + sStack_11bc;
      sStack_11da = uStack_11b0._6_2_ + sStack_11ba;
      local_1208 = sVar315 + local_11e8;
      sStack_1206 = sVar325 + sStack_11e6;
      sStack_1204 = sVar278 + sStack_11e4;
      sStack_1202 = sVar288 + sStack_11e2;
      sStack_1200 = sVar299 + sStack_11e0;
      sStack_11fe = sVar312 + sStack_11de;
      sStack_11fc = sVar321 + sStack_11dc;
      sStack_11fa = sVar331 + sStack_11da;
      local_1b08 = sVar254 + local_1208;
      uStack_1b06 = sVar269 + sStack_1206;
      uStack_1b04 = sVar277 + sStack_1204;
      uStack_1b02 = sVar287 + sStack_1202;
      uStack_1b00 = sVar297 + sStack_1200;
      uStack_1afe = sVar311 + sStack_11fe;
      uStack_1afc = sVar320 + sStack_11fc;
      uStack_1afa = sVar330 + sStack_11fa;
      local_1b0c = 4;
      uVar252 = local_1b08 >> 4;
      uVar267 = uStack_1b06 >> 4;
      uVar275 = uStack_1b04 >> 4;
      uVar285 = uStack_1b02 >> 4;
      uVar295 = uStack_1b00 >> 4;
      uVar309 = uStack_1afe >> 4;
      uVar318 = uStack_1afc >> 4;
      uVar328 = uStack_1afa >> 4;
      local_618 = CONCAT26(uVar276,CONCAT24(uVar268,CONCAT22(uVar253,uVar256)));
      uStack_610 = CONCAT26(uVar319,CONCAT24(uVar310,CONCAT22(uVar296,uVar286)));
      local_628 = CONCAT26(uVar285,CONCAT24(uVar275,CONCAT22(uVar267,uVar252)));
      uStack_620 = CONCAT26(uVar328,CONCAT24(uVar318,CONCAT22(uVar309,uVar295)));
      local_2288 = CONCAT17((uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319),
                            CONCAT16((uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 -
                                     (0xff < uVar310),
                                     CONCAT15((uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 -
                                              (0xff < uVar296),
                                              CONCAT14((uVar286 != 0) * (uVar286 < 0x100) *
                                                       (char)uVar286 - (0xff < uVar286),
                                                       CONCAT13((uVar276 != 0) * (uVar276 < 0x100) *
                                                                (char)uVar276 - (0xff < uVar276),
                                                                CONCAT12((uVar268 != 0) *
                                                                         (uVar268 < 0x100) *
                                                                         (char)uVar268 -
                                                                         (0xff < uVar268),
                                                                         CONCAT11((uVar253 != 0) *
                                                                                  (uVar253 < 0x100)
                                                                                  * (char)uVar253 -
                                                                                  (0xff < uVar253),
                                                                                  (uVar256 != 0) *
                                                                                  (uVar256 < 0x100)
                                                                                  * (char)uVar256 -
                                                                                  (0xff < uVar256)))
                                                               )))));
      uStack_2280 = CONCAT17((uVar328 != 0) * (uVar328 < 0x100) * (char)uVar328 - (0xff < uVar328),
                             CONCAT16((uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 -
                                      (0xff < uVar318),
                                      CONCAT15((uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 -
                                               (0xff < uVar309),
                                               CONCAT14((uVar295 != 0) * (uVar295 < 0x100) *
                                                        (char)uVar295 - (0xff < uVar295),
                                                        CONCAT13((uVar285 != 0) * (uVar285 < 0x100)
                                                                 * (char)uVar285 - (0xff < uVar285),
                                                                 CONCAT12((uVar275 != 0) *
                                                                          (uVar275 < 0x100) *
                                                                          (char)uVar275 -
                                                                          (0xff < uVar275),
                                                                          CONCAT11((uVar267 != 0) *
                                                                                   (uVar267 < 0x100)
                                                                                   * (char)uVar267 -
                                                                                   (0xff < uVar267),
                                                                                   (uVar252 != 0) *
                                                                                   (uVar252 < 0x100)
                                                                                   * (char)uVar252 -
                                                                                   (0xff < uVar252))
                                                                         ))))));
      local_1218 = CONCAT26(sVar272,CONCAT24(sVar264,CONCAT22(sVar248,sVar249)));
      uStack_1210 = CONCAT26(sVar306,CONCAT24(sVar291,CONCAT22(sVar292,sVar282)));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar171,CONCAT11(cVar178,uVar170)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar172,uVar16));
      uVar95 = CONCAT17(cVar181,CONCAT16(uVar173,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar175,CONCAT11(cVar182,uVar174)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar176,uVar18));
      uVar100 = CONCAT17(cVar185,CONCAT16(uVar177,uVar19));
      local_1228._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_1228._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_1228._6_2_ = (short)((ulong)uVar95 >> 0x30);
      uStack_1220._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_1220._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_1220._6_2_ = (short)((ulong)uVar100 >> 0x30);
      sVar249 = sVar249 + CONCAT11(cVar178,uVar170);
      sVar282 = sVar282 + CONCAT11(cVar182,uVar174);
      local_1238 = CONCAT26(sVar288,CONCAT24(sVar278,CONCAT22(sVar325,sVar315)));
      uStack_1230 = CONCAT26(sVar331,CONCAT24(sVar321,CONCAT22(sVar312,sVar299)));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar195,CONCAT11(cVar186,uVar194)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar196,uVar16));
      uVar55 = CONCAT17(cVar189,CONCAT16(uVar197,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar199,CONCAT11(cVar190,uVar198)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar200,uVar18));
      uVar60 = CONCAT17(cVar193,CONCAT16(uVar201,uVar19));
      local_1248._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_1248._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_1248._6_2_ = (short)((ulong)uVar55 >> 0x30);
      uStack_1240._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_1240._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_1240._6_2_ = (short)((ulong)uVar60 >> 0x30);
      sVar315 = sVar315 + CONCAT11(cVar186,uVar194);
      sVar299 = sVar299 + CONCAT11(cVar190,uVar198);
      local_818 = CONCAT26(sVar283,CONCAT24(sVar273,CONCAT22(sVar265,sVar250)));
      uStack_810 = CONCAT26(sVar326,CONCAT24(sVar316,CONCAT22(sVar307,sVar293)));
      sVar251 = CONCAT11(cVar186,uVar234);
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar235,sVar251));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar236,uVar16));
      uVar2 = CONCAT17(cVar189,CONCAT16(uVar237,uVar17));
      sVar255 = CONCAT11(cVar190,uVar238);
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar239,sVar255));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar240,uVar18));
      uVar4 = CONCAT17(cVar193,CONCAT16(uVar241,uVar19));
      local_828._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_828._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_828._6_2_ = (short)((ulong)uVar2 >> 0x30);
      uStack_820._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_820._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_820._6_2_ = (short)((ulong)uVar4 >> 0x30);
      sVar250 = sVar250 - sVar251;
      sVar293 = sVar293 - sVar255;
      local_838 = CONCAT26(sVar287,CONCAT24(sVar277,CONCAT22(sVar269,sVar254)));
      uStack_830 = CONCAT26(sVar330,CONCAT24(sVar320,CONCAT22(sVar311,sVar297)));
      sVar251 = CONCAT11(cVar178,uVar130);
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar131,sVar251));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar132,uVar16));
      uVar63 = CONCAT17(cVar181,CONCAT16(uVar133,uVar17));
      sVar255 = CONCAT11(cVar182,uVar134);
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar135,sVar255));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar136,uVar18));
      uVar65 = CONCAT17(cVar185,CONCAT16(uVar137,uVar19));
      local_848._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_848._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_848._6_2_ = (short)((ulong)uVar63 >> 0x30);
      uStack_840._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_840._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_840._6_2_ = (short)((ulong)uVar65 >> 0x30);
      sVar254 = sVar254 - sVar251;
      sVar297 = sVar297 - sVar255;
      local_12b8 = CONCAT26(sVar283 - local_828._6_2_,
                            CONCAT24(sVar273 - local_828._4_2_,
                                     CONCAT22(sVar265 - local_828._2_2_,sVar250)));
      uStack_12b0 = CONCAT26(sVar326 - uStack_820._6_2_,
                             CONCAT24(sVar316 - uStack_820._4_2_,
                                      CONCAT22(sVar307 - uStack_820._2_2_,sVar293)));
      local_1298 = CONCAT26(sVar272 + local_1228._6_2_,
                            CONCAT24(sVar264 + local_1228._4_2_,
                                     CONCAT22(sVar248 + local_1228._2_2_,sVar249)));
      uStack_1290 = CONCAT26(sVar306 + uStack_1220._6_2_,
                             CONCAT24(sVar291 + uStack_1220._4_2_,
                                      CONCAT22(sVar292 + uStack_1220._2_2_,sVar282)));
      local_12a8 = CONCAT11(cVar178,uVar162);
      uVar25 = CONCAT13(cVar179,CONCAT12(uVar163,local_12a8));
      uVar26 = CONCAT15(cVar180,CONCAT14(uVar164,uVar25));
      uVar89 = CONCAT17(cVar181,CONCAT16(uVar165,uVar26));
      sStack_12a0 = CONCAT11(cVar182,uVar166);
      uVar32 = CONCAT13(cVar183,CONCAT12(uVar167,sStack_12a0));
      uVar33 = CONCAT15(cVar184,CONCAT14(uVar168,uVar32));
      uVar91 = CONCAT17(cVar185,CONCAT16(uVar169,uVar33));
      uVar39 = CONCAT13(cVar179,CONCAT12(uVar171,CONCAT11(cVar178,uVar170)));
      uVar40 = CONCAT15(cVar180,CONCAT14(uVar172,uVar39));
      uVar96 = CONCAT17(cVar181,CONCAT16(uVar173,uVar40));
      uVar45 = CONCAT13(cVar183,CONCAT12(uVar175,CONCAT11(cVar182,uVar174)));
      uVar46 = CONCAT15(cVar184,CONCAT14(uVar176,uVar45));
      uVar101 = CONCAT17(cVar185,CONCAT16(uVar177,uVar46));
      uVar16 = CONCAT13(cVar179,CONCAT12(uVar155,CONCAT11(cVar178,uVar154)));
      uVar17 = CONCAT15(cVar180,CONCAT14(uVar156,uVar16));
      uVar83 = CONCAT17(cVar181,CONCAT16(uVar157,uVar17));
      uVar18 = CONCAT13(cVar183,CONCAT12(uVar159,CONCAT11(cVar182,uVar158)));
      uVar19 = CONCAT15(cVar184,CONCAT14(uVar160,uVar18));
      uVar87 = CONCAT17(cVar185,CONCAT16(uVar161,uVar19));
      local_1258._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_1258._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_1258._6_2_ = (short)((ulong)uVar96 >> 0x30);
      uStack_1250._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_1250._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_1250._6_2_ = (short)((ulong)uVar101 >> 0x30);
      local_1268._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_1268._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_1268._6_2_ = (short)((ulong)uVar83 >> 0x30);
      uStack_1260._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_1260._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_1260._6_2_ = (short)((ulong)uVar87 >> 0x30);
      local_1288 = CONCAT11(cVar178,uVar170) + CONCAT11(cVar178,uVar154);
      sStack_1286 = local_1258._2_2_ + local_1268._2_2_;
      sStack_1284 = local_1258._4_2_ + local_1268._4_2_;
      sStack_1282 = local_1258._6_2_ + local_1268._6_2_;
      sStack_1280 = CONCAT11(cVar182,uVar174) + CONCAT11(cVar182,uVar158);
      sStack_127e = uStack_1250._2_2_ + uStack_1260._2_2_;
      sStack_127c = uStack_1250._4_2_ + uStack_1260._4_2_;
      sStack_127a = uStack_1250._6_2_ + uStack_1260._6_2_;
      local_1278._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_1278._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_1278._6_2_ = (short)((ulong)uVar89 >> 0x30);
      uStack_1270._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_1270._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_1270._6_2_ = (short)((ulong)uVar91 >> 0x30);
      local_12a8 = local_12a8 + local_1288;
      sStack_12a6 = local_1278._2_2_ + sStack_1286;
      sStack_12a4 = local_1278._4_2_ + sStack_1284;
      sStack_12a2 = local_1278._6_2_ + sStack_1282;
      sStack_12a0 = sStack_12a0 + sStack_1280;
      sStack_129e = uStack_1270._2_2_ + sStack_127e;
      sStack_129c = uStack_1270._4_2_ + sStack_127c;
      sStack_129a = uStack_1270._6_2_ + sStack_127a;
      local_12c8 = sVar249 + local_12a8;
      sStack_12c6 = sVar248 + local_1228._2_2_ + sStack_12a6;
      sStack_12c4 = sVar264 + local_1228._4_2_ + sStack_12a4;
      sStack_12c2 = sVar272 + local_1228._6_2_ + sStack_12a2;
      sStack_12c0 = sVar282 + sStack_12a0;
      sStack_12be = sVar292 + uStack_1220._2_2_ + sStack_129e;
      sStack_12bc = sVar291 + uStack_1220._4_2_ + sStack_129c;
      sStack_12ba = sVar306 + uStack_1220._6_2_ + sStack_129a;
      local_1b28 = sVar250 + local_12c8;
      uStack_1b26 = (sVar265 - local_828._2_2_) + sStack_12c6;
      uStack_1b24 = (sVar273 - local_828._4_2_) + sStack_12c4;
      uStack_1b22 = (sVar283 - local_828._6_2_) + sStack_12c2;
      uStack_1b20 = sVar293 + sStack_12c0;
      uStack_1b1e = (sVar307 - uStack_820._2_2_) + sStack_12be;
      uStack_1b1c = (sVar316 - uStack_820._4_2_) + sStack_12bc;
      uStack_1b1a = (sVar326 - uStack_820._6_2_) + sStack_12ba;
      local_1b2c = 4;
      in_stack_ffffffffffffdb68 = local_1b28 >> 4;
      in_stack_ffffffffffffdb6a = uStack_1b26 >> 4;
      in_stack_ffffffffffffdb6c = uStack_1b24 >> 4;
      in_stack_ffffffffffffdb6e = uStack_1b22 >> 4;
      in_stack_ffffffffffffdb70 = uStack_1b20 >> 4;
      in_stack_ffffffffffffdb72 = uStack_1b1e >> 4;
      in_stack_ffffffffffffdb74 = uStack_1b1c >> 4;
      in_stack_ffffffffffffdb76 = uStack_1b1a >> 4;
      local_1338 = CONCAT26(sVar287 - local_848._6_2_,
                            CONCAT24(sVar277 - local_848._4_2_,
                                     CONCAT22(sVar269 - local_848._2_2_,sVar254)));
      uStack_1330 = CONCAT26(sVar330 - uStack_840._6_2_,
                             CONCAT24(sVar320 - uStack_840._4_2_,
                                      CONCAT22(sVar311 - uStack_840._2_2_,sVar297)));
      local_1318 = CONCAT26(sVar288 + local_1248._6_2_,
                            CONCAT24(sVar278 + local_1248._4_2_,
                                     CONCAT22(sVar325 + local_1248._2_2_,sVar315)));
      uStack_1310 = CONCAT26(sVar331 + uStack_1240._6_2_,
                             CONCAT24(sVar321 + uStack_1240._4_2_,
                                      CONCAT22(sVar312 + uStack_1240._2_2_,sVar299)));
      local_1328 = CONCAT11(cVar186,uVar202);
      uVar25 = CONCAT13(cVar187,CONCAT12(uVar203,local_1328));
      uVar26 = CONCAT15(cVar188,CONCAT14(uVar204,uVar25));
      uVar49 = CONCAT17(cVar189,CONCAT16(uVar205,uVar26));
      sStack_1320 = CONCAT11(cVar190,uVar206);
      uVar32 = CONCAT13(cVar191,CONCAT12(uVar207,sStack_1320));
      uVar33 = CONCAT15(cVar192,CONCAT14(uVar208,uVar32));
      uVar51 = CONCAT17(cVar193,CONCAT16(uVar209,uVar33));
      uVar39 = CONCAT13(cVar187,CONCAT12(uVar195,CONCAT11(cVar186,uVar194)));
      uVar40 = CONCAT15(cVar188,CONCAT14(uVar196,uVar39));
      uVar56 = CONCAT17(cVar189,CONCAT16(uVar197,uVar40));
      uVar45 = CONCAT13(cVar191,CONCAT12(uVar199,CONCAT11(cVar190,uVar198)));
      uVar46 = CONCAT15(cVar192,CONCAT14(uVar200,uVar45));
      uVar61 = CONCAT17(cVar193,CONCAT16(uVar201,uVar46));
      uVar16 = CONCAT13(cVar187,CONCAT12(uVar211,CONCAT11(cVar186,uVar210)));
      uVar17 = CONCAT15(cVar188,CONCAT14(uVar212,uVar16));
      uVar41 = CONCAT17(cVar189,CONCAT16(uVar213,uVar17));
      uVar18 = CONCAT13(cVar191,CONCAT12(uVar215,CONCAT11(cVar190,uVar214)));
      uVar19 = CONCAT15(cVar192,CONCAT14(uVar216,uVar18));
      uVar47 = CONCAT17(cVar193,CONCAT16(uVar217,uVar19));
      local_12d8._2_2_ = (short)((uint)uVar39 >> 0x10);
      local_12d8._4_2_ = (short)((uint6)uVar40 >> 0x20);
      local_12d8._6_2_ = (short)((ulong)uVar56 >> 0x30);
      uStack_12d0._2_2_ = (short)((uint)uVar45 >> 0x10);
      uStack_12d0._4_2_ = (short)((uint6)uVar46 >> 0x20);
      uStack_12d0._6_2_ = (short)((ulong)uVar61 >> 0x30);
      local_12e8._2_2_ = (short)((uint)uVar16 >> 0x10);
      local_12e8._4_2_ = (short)((uint6)uVar17 >> 0x20);
      local_12e8._6_2_ = (short)((ulong)uVar41 >> 0x30);
      uStack_12e0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_12e0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_12e0._6_2_ = (short)((ulong)uVar47 >> 0x30);
      local_1308 = CONCAT11(cVar186,uVar194) + CONCAT11(cVar186,uVar210);
      sStack_1306 = local_12d8._2_2_ + local_12e8._2_2_;
      sStack_1304 = local_12d8._4_2_ + local_12e8._4_2_;
      sStack_1302 = local_12d8._6_2_ + local_12e8._6_2_;
      sStack_1300 = CONCAT11(cVar190,uVar198) + CONCAT11(cVar190,uVar214);
      sStack_12fe = uStack_12d0._2_2_ + uStack_12e0._2_2_;
      sStack_12fc = uStack_12d0._4_2_ + uStack_12e0._4_2_;
      sStack_12fa = uStack_12d0._6_2_ + uStack_12e0._6_2_;
      local_12f8._2_2_ = (short)((uint)uVar25 >> 0x10);
      local_12f8._4_2_ = (short)((uint6)uVar26 >> 0x20);
      local_12f8._6_2_ = (short)((ulong)uVar49 >> 0x30);
      uStack_12f0._2_2_ = (short)((uint)uVar32 >> 0x10);
      uStack_12f0._4_2_ = (short)((uint6)uVar33 >> 0x20);
      uStack_12f0._6_2_ = (short)((ulong)uVar51 >> 0x30);
      local_1328 = local_1328 + local_1308;
      sStack_1326 = local_12f8._2_2_ + sStack_1306;
      sStack_1324 = local_12f8._4_2_ + sStack_1304;
      sStack_1322 = local_12f8._6_2_ + sStack_1302;
      sStack_1320 = sStack_1320 + sStack_1300;
      sStack_131e = uStack_12f0._2_2_ + sStack_12fe;
      sStack_131c = uStack_12f0._4_2_ + sStack_12fc;
      sStack_131a = uStack_12f0._6_2_ + sStack_12fa;
      local_1348 = sVar315 + local_1328;
      sStack_1346 = sVar325 + local_1248._2_2_ + sStack_1326;
      sStack_1344 = sVar278 + local_1248._4_2_ + sStack_1324;
      sStack_1342 = sVar288 + local_1248._6_2_ + sStack_1322;
      sStack_1340 = sVar299 + sStack_1320;
      sStack_133e = sVar312 + uStack_1240._2_2_ + sStack_131e;
      sStack_133c = sVar321 + uStack_1240._4_2_ + sStack_131c;
      sStack_133a = sVar331 + uStack_1240._6_2_ + sStack_131a;
      local_1b48 = sVar254 + local_1348;
      uStack_1b46 = (sVar269 - local_848._2_2_) + sStack_1346;
      uStack_1b44 = (sVar277 - local_848._4_2_) + sStack_1344;
      uStack_1b42 = (sVar287 - local_848._6_2_) + sStack_1342;
      uStack_1b40 = sVar297 + sStack_1340;
      uStack_1b3e = (sVar311 - uStack_840._2_2_) + sStack_133e;
      uStack_1b3c = (sVar320 - uStack_840._4_2_) + sStack_133c;
      uStack_1b3a = (sVar330 - uStack_840._6_2_) + sStack_133a;
      local_1b4c = 4;
      in_stack_ffffffffffffdb58 = local_1b48 >> 4;
      in_stack_ffffffffffffdb5a = uStack_1b46 >> 4;
      in_stack_ffffffffffffdb5c = uStack_1b44 >> 4;
      in_stack_ffffffffffffdb5e = uStack_1b42 >> 4;
      in_stack_ffffffffffffdb60 = uStack_1b40 >> 4;
      in_stack_ffffffffffffdb62 = uStack_1b3e >> 4;
      in_stack_ffffffffffffdb64 = uStack_1b3c >> 4;
      in_stack_ffffffffffffdb66 = uStack_1b3a >> 4;
      local_638 = CONCAT26(in_stack_ffffffffffffdb6e,
                           CONCAT24(in_stack_ffffffffffffdb6c,
                                    CONCAT22(in_stack_ffffffffffffdb6a,in_stack_ffffffffffffdb68)));
      uStack_630 = CONCAT26(in_stack_ffffffffffffdb76,
                            CONCAT24(in_stack_ffffffffffffdb74,
                                     CONCAT22(in_stack_ffffffffffffdb72,in_stack_ffffffffffffdb70)))
      ;
      local_648 = CONCAT26(in_stack_ffffffffffffdb5e,
                           CONCAT24(in_stack_ffffffffffffdb5c,
                                    CONCAT22(in_stack_ffffffffffffdb5a,in_stack_ffffffffffffdb58)));
      uStack_640 = CONCAT26(in_stack_ffffffffffffdb66,
                            CONCAT24(in_stack_ffffffffffffdb64,
                                     CONCAT22(in_stack_ffffffffffffdb62,in_stack_ffffffffffffdb60)))
      ;
      local_2278 = CONCAT17((in_stack_ffffffffffffdb76 != 0) * (in_stack_ffffffffffffdb76 < 0x100) *
                            (char)in_stack_ffffffffffffdb76 - (0xff < in_stack_ffffffffffffdb76),
                            CONCAT16((in_stack_ffffffffffffdb74 != 0) *
                                     (in_stack_ffffffffffffdb74 < 0x100) *
                                     (char)in_stack_ffffffffffffdb74 -
                                     (0xff < in_stack_ffffffffffffdb74),
                                     CONCAT15((in_stack_ffffffffffffdb72 != 0) *
                                              (in_stack_ffffffffffffdb72 < 0x100) *
                                              (char)in_stack_ffffffffffffdb72 -
                                              (0xff < in_stack_ffffffffffffdb72),
                                              CONCAT14((in_stack_ffffffffffffdb70 != 0) *
                                                       (in_stack_ffffffffffffdb70 < 0x100) *
                                                       (char)in_stack_ffffffffffffdb70 -
                                                       (0xff < in_stack_ffffffffffffdb70),
                                                       CONCAT13((in_stack_ffffffffffffdb6e != 0) *
                                                                (in_stack_ffffffffffffdb6e < 0x100)
                                                                * (char)in_stack_ffffffffffffdb6e -
                                                                (0xff < in_stack_ffffffffffffdb6e),
                                                                CONCAT12((in_stack_ffffffffffffdb6c
                                                                         != 0) * (
                                                  in_stack_ffffffffffffdb6c < 0x100) *
                                                  (char)in_stack_ffffffffffffdb6c -
                                                  (0xff < in_stack_ffffffffffffdb6c),
                                                  CONCAT11((in_stack_ffffffffffffdb6a != 0) *
                                                           (in_stack_ffffffffffffdb6a < 0x100) *
                                                           (char)in_stack_ffffffffffffdb6a -
                                                           (0xff < in_stack_ffffffffffffdb6a),
                                                           (in_stack_ffffffffffffdb68 != 0) *
                                                           (in_stack_ffffffffffffdb68 < 0x100) *
                                                           (char)in_stack_ffffffffffffdb68 -
                                                           (0xff < in_stack_ffffffffffffdb68))))))))
      ;
      uStack_2270 = CONCAT17((in_stack_ffffffffffffdb66 != 0) * (in_stack_ffffffffffffdb66 < 0x100)
                             * (char)in_stack_ffffffffffffdb66 - (0xff < in_stack_ffffffffffffdb66),
                             CONCAT16((in_stack_ffffffffffffdb64 != 0) *
                                      (in_stack_ffffffffffffdb64 < 0x100) *
                                      (char)in_stack_ffffffffffffdb64 -
                                      (0xff < in_stack_ffffffffffffdb64),
                                      CONCAT15((in_stack_ffffffffffffdb62 != 0) *
                                               (in_stack_ffffffffffffdb62 < 0x100) *
                                               (char)in_stack_ffffffffffffdb62 -
                                               (0xff < in_stack_ffffffffffffdb62),
                                               CONCAT14((in_stack_ffffffffffffdb60 != 0) *
                                                        (in_stack_ffffffffffffdb60 < 0x100) *
                                                        (char)in_stack_ffffffffffffdb60 -
                                                        (0xff < in_stack_ffffffffffffdb60),
                                                        CONCAT13((in_stack_ffffffffffffdb5e != 0) *
                                                                 (in_stack_ffffffffffffdb5e < 0x100)
                                                                 * (char)in_stack_ffffffffffffdb5e -
                                                                 (0xff < in_stack_ffffffffffffdb5e),
                                                                 CONCAT12((in_stack_ffffffffffffdb5c
                                                                          != 0) * (
                                                  in_stack_ffffffffffffdb5c < 0x100) *
                                                  (char)in_stack_ffffffffffffdb5c -
                                                  (0xff < in_stack_ffffffffffffdb5c),
                                                  CONCAT11((in_stack_ffffffffffffdb5a != 0) *
                                                           (in_stack_ffffffffffffdb5a < 0x100) *
                                                           (char)in_stack_ffffffffffffdb5a -
                                                           (0xff < in_stack_ffffffffffffdb5a),
                                                           (in_stack_ffffffffffffdb58 != 0) *
                                                           (in_stack_ffffffffffffdb58 < 0x100) *
                                                           (char)in_stack_ffffffffffffdb58 -
                                                           (0xff < in_stack_ffffffffffffdb58))))))))
      ;
      local_1fe8 = local_2198;
      uStack_1fe0 = uStack_2190;
      local_1ff8 = local_2198;
      uStack_1ff0 = uStack_2190;
      uStack_2190 = local_2198;
      local_14b8 = *local_20f8;
      palStack_14b0 = local_20f8[1];
      local_14a8 = local_2198;
      uStack_14a0 = local_2198;
      palVar303 = (__m128i *)(~local_2198 & (ulong)palStack_14b0);
      local_12f8 = uVar49;
      uStack_12f0 = uVar51;
      local_12e8 = uVar41;
      uStack_12e0 = uVar47;
      local_12d8 = uVar56;
      uStack_12d0 = uVar61;
      local_1278 = uVar89;
      uStack_1270 = uVar91;
      local_1268 = uVar83;
      uStack_1260 = uVar87;
      local_1258 = uVar96;
      uStack_1250 = uVar101;
      local_1248 = uVar55;
      uStack_1240 = uVar60;
      local_1228 = uVar95;
      uStack_1220 = uVar100;
      local_11b8 = uVar38;
      uStack_11b0 = uVar44;
      local_11a8 = uVar48;
      uStack_11a0 = uVar50;
      local_1198 = uVar29;
      uStack_1190 = uVar35;
      local_1138 = uVar82;
      uStack_1130 = uVar86;
      local_1128 = uVar75;
      uStack_1120 = uVar79;
      local_1118 = uVar88;
      uStack_1110 = uVar90;
      local_1108 = uVar54;
      uStack_1100 = uVar59;
      local_10e8 = uVar94;
      uStack_10e0 = uVar99;
      local_1078 = uVar28;
      uStack_1070 = uVar34;
      local_1068 = uVar37;
      uStack_1060 = uVar43;
      local_1058 = uVar6;
      uStack_1050 = uVar22;
      local_ff8 = uVar74;
      uStack_ff0 = uVar78;
      local_fe8 = uVar67;
      uStack_fe0 = uVar70;
      local_fd8 = uVar81;
      uStack_fd0 = uVar85;
      local_fc8 = uVar53;
      uStack_fc0 = uVar58;
      local_fa8 = uVar93;
      uStack_fa0 = uVar98;
      local_f38 = uVar5;
      uStack_f30 = uVar21;
      local_f28 = uVar24;
      uStack_f20 = uVar30;
      local_f18 = uVar1;
      uStack_f10 = uVar3;
      local_eb8 = uVar66;
      uStack_eb0 = uVar69;
      local_ea8 = uVar62;
      uStack_ea0 = uVar64;
      local_e98 = uVar72;
      uStack_e90 = uVar76;
      local_e88 = uVar52;
      uStack_e80 = uVar57;
      local_e68 = uVar92;
      uStack_e60 = uVar97;
      local_848 = uVar63;
      uStack_840 = uVar65;
      local_828 = uVar2;
      uStack_820 = uVar4;
      local_808 = uVar68;
      uStack_800 = uVar71;
      local_7e8 = uVar20;
      uStack_7e0 = uVar23;
      local_7c8 = uVar73;
      uStack_7c0 = uVar77;
      local_7a8 = uVar27;
      uStack_7a0 = uVar31;
      local_788 = uVar80;
      uStack_780 = uVar84;
      local_768 = uVar36;
      uStack_760 = uVar42;
      *local_20f8 = (__m128i *)(~local_2198 & (ulong)local_14b8);
      ppalVar246[1] = palVar303;
      ppalVar246 = local_20f8;
      local_1848 = local_2198;
      uStack_1840 = uStack_2190;
      local_1858 = local_2278;
      uStack_1850 = uStack_2270;
      local_15d8 = local_2198 & local_2278;
      uStack_15d0 = uStack_2190 & uStack_2270;
      local_15c8 = *local_20f8;
      palStack_15c0 = local_20f8[1];
      palVar303 = (__m128i *)((ulong)palStack_15c0 | uStack_15d0);
      *local_20f8 = (__m128i *)((ulong)local_15c8 | local_15d8);
      ppalVar246[1] = palVar303;
      ppalVar246 = local_2100;
      local_14d8 = *local_2100;
      palStack_14d0 = local_2100[1];
      local_14c8 = local_2198;
      uStack_14c0 = uStack_2190;
      palVar303 = (__m128i *)(~uStack_2190 & (ulong)palStack_14d0);
      *local_2100 = (__m128i *)(~local_2198 & (ulong)local_14d8);
      ppalVar246[1] = palVar303;
      ppalVar246 = local_2100;
      local_1868 = local_2198;
      uStack_1860 = uStack_2190;
      local_1878 = local_2288;
      uStack_1870 = uStack_2280;
      local_15f8 = local_2198 & local_2288;
      uStack_15f0 = uStack_2190 & uStack_2280;
      local_15e8 = *local_2100;
      palStack_15e0 = local_2100[1];
      palVar303 = (__m128i *)((ulong)palStack_15e0 | uStack_15f0);
      *local_2100 = (__m128i *)((ulong)local_15e8 | local_15f8);
      ppalVar246[1] = palVar303;
      puVar129 = local_2108;
      local_14f8 = *local_2108;
      uStack_14f0 = local_2108[1];
      local_14e8 = local_2198;
      uStack_14e0 = uStack_2190;
      uVar302 = ~uStack_2190 & uStack_14f0;
      *local_2108 = ~local_2198 & local_14f8;
      puVar129[1] = uVar302;
      puVar129 = local_2108;
      local_1888 = local_2198;
      uStack_1880 = uStack_2190;
      local_1898 = local_2298;
      uStack_1890 = uStack_2290;
      local_1618 = local_2198 & local_2298;
      uStack_1610 = uStack_2190 & uStack_2290;
      local_1608 = *local_2108;
      uStack_1600 = local_2108[1];
      uVar302 = uStack_1600 | uStack_1610;
      *local_2108 = local_1608 | local_1618;
      puVar129[1] = uVar302;
      puVar129 = local_2110;
      local_1518 = *local_2110;
      uStack_1510 = local_2110[1];
      local_1508 = local_2198;
      uStack_1500 = uStack_2190;
      uVar302 = ~uStack_2190 & uStack_1510;
      *local_2110 = ~local_2198 & local_1518;
      puVar129[1] = uVar302;
      puVar129 = local_2110;
      local_18a8 = local_2198;
      uStack_18a0 = uStack_2190;
      local_18b8 = local_22a8;
      uStack_18b0 = uStack_22a0;
      local_1638 = local_2198 & local_22a8;
      uStack_1630 = uStack_2190 & uStack_22a0;
      local_1628 = *local_2110;
      uStack_1620 = local_2110[1];
      uVar302 = uStack_1620 | uStack_1630;
      *local_2110 = local_1628 | local_1638;
      puVar129[1] = uVar302;
      puVar129 = local_2118;
      local_1538 = *local_2118;
      uStack_1530 = local_2118[1];
      local_1528 = local_2198;
      uStack_1520 = uStack_2190;
      uVar302 = ~uStack_2190 & uStack_1530;
      *local_2118 = ~local_2198 & local_1538;
      puVar129[1] = uVar302;
      puVar129 = local_2118;
      local_18c8 = local_2198;
      uStack_18c0 = uStack_2190;
      local_18d8 = local_22b8;
      uStack_18d0 = uStack_22b0;
      local_1658 = local_2198 & local_22b8;
      uStack_1650 = uStack_2190 & uStack_22b0;
      local_1648 = *local_2118;
      uStack_1640 = local_2118[1];
      uVar302 = uStack_1640 | uStack_1650;
      *local_2118 = local_1648 | local_1658;
      puVar129[1] = uVar302;
      puVar129 = local_2120;
      uVar302 = *local_2120;
      uVar258 = local_2120[1];
      local_1548 = local_2198;
      uVar1 = local_1548;
      uStack_1540 = uStack_2190;
      uVar2 = uStack_1540;
      local_1548._0_4_ = (uint)local_2198;
      local_1548._4_4_ = local_2198._4_4_;
      uStack_1540._0_4_ = local_2198._8_4_;
      uStack_1540._4_4_ = local_2198._12_4_;
      local_1558._0_4_ = (uint)uVar302;
      local_1558._4_4_ = (uint)(uVar302 >> 0x20);
      uStack_1550._0_4_ = (uint)uVar258;
      uStack_1550._4_4_ = (uint)(uVar258 >> 0x20);
      uVar257 = ((uint)local_1548 ^ 0xffffffff) & (uint)local_1558;
      uVar279 = (local_1548._4_4_ ^ 0xffffffff) & local_1558._4_4_;
      uVar300 = ((uint)uStack_1540 ^ 0xffffffff) & (uint)uStack_1550;
      uVar322 = (uStack_1540._4_4_ ^ 0xffffffff) & uStack_1550._4_4_;
      local_1558 = uVar302;
      uStack_1550 = uVar258;
      local_1548 = uVar1;
      uStack_1540 = uVar2;
      *(uint *)local_2120 = uVar257;
      *(uint *)((long)puVar129 + 4) = uVar279;
      *(uint *)(puVar129 + 1) = uVar300;
      *(uint *)((long)puVar129 + 0xc) = uVar322;
      puVar129 = local_2120;
      local_18e8 = local_2198;
      uStack_18e0 = uStack_2190;
      local_18f8 = local_22c8;
      uStack_18f0 = uStack_22c0;
      local_1678 = local_2198 & local_22c8;
      uStack_1670 = uStack_2190 & uStack_22c0;
      local_1668 = *local_2120;
      uStack_1660 = local_2120[1];
      uVar302 = uStack_1660 | uStack_1670;
      *local_2120 = local_1668 | local_1678;
      puVar129[1] = uVar302;
    }
  }
  local_2738 = uStack_26b0;
  uStack_2730 = 0;
  local_2728 = uStack_26a0;
  uStack_2720 = 0;
  local_2718 = palStack_2690;
  uStack_2710 = 0;
  local_2708 = palStack_2680;
  uStack_2700 = 0;
  local_26f8 = uStack_2670;
  uStack_26f0 = 0;
  local_26e8 = palStack_2660;
  uStack_26e0 = 0;
  local_26d8 = palStack_2650;
  uStack_26d0 = 0;
  transpose16x8_8x16_sse2
            ((__m128i *)&local_26b8,(__m128i *)&local_26a8,in_stack_ffffffffffffd6d8,
             (__m128i *)&local_27f8,(__m128i *)&local_27e8,(__m128i *)&local_27d8,x6_00,local_2778,
             palStack_2770,palStack_2790,x10,local_2768,palStack_2760,palStack_27a0,x14,local_2758,
             palStack_2750,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffdb5e,
                      CONCAT24(in_stack_ffffffffffffdb5c,
                               CONCAT22(in_stack_ffffffffffffdb5a,in_stack_ffffffffffffdb58))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffdb66,
                      CONCAT24(in_stack_ffffffffffffdb64,
                               CONCAT22(in_stack_ffffffffffffdb62,in_stack_ffffffffffffdb60))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffdb6e,
                      CONCAT24(in_stack_ffffffffffffdb6c,
                               CONCAT22(in_stack_ffffffffffffdb6a,in_stack_ffffffffffffdb68))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffdb76,
                      CONCAT24(in_stack_ffffffffffffdb74,
                               CONCAT22(in_stack_ffffffffffffdb72,in_stack_ffffffffffffdb70))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffdb7e,
                      CONCAT24(in_stack_ffffffffffffdb7c,
                               CONCAT22(in_stack_ffffffffffffdb7a,in_stack_ffffffffffffdb78))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffdb86,
                      CONCAT24(in_stack_ffffffffffffdb84,
                               CONCAT22(in_stack_ffffffffffffdb82,in_stack_ffffffffffffdb80))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffdb8e,
                      CONCAT24(in_stack_ffffffffffffdb8c,
                               CONCAT22(in_stack_ffffffffffffdb8a,in_stack_ffffffffffffdb88))));
  local_2620[-1] = local_2818;
  *local_2620 = uStack_2810;
  puVar242 = (undefined8 *)((long)local_2620 + (long)local_2624 + -8);
  *puVar242 = local_2828;
  puVar242[1] = uStack_2820;
  puVar242 = (undefined8 *)((long)local_2620 + (long)(local_2624 << 1) + -8);
  *puVar242 = local_2838;
  puVar242[1] = uStack_2830;
  puVar242 = (undefined8 *)((long)local_2620 + (long)(local_2624 * 3) + -8);
  *puVar242 = local_2848;
  puVar242[1] = uStack_2840;
  puVar242 = (undefined8 *)((long)local_2620 + (long)(local_2624 << 2) + -8);
  *puVar242 = local_27c8;
  puVar242[1] = uStack_27c0;
  plVar243 = (longlong *)((long)local_2620 + (long)(local_2624 * 5) + -8);
  *plVar243 = local_27d8;
  plVar243[1] = lStack_27d0;
  plVar243 = (longlong *)((long)local_2620 + (long)(local_2624 * 6) + -8);
  *plVar243 = local_27e8;
  plVar243[1] = lStack_27e0;
  plVar243 = (longlong *)((long)local_2620 + (long)(local_2624 * 7) + -8);
  *plVar243 = local_27f8;
  plVar243[1] = lStack_27f0;
  return;
}

Assistant:

void aom_lpf_vertical_14_dual_sse2(
    unsigned char *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1) {
  __m128i q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i x7, x6, x5, x4, x3, x2, x1, x0;
  __m128i d0d1, d2d3, d4d5, d6d7, d8d9, d10d11, d12d13, d14d15;
  __m128i q0, q1, q2, q3, q7;
  __m128i p0p1, p2p3, p4p5, p6p7;

  __m128i blimit =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_blimit0),
                         _mm_load_si128((const __m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_limit0),
                                     _mm_load_si128((const __m128i *)_limit1));
  __m128i thresh =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_thresh0),
                         _mm_load_si128((const __m128i *)_thresh1));

  x7 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * p));
  x6 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 8) + 4 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 8) + 5 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 8) + 6 * p));
  x0 = _mm_loadu_si128((__m128i *)((s - 8) + 7 * p));

  transpose8x16_16x8_sse2(&x7, &x6, &x5, &x4, &x3, &x2, &x1, &x0, &d0d1, &d2d3,
                          &d4d5, &d6d7, &d8d9, &d10d11, &d12d13, &d14d15);

  q6p6 = _mm_unpacklo_epi64(d2d3, _mm_srli_si128(d12d13, 8));
  q5p5 = _mm_unpacklo_epi64(d4d5, _mm_srli_si128(d10d11, 8));
  q4p4 = _mm_unpacklo_epi64(d6d7, _mm_srli_si128(d8d9, 8));
  q3p3 = _mm_unpacklo_epi64(d8d9, _mm_srli_si128(d6d7, 8));
  q2p2 = _mm_unpacklo_epi64(d10d11, _mm_srli_si128(d4d5, 8));
  q1p1 = _mm_unpacklo_epi64(d12d13, _mm_srli_si128(d2d3, 8));
  q0p0 = _mm_unpacklo_epi64(d14d15, _mm_srli_si128(d0d1, 8));
  q7 = _mm_srli_si128(d14d15, 8);

  lpf_internal_14_dual_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0,
                            &blimit, &limit, &thresh);

  x0 = _mm_srli_si128(q0p0, 8);
  x1 = _mm_srli_si128(q1p1, 8);
  x2 = _mm_srli_si128(q2p2, 8);
  x3 = _mm_srli_si128(q3p3, 8);
  x4 = _mm_srli_si128(q4p4, 8);
  x5 = _mm_srli_si128(q5p5, 8);
  x6 = _mm_srli_si128(q6p6, 8);

  transpose16x8_8x16_sse2(&d0d1, &q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1,
                          &q0p0, &x0, &x1, &x2, &x3, &x4, &x5, &x6, &q7, &p0p1,
                          &p2p3, &p4p5, &p6p7, &q0, &q1, &q2, &q3);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * p), p0p1);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * p), p2p3);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * p), p4p5);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * p), p6p7);
  _mm_storeu_si128((__m128i *)(s - 8 + 4 * p), q0);
  _mm_storeu_si128((__m128i *)(s - 8 + 5 * p), q1);
  _mm_storeu_si128((__m128i *)(s - 8 + 6 * p), q2);
  _mm_storeu_si128((__m128i *)(s - 8 + 7 * p), q3);
}